

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

char * duckdb_yyjson::yyjson_val_write_opts
                 (yyjson_val *val,yyjson_write_flag flg,yyjson_alc *alc_ptr,usize *dat_len,
                 yyjson_write_err *err)

{
  undefined4 *puVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  _func_void_ptr_void_ptr_size_t *p_Var5;
  _func_void_void_ptr_void_ptr *p_Var6;
  void *pvVar7;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined4 uVar104;
  undefined4 uVar105;
  yyjson_write_err *pyVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  char *pcVar111;
  byte *pbVar112;
  undefined2 uVar113;
  byte *pbVar114;
  uint *puVar115;
  undefined8 uVar116;
  long lVar117;
  long lVar118;
  char *pcVar119;
  yyjson_write_err *pyVar120;
  int iVar121;
  ulong uVar122;
  uint *puVar123;
  size_t sVar124;
  yyjson_val *pyVar125;
  ulong uVar126;
  uint *puVar127;
  long lVar128;
  size_t sVar129;
  char cVar130;
  undefined1 *puVar131;
  uint uVar132;
  int iVar133;
  long lVar134;
  long lVar135;
  int iVar136;
  long lVar137;
  ulong *__dest;
  int iVar138;
  uint uVar139;
  undefined2 *puVar140;
  uint *puVar141;
  uint uVar142;
  long lVar143;
  ulong uVar144;
  long lVar145;
  long lVar146;
  int iVar147;
  uint uVar148;
  int iVar149;
  undefined **ppuVar150;
  ulong uVar151;
  uint *puVar152;
  ulong uVar153;
  byte bVar154;
  byte *pbVar155;
  uint uVar156;
  uint uVar157;
  undefined1 *puVar158;
  ushort *puVar159;
  undefined8 *puVar160;
  bool bVar161;
  bool bVar162;
  long lStack_120;
  char local_10c;
  uint *local_108;
  byte *local_100;
  ulong local_f8;
  ulong *local_e8;
  uint *local_d8;
  ulong *local_a8;
  ulong local_78;
  yyjson_write_err dummy_err;
  ulong local_48;
  
  ppuVar150 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar150 = &alc_ptr->malloc;
  }
  pyVar106 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar106 = &dummy_err;
  }
  if (val == (yyjson_val *)0x0) {
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar120 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar120 = err;
    }
    pyVar120->msg = "input JSON is NULL";
    pyVar106->code = 1;
    return (char *)0x0;
  }
  p_Var5 = ((yyjson_alc *)ppuVar150)->malloc;
  p_Var6 = ((yyjson_alc *)ppuVar150)->free;
  pvVar7 = ((yyjson_alc *)ppuVar150)->ctx;
  uVar151 = val->tag;
  bVar154 = (byte)uVar151;
  local_10c = (char)flg;
  if (0xff < uVar151 && (~bVar154 & 6) == 0) {
    p_Var8 = ((yyjson_alc *)ppuVar150)->realloc;
    if ((flg & 0x41) != 0) {
      puVar158 = enc_table_cpy;
      if ((flg & 2) == 0) {
        puVar131 = enc_table_cpy_slash;
      }
      else {
        puVar158 = enc_table_esc;
        puVar131 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar131 = puVar158;
      }
      local_d8 = (uint *)(((val->uni).u64 & 0xfffffffffffffff0) * 2 + 0x40);
      local_100 = (byte *)(*p_Var5)(pvVar7,(size_t)local_d8);
      if (local_100 == (byte *)0x0) {
        local_100 = (byte *)0x0;
LAB_01f52bff:
        if (dat_len != (usize *)0x0) {
          *dat_len = 0;
        }
        pyVar120 = &dummy_err;
        if (err != (yyjson_write_err *)0x0) {
          pyVar120 = err;
        }
        pyVar106->code = 2;
        pyVar120->msg = "memory allocation failed";
        if (local_100 == (byte *)0x0) {
          return (char *)0x0;
        }
        (*p_Var6)(pvVar7,local_100);
        return (char *)0x0;
      }
      lVar135 = 1;
      uVar151 = (ulong)((flg & 0x40) == 0);
      lVar128 = uVar151 * 2 + 2;
      local_e8 = (ulong *)(local_100 + (long)local_d8);
      bVar162 = (~(uint)val->tag & 7) == 0;
      local_48 = (ulong)bVar162;
      lVar143 = (val->tag >> 8) << bVar162;
      *local_100 = bVar162 << 5 | 0x5b;
      puVar152 = (uint *)(local_100 + 2);
      local_100[1] = 10;
      pyVar125 = val + 1;
      local_a8 = local_e8;
LAB_01f4d195:
      uVar109 = local_48 & 0xff;
      uVar110 = lVar135 * 4 + 0x20;
      uVar153 = lVar135 * 4 + 0x10;
LAB_01f4d1ca:
      uVar122 = pyVar125->tag;
      bVar154 = (byte)uVar122 & 7;
      uVar142 = (uint)lVar143;
      uVar132 = (uint)uVar109;
      if (bVar154 == 4) {
        uVar122 = 0x20;
        if ((uVar142 & uVar132) == 0) {
          uVar122 = uVar110;
        }
        if (local_e8 <= (ulong *)(uVar122 + (long)puVar152)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar122) {
            uVar107 = uVar122;
          }
          sVar129 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar129);
          if (pbVar155 == (byte *)0x0) goto LAB_01f52bff;
          sVar124 = (long)local_a8 - (long)local_e8;
          memmove(pbVar155 + (sVar129 - sVar124),pbVar155 + ((long)local_e8 - (long)local_100),
                  sVar124);
          puVar152 = (uint *)(pbVar155 + ((long)puVar152 - (long)local_100));
          local_a8 = (ulong *)(pbVar155 + sVar129);
          local_100 = pbVar155;
          local_e8 = (ulong *)(pbVar155 + (sVar129 - sVar124));
          local_d8 = (uint *)sVar129;
        }
        lVar134 = 0;
        if ((uVar142 & uVar132) == 0) {
          lVar134 = lVar135;
        }
        iVar136 = (int)puVar152;
        iVar138 = -2 - iVar136;
        puVar159 = (ushort *)((long)puVar152 + 2);
        lVar137 = 0;
        puVar127 = puVar152;
        while (bVar162 = lVar134 != 0, lVar134 = lVar134 + -1, bVar162) {
          pbVar155 = (byte *)((long)puVar152 + lVar137);
          pbVar155[0] = 0x20;
          pbVar155[1] = 0x20;
          pbVar155[2] = 0x20;
          pbVar155[3] = 0x20;
          lVar137 = lVar137 + lVar128;
          iVar138 = iVar138 - (int)lVar128;
          puVar127 = (uint *)((long)puVar127 + lVar128);
          puVar159 = puVar159 + uVar151 + 1;
        }
        pcVar111 = (char *)(pyVar125->uni).u64;
        uVar142 = (uint)((ulong)pcVar111 >> 0x20);
        if ((pyVar125->tag & 0x10) == 0) {
          uVar142 = uVar142 >> 0x1f & (uint)(pyVar125->tag >> 3);
          uVar122 = (ulong)uVar142;
          *(byte *)((long)puVar152 + lVar137) = 0x2d;
          pcVar119 = (char *)-(long)pcVar111;
          if (uVar142 == 0) {
            pcVar119 = pcVar111;
          }
          if (pcVar119 < (char *)0x5f5e100) {
            if (pcVar119 < (char *)0x64) {
              *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                   *(undefined2 *)
                    (digit_table + (ulong)(pcVar119 < (char *)0xa) + (long)pcVar119 * 2);
              pbVar155 = (byte *)((long)puVar152 +
                                 lVar137 + (uVar122 - (pcVar119 < (char *)0xa)) + 2);
            }
            else {
              iVar138 = (int)pcVar119;
              if (pcVar119 < (char *)0x2710) {
                uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar119 < (char *)0x3e8) + (ulong)uVar142 * 2);
                lVar137 = lVar137 + (uVar122 - (pcVar119 < (char *)0x3e8));
                *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                     *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                pbVar155 = (byte *)((long)puVar152 + lVar137 + 4);
              }
              else {
                if (pcVar119 < (char *)0xf4240) {
                  iVar138 = (int)((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * -10000 + iVar138;
                  uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                       *(undefined2 *)
                        (digit_table +
                        (ulong)(pcVar119 < (char *)0x186a0) +
                        ((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * 2);
                  lVar137 = lVar137 + (uVar122 - (pcVar119 < (char *)0x186a0));
                  pbVar155 = (byte *)((long)puVar152 + lVar137 + 6);
                  *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                }
                else {
                  uVar142 = (uint)((ulong)((long)pcVar119 * 0x68db8bb) >> 0x20);
                  uVar132 = uVar142 >> 8;
                  iVar138 = uVar132 * -10000 + iVar138;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                       *(undefined2 *)
                        (digit_table +
                        (ulong)(pcVar119 <
                               "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                               ) + (ulong)uVar132 * 2);
                  lVar137 = lVar137 + (uVar122 -
                                      (pcVar119 <
                                      "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                      ));
                  pbVar155 = (byte *)((long)puVar152 + lVar137 + 8);
                  *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                  *(undefined2 *)((long)puVar152 + lVar137 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                  uVar113 = *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                }
LAB_01f4ee91:
                *(undefined2 *)(pbVar155 + -2) = uVar113;
              }
            }
          }
          else {
            auVar10._8_8_ = 0;
            auVar10._0_8_ = pcVar119;
            lVar134 = SUB168(auVar10 / ZEXT816(100000000),0);
            pcVar111 = pcVar119 + lVar134 * 0xfa0a1f00;
            iVar138 = SUB164(auVar10 / ZEXT816(100000000),0);
            if (pcVar119 < (char *)0x2386f26fc10000) {
              if (pcVar119 < (char *)0x2540be400) {
                *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar119 < (char *)0x3b9aca00) + lVar134 * 2);
                pbVar155 = (byte *)((long)puVar152 +
                                   lVar137 + (uVar122 - (pcVar119 < (char *)0x3b9aca00)) + 2);
              }
              else {
                if (pcVar119 < (char *)0xe8d4a51000) {
                  uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                  uVar107 = (ulong)((ulong)pcVar119 >> 0xb < 0x2e90edd);
                  *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                       *(undefined2 *)(digit_table + uVar107 + (ulong)uVar142 * 2);
                  uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                  pbVar155 = (byte *)((long)puVar152 + lVar137 + (uVar122 - uVar107) + 4);
                }
                else if (pcVar119 < (char *)0x5af3107a4000) {
                  iVar138 = (int)((ulong)(lVar134 * 0x68db9) >> 0x20) * -10000 + iVar138;
                  uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                  uVar107 = (ulong)((ulong)pcVar119 >> 0xd < 0x48c27395);
                  *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                       *(undefined2 *)
                        (digit_table + uVar107 + ((ulong)(lVar134 * 0x68db9) >> 0x20) * 2);
                  lVar137 = lVar137 + (uVar122 - uVar107);
                  pbVar155 = (byte *)((long)puVar152 + lVar137 + 6);
                  *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                }
                else {
                  uVar142 = (uint)((ulong)(lVar134 * 0x68db8bb) >> 0x20);
                  uVar132 = uVar142 >> 8;
                  iVar138 = uVar132 * -10000 + iVar138;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                       *(undefined2 *)
                        (digit_table +
                        (ulong)(pcVar119 < (char *)0x38d7ea4c68000) + (ulong)uVar132 * 2);
                  lVar137 = lVar137 + (uVar122 - (pcVar119 < (char *)0x38d7ea4c68000));
                  pbVar155 = (byte *)((long)puVar152 + lVar137 + 8);
                  *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                  *(undefined2 *)((long)puVar152 + lVar137 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                  uVar113 = *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                }
                *(undefined2 *)(pbVar155 + -2) = uVar113;
              }
              uVar142 = (uint)(((ulong)pcVar111 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar132 = uVar142 >> 8;
              iVar138 = uVar132 * -10000 + (int)pcVar111;
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar155 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
              *(undefined2 *)(pbVar155 + 2) =
                   *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
              *(undefined2 *)(pbVar155 + 4) = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
              *(undefined2 *)(pbVar155 + 6) =
                   *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar138) * 2);
              pbVar155 = pbVar155 + 8;
            }
            else {
              auVar11._8_8_ = 0;
              auVar11._0_8_ = pcVar119;
              lVar134 = SUB168(auVar11 / ZEXT816(1000000000000),0);
              iVar136 = SUB164(auVar11 / ZEXT816(1000000000000),0);
              if (pcVar119 < (char *)0xde0b6b3a7640000) {
                uVar107 = lVar134 * 0x68db9;
                iVar147 = (int)(uVar107 >> 0x20) * -10000 + iVar136;
                uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                     *(undefined2 *)
                      (digit_table +
                      (ulong)(pcVar119 < (char *)0x16345785d8a0000) + (uVar107 >> 0x20) * 2);
                lVar137 = lVar137 + (uVar122 - (pcVar119 < (char *)0x16345785d8a0000));
                lVar134 = lVar137 + 6;
                *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                     *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
              }
              else {
                uVar142 = (uint)((ulong)(lVar134 * 0x68db8bb) >> 0x20);
                uVar132 = uVar142 >> 8;
                iVar147 = uVar132 * -10000 + iVar136;
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar139 = (uint)(iVar147 * 0x147b) >> 0x13;
                *(undefined2 *)((long)puVar152 + lVar137 + uVar122) =
                     *(undefined2 *)
                      (digit_table +
                      (ulong)(pcVar119 < (char *)0x8ac7230489e80000) + (ulong)uVar132 * 2);
                lVar137 = lVar137 + (uVar122 - (pcVar119 < (char *)0x8ac7230489e80000));
                lVar134 = lVar137 + 8;
                *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                *(undefined2 *)((long)puVar152 + lVar137 + 4) =
                     *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                uVar113 = *(undefined2 *)(digit_table + (uVar139 * -100 + iVar147) * 2);
              }
              pbVar155 = (byte *)((long)puVar152 + lVar134);
              *(undefined2 *)(pbVar155 + -2) = uVar113;
              iVar138 = iVar138 + iVar136 * -10000;
              uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar155 = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
              *(undefined2 *)(pbVar155 + 2) =
                   *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar138) * 2);
              uVar142 = (uint)(((ulong)pcVar111 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar132 = uVar142 >> 8;
              iVar138 = uVar132 * -10000 + (int)pcVar111;
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar155 + 4) = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
              *(undefined2 *)(pbVar155 + 6) =
                   *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
              *(undefined2 *)(pbVar155 + 8) = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
              *(undefined2 *)(pbVar155 + 10) =
                   *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar138) * 2);
              pbVar155 = pbVar155 + 0xc;
            }
          }
        }
        else {
          uVar122 = (ulong)pcVar111 & 0xfffffffffffff;
          uVar142 = uVar142 >> 0x14 & 0x7ff;
          if (uVar142 == 0x7ff) {
            if ((flg & 0x10) == 0) {
              if ((flg & 8) == 0) goto LAB_01f52ce1;
              if (uVar122 == 0) {
                *(byte *)((long)puVar152 + lVar137) = 0x2d;
                pbVar114 = (byte *)((long)puVar152 + (lVar137 - ((long)pcVar111 >> 0x3f)));
                pbVar155 = pbVar114 + 8;
                pbVar114[0] = 0x49;
                pbVar114[1] = 0x6e;
                pbVar114[2] = 0x66;
                pbVar114[3] = 0x69;
                pbVar114[4] = 0x6e;
                pbVar114[5] = 0x69;
                pbVar114[6] = 0x74;
                pbVar114[7] = 0x79;
              }
              else {
                pbVar114 = (byte *)((long)puVar152 + lVar137);
                pbVar155 = pbVar114 + 3;
                pbVar114[0] = 0x4e;
                pbVar114[1] = 0x61;
                pbVar114[2] = 0x4e;
                pbVar114[3] = 0;
              }
            }
            else {
              pbVar155 = (byte *)((long)puVar152 + lVar137);
              pbVar155[0] = 0x6e;
              pbVar155[1] = 0x75;
              pbVar155[2] = 0x6c;
              pbVar155[3] = 0x6c;
              pbVar155 = pbVar155 + 4;
            }
          }
          else {
            *(byte *)((long)puVar152 + lVar137) = 0x2d;
            lVar134 = -((long)pcVar111 >> 0x3f);
            pbVar155 = (byte *)((long)puVar152 + lVar134 + lVar137);
            if (((ulong)pcVar111 & 0x7fffffffffffffff) == 0) {
              pbVar155[0] = 0x30;
              pbVar155[1] = 0x2e;
              pbVar155[2] = 0x30;
              pbVar155[3] = 0;
              pbVar155 = (byte *)((long)puVar152 + lVar137 + lVar134 + 3);
            }
            else if (uVar142 == 0) {
              uVar107 = (ulong)((uint)pcVar111 & 1);
              uVar122 = uVar122 * 0x20;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar122 - 0x10;
              auVar89._8_8_ = 0;
              auVar89._0_8_ = SUB168(auVar38 * ZEXT816(0x6c07a2c26a8346d2),8);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar122 - 0x10;
              auVar89 = auVar39 * ZEXT816(0x9e19db92b4e31ba9) + auVar89;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = uVar122;
              auVar90._8_8_ = 0;
              auVar90._0_8_ = SUB168(auVar40 * ZEXT816(0x6c07a2c26a8346d2),8);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar122;
              auVar90 = auVar41 * ZEXT816(0x9e19db92b4e31ba9) + auVar90;
              uVar126 = auVar90._8_8_;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uVar122 + 0x10;
              auVar91._8_8_ = 0;
              auVar91._0_8_ = SUB168(auVar42 * ZEXT816(0x6c07a2c26a8346d2),8);
              auVar43._8_8_ = 0;
              auVar43._0_8_ = uVar122 + 0x10;
              auVar91 = auVar43 * ZEXT816(0x9e19db92b4e31ba9) + auVar91;
              uVar122 = ((ulong)((auVar89 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar89._8_8_) + uVar107;
              uVar107 = ((ulong)((auVar91 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar91._8_8_) - uVar107;
              if (uVar126 < 0x28) {
LAB_01f4f5a8:
                uVar108 = (auVar90 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                          | uVar126;
                uVar144 = uVar126 & 0x7ffffffffffffffc;
                bVar162 = true;
                if (uVar108 <= (uVar144 | 2)) {
                  bVar162 = (bool)((byte)((uVar126 & 0xffffffff) >> 2) & 0x3f &
                                  uVar108 == (uVar144 | 2));
                }
                uVar108 = uVar126 >> 2;
                bVar161 = uVar144 + 4 <= uVar107;
                if (uVar144 < uVar122 == bVar161) {
                  bVar162 = bVar161;
                }
                iVar147 = -0x144;
              }
              else {
                uVar108 = uVar126 / 0x28;
                bVar162 = uVar108 * 0x28 + 0x28 <= uVar107;
                if (uVar108 * 0x28 < uVar122 != bVar162) goto LAB_01f4f5a8;
                iVar147 = -0x143;
              }
              pcVar111 = (char *)(bVar162 + uVar108);
              if (pcVar111 < (char *)0x38d7ea4c68000) {
                iVar149 = (int)pcVar111;
                if (pcVar111 < (char *)0x5f5e100) {
                  if (pcVar111 < (char *)0x64) {
                    *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + 1) =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar111 < (char *)0xa) + (long)pcVar111 * 2);
                    pbVar114 = (byte *)((long)puVar152 +
                                       lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0xa)) + 3);
                  }
                  else {
                    if ((char *)0x270f < pcVar111) {
                      if (pcVar111 < (char *)0xf4240) {
                        iVar149 = (int)((ulong)((long)pcVar111 * 0x68db9) >> 0x20) * -10000 +
                                  iVar149;
                        uVar142 = (uint)(iVar149 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + 1) =
                             *(undefined2 *)
                              (digit_table +
                              (ulong)(pcVar111 < (char *)0x186a0) +
                              ((ulong)((long)pcVar111 * 0x68db9) >> 0x20) * 2);
                        lVar117 = lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0x186a0));
                        pbVar114 = (byte *)((long)puVar152 + lVar117 + 7);
                        *(undefined2 *)((long)puVar152 + lVar117 + 3) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                        uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar149) * 2);
                      }
                      else {
                        uVar142 = (uint)((ulong)((long)pcVar111 * 0x68db8bb) >> 0x20);
                        uVar132 = uVar142 >> 8;
                        iVar149 = uVar132 * -10000 + iVar149;
                        uVar132 = uVar132 * 0x147b >> 0x13;
                        uVar139 = (uint)(iVar149 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + 1) =
                             *(undefined2 *)
                              (digit_table +
                              (ulong)(pcVar111 <
                                     "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                     ) + (ulong)uVar132 * 2);
                        lVar117 = lVar137 + (lVar134 -
                                            (ulong)(pcVar111 <
                                                                                                      
                                                  "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                                  ));
                        pbVar114 = (byte *)((long)puVar152 + lVar117 + 9);
                        *(undefined2 *)((long)puVar152 + lVar117 + 3) =
                             *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                        *(undefined2 *)((long)puVar152 + lVar117 + 5) =
                             *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                        uVar113 = *(undefined2 *)(digit_table + (uVar139 * -100 + iVar149) * 2);
                      }
                      goto LAB_01f4f95d;
                    }
                    uVar142 = (uint)(iVar149 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + 1) =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar111 < (char *)0x3e8) + (ulong)uVar142 * 2);
                    lVar117 = lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0x3e8));
                    pbVar114 = (byte *)((long)puVar152 + lVar117 + 5);
                    *(undefined2 *)((long)puVar152 + lVar117 + 3) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar149) * 2);
                  }
                }
                else {
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = pcVar111;
                  lVar117 = SUB168(auVar17 / ZEXT816(100000000),0);
                  iVar121 = SUB164(auVar17 / ZEXT816(100000000),0);
                  if (pcVar111 < (char *)0x2540be400) {
                    *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + 1) =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar111 < (char *)0x3b9aca00) + lVar117 * 2);
                    pbVar114 = (byte *)((long)puVar152 +
                                       lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0x3b9aca00))
                                       + 3);
                  }
                  else {
                    if (pcVar111 < (char *)0xe8d4a51000) {
                      uVar142 = (uint)(iVar121 * 0x147b) >> 0x13;
                      uVar122 = (ulong)((ulong)pcVar111 >> 0xb < 0x2e90edd);
                      *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + 1) =
                           *(undefined2 *)(digit_table + uVar122 + (ulong)uVar142 * 2);
                      uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar121) * 2);
                      pbVar114 = (byte *)((long)puVar152 + lVar137 + (lVar134 - uVar122) + 5);
                    }
                    else if (pcVar111 < (char *)0x5af3107a4000) {
                      iVar133 = (int)((ulong)(lVar117 * 0x68db9) >> 0x20) * -10000 + iVar121;
                      uVar142 = (uint)(iVar133 * 0x147b) >> 0x13;
                      uVar122 = (ulong)((ulong)pcVar111 >> 0xd < 0x48c27395);
                      *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + 1) =
                           *(undefined2 *)
                            (digit_table + uVar122 + ((ulong)(lVar117 * 0x68db9) >> 0x20) * 2);
                      lVar117 = lVar137 + (lVar134 - uVar122);
                      pbVar114 = (byte *)((long)puVar152 + lVar117 + 7);
                      *(undefined2 *)((long)puVar152 + lVar117 + 3) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar133) * 2);
                    }
                    else {
                      uVar142 = (uint)((ulong)(lVar117 * 0x68db8bb) >> 0x20);
                      uVar132 = uVar142 >> 8;
                      iVar133 = uVar132 * -10000 + iVar121;
                      uVar139 = uVar132 * 0x147b >> 0x13;
                      uVar132 = (uint)(iVar133 * 0x147b) >> 0x13;
                      *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + 1) =
                           *(undefined2 *)(digit_table + (ulong)uVar139 * 2 + 1);
                      lVar117 = lVar137 + lVar134;
                      pbVar114 = (byte *)((long)puVar152 + lVar117 + 8);
                      *(undefined2 *)((long)puVar152 + lVar117 + 2) =
                           *(undefined2 *)(digit_table + (uVar139 * -100 + (uVar142 >> 8)) * 2);
                      *(undefined2 *)((long)puVar152 + lVar117 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      uVar113 = *(undefined2 *)(digit_table + (uVar132 * -100 + iVar133) * 2);
                    }
                    *(undefined2 *)(pbVar114 + -2) = uVar113;
                  }
                  uVar132 = iVar121 * -100000000 + iVar149;
                  uVar142 = (uint)((ulong)uVar132 * 0x68db8bb >> 0x20);
                  uVar139 = uVar142 >> 8;
                  iVar149 = uVar139 * -10000 + uVar132;
                  uVar132 = uVar139 * 0x147b >> 0x13;
                  uVar139 = (uint)(iVar149 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar114 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                  *(undefined2 *)(pbVar114 + 2) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                  *(undefined2 *)(pbVar114 + 4) = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                  *(undefined2 *)(pbVar114 + 6) =
                       *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar149) * 2);
                  pbVar114 = pbVar114 + 8;
                }
              }
              else {
                auVar16._8_8_ = 0;
                auVar16._0_8_ = pcVar111;
                uVar122 = SUB168(auVar16 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                          (ulong)pcVar111 / 100000000;
                *(byte *)((long)puVar152 + lVar137 + lVar134 + 1) =
                     SUB161(auVar16 / ZEXT816(10000000000000000),0) + 0x30;
                uVar142 = (uint)((uVar122 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar132 = uVar142 >> 8;
                iVar149 = uVar132 * -10000 + (int)uVar122;
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar139 = (uint)(iVar149 * 0x147b) >> 0x13;
                lVar117 = lVar137 + lVar134 + (ulong)((char *)0x2386f26fc0ffff < pcVar111);
                pbVar114 = (byte *)((long)puVar152 + lVar117 + 0x11);
                *(undefined2 *)((long)puVar152 + lVar117 + 1) =
                     *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                *(undefined2 *)((long)puVar152 + lVar117 + 3) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                *(undefined2 *)((long)puVar152 + lVar117 + 5) =
                     *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                *(undefined2 *)((long)puVar152 + lVar117 + 7) =
                     *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar149) * 2);
                uVar142 = (uint)(((ulong)(pcVar111 + ((ulong)pcVar111 / 100000000) * 0xfa0a1f00) &
                                 0xffffffff) * 0x68db8bb >> 0x20);
                uVar132 = uVar142 >> 8;
                iVar149 = uVar132 * -10000 +
                          (int)(pcVar111 + ((ulong)pcVar111 / 100000000) * 0xfa0a1f00);
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar139 = (uint)(iVar149 * 0x147b) >> 0x13;
                *(undefined2 *)((long)puVar152 + lVar117 + 9) =
                     *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                *(undefined2 *)((long)puVar152 + lVar117 + 0xb) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                *(undefined2 *)((long)puVar152 + lVar117 + 0xd) =
                     *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                uVar113 = *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar149) * 2);
LAB_01f4f95d:
                *(undefined2 *)(pbVar114 + -2) = uVar113;
              }
              *pbVar155 = *(byte *)((long)puVar152 + lVar137 + lVar134 + 1);
              *(byte *)((long)puVar152 + lVar137 + lVar134 + 1) = 0x2e;
              pbVar155 = pbVar114 + 5;
              do {
                pbVar112 = pbVar155;
                pbVar155 = pbVar112 + -1;
              } while (pbVar112[-6] == 0x30);
              iVar149 = (iVar147 + (int)pbVar114) - (int)lVar134;
              uVar122 = (ulong)(pbVar112[-6] != 0x2e);
              pbVar155 = pbVar112 + -1 + uVar122;
              (pbVar112 + (uVar122 - 6))[0] = 0x65;
              (pbVar112 + (uVar122 - 6))[1] = 0x2d;
              pbVar112[uVar122 - 4] =
                   (char)((uint)(((iVar149 - iVar136) - (int)lVar137) * -0x290 + 0x520) >> 0x10) +
                   0x30;
              *(undefined2 *)(pbVar112 + (uVar122 - 3)) =
                   *(undefined2 *)
                    (digit_table +
                    (((((int)lVar134 - iVar147) - (int)pbVar114) + iVar136 + (int)lVar137 +
                     ((uint)((iVar149 + iVar138) * -0x290) >> 0x10) * 0x7fffff9c) * 2 + 4));
            }
            else {
              uVar107 = uVar122 + 0x10000000000000;
              if (uVar142 - 0x3ff < 0x35) {
                lVar117 = 0;
                if (uVar107 != 0) {
                  for (; (uVar107 >> lVar117 & 1) == 0; lVar117 = lVar117 + 1) {
                  }
                }
                if (0x433 - uVar142 <= (uint)lVar117) {
                  pcVar111 = (char *)(uVar107 >> ((byte)(0x433 - uVar142) & 0x3f));
                  iVar138 = (int)pcVar111;
                  if (pcVar111 < (char *)0x5f5e100) {
                    if (pcVar111 < (char *)0x64) {
                      *(undefined2 *)pbVar155 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar111 < (char *)0xa) + (long)pcVar111 * 2);
                      pbVar155 = (byte *)((long)puVar152 +
                                         lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0xa)) + 2);
                    }
                    else {
                      if (pcVar111 < (char *)0x2710) {
                        uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar155 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar111 < (char *)0x3e8) + (ulong)uVar142 * 2)
                        ;
                        uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                        pbVar155 = (byte *)((long)puVar152 +
                                           lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0x3e8)) +
                                           4);
                      }
                      else if (pcVar111 < (char *)0xf4240) {
                        iVar138 = (int)((ulong)((long)pcVar111 * 0x68db9) >> 0x20) * -10000 +
                                  iVar138;
                        uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar155 =
                             *(undefined2 *)
                              (digit_table +
                              (ulong)(pcVar111 < (char *)0x186a0) +
                              ((ulong)((long)pcVar111 * 0x68db9) >> 0x20) * 2);
                        lVar137 = lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0x186a0));
                        pbVar155 = (byte *)((long)puVar152 + lVar137 + 6);
                        *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                        uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                      }
                      else {
                        uVar142 = (uint)((ulong)((long)pcVar111 * 0x68db8bb) >> 0x20);
                        uVar132 = uVar142 >> 8;
                        iVar138 = uVar132 * -10000 + iVar138;
                        uVar132 = uVar132 * 0x147b >> 0x13;
                        uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar155 =
                             *(undefined2 *)
                              (digit_table +
                              (ulong)(pcVar111 <
                                     "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                     ) + (ulong)uVar132 * 2);
                        lVar137 = lVar137 + (lVar134 -
                                            (ulong)(pcVar111 <
                                                                                                      
                                                  "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                                  ));
                        pbVar155 = (byte *)((long)puVar152 + lVar137 + 8);
                        *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                             *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                        *(undefined2 *)((long)puVar152 + lVar137 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                        uVar113 = *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                      }
                      *(undefined2 *)(pbVar155 + -2) = uVar113;
                    }
                  }
                  else {
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = pcVar111;
                    lVar117 = SUB168(auVar15 / ZEXT816(100000000),0);
                    iVar136 = SUB164(auVar15 / ZEXT816(100000000),0);
                    if (pcVar111 < (char *)0x2540be400) {
                      *(undefined2 *)pbVar155 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar111 < (char *)0x3b9aca00) + lVar117 * 2);
                      pbVar155 = (byte *)((long)puVar152 +
                                         lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0x3b9aca00)
                                                   ) + 2);
                    }
                    else {
                      if (pcVar111 < (char *)0xe8d4a51000) {
                        uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                        uVar122 = (ulong)((ulong)pcVar111 >> 0xb < 0x2e90edd);
                        *(undefined2 *)pbVar155 =
                             *(undefined2 *)(digit_table + uVar122 + (ulong)uVar142 * 2);
                        uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                        pbVar155 = (byte *)((long)puVar152 + lVar137 + (lVar134 - uVar122) + 4);
                      }
                      else if (pcVar111 < (char *)0x5af3107a4000) {
                        iVar147 = (int)((ulong)(lVar117 * 0x68db9) >> 0x20) * -10000 + iVar136;
                        uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                        uVar122 = (ulong)((ulong)pcVar111 >> 0xd < 0x48c27395);
                        *(undefined2 *)pbVar155 =
                             *(undefined2 *)
                              (digit_table + uVar122 + ((ulong)(lVar117 * 0x68db9) >> 0x20) * 2);
                        lVar137 = lVar137 + (lVar134 - uVar122);
                        pbVar155 = (byte *)((long)puVar152 + lVar137 + 6);
                        *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                        uVar113 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
                      }
                      else {
                        uVar142 = (uint)((ulong)(lVar117 * 0x68db8bb) >> 0x20);
                        uVar132 = uVar142 >> 8;
                        iVar147 = uVar132 * -10000 + iVar136;
                        uVar132 = uVar132 * 0x147b >> 0x13;
                        uVar139 = (uint)(iVar147 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar155 =
                             *(undefined2 *)
                              (digit_table +
                              (ulong)(pcVar111 < (char *)0x38d7ea4c68000) + (ulong)uVar132 * 2);
                        lVar137 = lVar137 + (lVar134 - (ulong)(pcVar111 < (char *)0x38d7ea4c68000));
                        pbVar155 = (byte *)((long)puVar152 + lVar137 + 8);
                        *(undefined2 *)((long)puVar152 + lVar137 + 2) =
                             *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                        *(undefined2 *)((long)puVar152 + lVar137 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                        uVar113 = *(undefined2 *)(digit_table + (uVar139 * -100 + iVar147) * 2);
                      }
                      *(undefined2 *)(pbVar155 + -2) = uVar113;
                    }
                    uVar132 = iVar136 * -100000000 + iVar138;
                    uVar142 = (uint)((ulong)uVar132 * 0x68db8bb >> 0x20);
                    uVar139 = uVar142 >> 8;
                    iVar138 = uVar139 * -10000 + uVar132;
                    uVar132 = uVar139 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar155 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)(pbVar155 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)(pbVar155 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)(pbVar155 + 6) =
                         *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar138) * 2);
                    pbVar155 = pbVar155 + 8;
                  }
                  pbVar155[0] = 0x2e;
                  pbVar155[1] = 0x30;
                  pbVar155 = pbVar155 + 2;
                  goto LAB_01f4f032;
                }
              }
              uVar126 = (ulong)((uint)pcVar111 & 1);
              iVar138 = uVar142 * 0x4d105 + -0x200a5;
              if (uVar142 == 1 || uVar122 != 0) {
                iVar138 = uVar142 * 0x4d105;
              }
              iVar138 = iVar138 + -0x1439b7ff >> 0x14;
              uVar108 = *(ulong *)(pow10_sig_table + (ulong)(iVar138 * -2 + 0x2ae) * 8);
              uVar144 = *(long *)(pow10_sig_table + (ulong)(iVar138 * -2 + 0x2af) * 8) +
                        (ulong)(iVar138 - 1U < 0xffffffc8);
              bVar154 = ((char)((uint)(iVar138 * -0x3526b) >> 0x10) + (char)uVar142) - 0x32;
              uVar122 = (ulong)(uVar142 != 1 && uVar122 == 0) + uVar107 * 4 + -2 << (bVar154 & 0x3f)
              ;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar144;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = uVar122;
              auVar86._8_8_ = 0;
              auVar86._0_8_ = SUB168(auVar32 * auVar68,8);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar108;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = uVar122;
              auVar86 = auVar33 * auVar69 + auVar86;
              uVar122 = uVar107 * 4 << (bVar154 & 0x3f);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar144;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = uVar122;
              auVar87._8_8_ = 0;
              auVar87._0_8_ = SUB168(auVar34 * auVar70,8);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar108;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = uVar122;
              auVar87 = auVar35 * auVar71 + auVar87;
              uVar122 = auVar87._8_8_;
              uVar107 = uVar107 * 4 + 2 << (bVar154 & 0x3f);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar144;
              auVar72._8_8_ = 0;
              auVar72._0_8_ = uVar107;
              auVar88._8_8_ = 0;
              auVar88._0_8_ = SUB168(auVar36 * auVar72,8);
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar108;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar107;
              auVar88 = auVar37 * auVar73 + auVar88;
              uVar107 = ((ulong)((auVar86 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar86._8_8_) + uVar126;
              uVar126 = ((ulong)((auVar88 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar88._8_8_) - uVar126;
              if (uVar122 < 0x28) {
LAB_01f4d6c3:
                uVar144 = (auVar87 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                          | uVar122;
                uVar108 = uVar122 & 0xfffffffffffffffc;
                bVar162 = true;
                if (uVar144 <= uVar108 + 2) {
                  bVar162 = (bool)((byte)((uVar122 & 0xffffffff) >> 2) & 0x3f &
                                  uVar144 == uVar108 + 2);
                }
                bVar161 = uVar108 + 4 <= uVar126;
                if (uVar108 < uVar107 == bVar161) {
                  bVar162 = bVar161;
                }
                uVar122 = (ulong)bVar162 + (uVar122 >> 2);
              }
              else {
                uVar144 = (uVar122 / 0x28) * 0x28;
                uVar108 = uVar144 + 0x28;
                if (uVar144 < uVar107 != uVar108 <= uVar126) goto LAB_01f4d6c3;
                uVar122 = (uVar122 / 0x28 + 1) - (ulong)(uVar126 < uVar108);
                iVar138 = iVar138 + 1;
              }
              iVar136 = (0x11 - (uint)(uVar122 < 10000000000000000)) -
                        (uint)(uVar122 < 1000000000000000);
              uVar142 = iVar136 + iVar138;
              if (iVar136 + iVar138 + 5U < 0x1b) {
                if ((int)uVar142 < 1) {
                  uVar108 = (ulong)(2 - uVar142);
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = uVar122;
                  uVar107 = SUB168(auVar14 / ZEXT816(100000000),0);
                  uVar122 = uVar107 * 0xfa0a1f00 + uVar122;
                  uVar139 = SUB164(auVar14 / ZEXT816(100000000),0);
                  uVar107 = (uVar107 & 0xffffffff) / 10000;
                  iVar138 = (int)uVar107;
                  iVar136 = iVar138 * -10000 + uVar139;
                  iVar147 = (int)(uVar107 * 0x28f5d >> 0x18);
                  uVar148 = (uint)(iVar147 * 0x29) >> 0xc;
                  uVar156 = uVar148 * -100 + iVar147;
                  uVar132 = iVar147 * -100 + iVar138;
                  *(byte *)((long)puVar152 + lVar137 + uVar108 + lVar134) = (char)uVar148 + 0x30;
                  uVar126 = (ulong)(uVar139 >= 100000000);
                  uVar107 = (ulong)(uVar156 < 10 && uVar139 < 100000000);
                  *(undefined2 *)((long)puVar152 + lVar137 + lVar134 + uVar126 + uVar108) =
                       *(undefined2 *)(digit_table + uVar107 + uVar156 * 2);
                  *(undefined2 *)
                   ((long)puVar152 + lVar137 + 2 + ((lVar134 + uVar126) - uVar107) + uVar108) =
                       *(undefined2 *)(digit_table + uVar132 * 2);
                  lVar117 = -uVar107;
                  iVar138 = (int)uVar122;
                  if (iVar138 == 0) {
                    if (iVar136 == 0) {
                      uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar156];
                      if (uVar132 != 0) {
                        uVar122 = 0;
                      }
                      uVar122 = uVar122 + (byte)dec_trailing_zero_table[uVar132];
                      lStack_120 = 4;
                      goto LAB_01f4e931;
                    }
                    uVar132 = (uint)(iVar136 * 0x147b) >> 0x13;
                    uVar139 = uVar132 * -100 + iVar136;
                    lVar145 = lVar134 + lVar117 + uVar126 + uVar108;
                    *(undefined2 *)((long)puVar152 + lVar137 + 4 + lVar145) =
                         *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)((long)puVar152 + lVar137 + 6 + lVar145) =
                         *(undefined2 *)(digit_table + uVar139 * 2);
                    uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar132] + 2;
                    if (uVar139 != 0) {
                      uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar139];
                    }
                    uVar122 = 8 - uVar122;
                  }
                  else {
                    uVar156 = (uint)(iVar136 * 0x147b) >> 0x13;
                    lVar145 = lVar134 + lVar117 + uVar126 + uVar108;
                    uVar132 = (uint)((uVar122 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar139 = uVar132 >> 8;
                    uVar148 = uVar139 * 0x147b >> 0x13;
                    uVar122 = (ulong)uVar148;
                    *(undefined2 *)((long)puVar152 + lVar137 + 4 + lVar145) =
                         *(undefined2 *)(digit_table + (ulong)uVar156 * 2);
                    uVar139 = uVar148 * -100 + uVar139;
                    *(undefined2 *)((long)puVar152 + lVar137 + 6 + lVar145) =
                         *(undefined2 *)(digit_table + (uVar156 * 0x7fffff9c + iVar136) * 2);
                    *(undefined2 *)((long)puVar152 + lVar137 + 8 + lVar145) =
                         *(undefined2 *)(digit_table + uVar122 * 2);
                    *(undefined2 *)((long)puVar152 + lVar137 + 10 + lVar145) =
                         *(undefined2 *)(digit_table + uVar139 * 2);
                    lStack_120 = 0xc;
                    iVar138 = (uVar132 >> 8) * -10000 + iVar138;
                    if (iVar138 != 0) {
                      uVar132 = (uint)(iVar138 * 0x147b) >> 0x13;
                      uVar122 = (ulong)uVar132;
                      uVar139 = uVar132 * -100 + iVar138;
                      *(undefined2 *)((long)puVar152 + lVar137 + 0xc + lVar145) =
                           *(undefined2 *)(digit_table + uVar122 * 2);
                      *(undefined2 *)((long)puVar152 + lVar137 + 0xe + lVar145) =
                           *(undefined2 *)(digit_table + uVar139 * 2);
                      lStack_120 = 0x10;
                    }
                    uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar122] + 2;
                    if (uVar139 != 0) {
                      uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar139];
                    }
LAB_01f4e931:
                    uVar122 = lStack_120 - uVar122;
                  }
                  *pbVar155 = 0x30;
                  *(byte *)((long)puVar152 + lVar137 + 1 + lVar134) = 0x2e;
                  for (uVar107 = 0;
                      pbVar155 = (byte *)((long)puVar152 +
                                         (uVar122 & 0xffffffff) +
                                         lVar137 + uVar126 + uVar108 + lVar117 + lVar134),
                      -uVar142 != uVar107; uVar107 = uVar107 + 1) {
                    *(byte *)((long)puVar159 + uVar107 + lVar134) = 0x30;
                  }
                }
                else {
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = uVar122;
                  uVar107 = SUB168(auVar12 / ZEXT816(100000000),0);
                  uVar122 = uVar107 * 0xfa0a1f00 + uVar122;
                  uVar132 = SUB164(auVar12 / ZEXT816(100000000),0);
                  uVar107 = (uVar107 & 0xffffffff) / 10000;
                  iVar138 = (int)uVar107;
                  iVar147 = iVar138 * -10000 + uVar132;
                  iVar136 = (int)(uVar107 * 0x28f5d >> 0x18);
                  uVar156 = (uint)(iVar136 * 0x29) >> 0xc;
                  uVar148 = uVar156 * -100 + iVar136;
                  uVar139 = iVar136 * -100 + iVar138;
                  pbVar155[0x10] = 0x30;
                  pbVar155[0x11] = 0x30;
                  pbVar155[0x12] = 0x30;
                  pbVar155[0x13] = 0x30;
                  pbVar155[0x14] = 0x30;
                  pbVar155[0x15] = 0x30;
                  pbVar155[0x16] = 0x30;
                  pbVar155[0x17] = 0x30;
                  pbVar155[0] = 0x30;
                  pbVar155[1] = 0x30;
                  pbVar155[2] = 0x30;
                  pbVar155[3] = 0x30;
                  pbVar155[4] = 0x30;
                  pbVar155[5] = 0x30;
                  pbVar155[6] = 0x30;
                  pbVar155[7] = 0x30;
                  pbVar155[8] = 0x30;
                  pbVar155[9] = 0x30;
                  pbVar155[10] = 0x30;
                  pbVar155[0xb] = 0x30;
                  pbVar155[0xc] = 0x30;
                  pbVar155[0xd] = 0x30;
                  pbVar155[0xe] = 0x30;
                  pbVar155[0xf] = 0x30;
                  *(byte *)((long)puVar152 + lVar137 + 1 + lVar134) = (char)uVar156 + 0x30;
                  uVar107 = (ulong)(uVar132 >= 100000000);
                  uVar126 = (ulong)(uVar148 < 10 && uVar132 < 100000000);
                  *(undefined2 *)((long)puVar152 + lVar137 + 1 + lVar134 + uVar107) =
                       *(undefined2 *)(digit_table + uVar126 + uVar148 * 2);
                  *(undefined2 *)((long)puVar152 + lVar137 + 3 + ((lVar134 + uVar107) - uVar126)) =
                       *(undefined2 *)(digit_table + uVar139 * 2);
                  lVar117 = -uVar126;
                  iVar138 = (int)uVar122;
                  if (iVar138 == 0) {
                    if (iVar147 == 0) {
                      uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar148];
                      if (uVar139 != 0) {
                        uVar122 = 0;
                      }
                      uVar122 = 4 - (uVar122 + (byte)dec_trailing_zero_table[uVar139]);
                    }
                    else {
                      uVar132 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar139 = uVar132 * -100 + iVar147;
                      lVar145 = uVar107 + lVar134 + lVar117;
                      *(undefined2 *)((long)puVar152 + lVar137 + 5 + lVar145) =
                           *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)((long)puVar152 + lVar137 + 7 + lVar145) =
                           *(undefined2 *)(digit_table + uVar139 * 2);
                      uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar132] + 2;
                      if (uVar139 != 0) {
                        uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar139];
                      }
                      uVar122 = 8 - uVar122;
                    }
                  }
                  else {
                    uVar139 = (uint)(iVar147 * 0x147b) >> 0x13;
                    uVar132 = (uint)((uVar122 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar156 = uVar132 >> 8;
                    uVar148 = uVar156 * 0x147b >> 0x13;
                    uVar122 = (ulong)uVar148;
                    uVar132 = uVar148 * -100 + (uVar132 >> 8);
                    lVar146 = uVar107 + lVar134 + lVar117;
                    *(undefined2 *)((long)puVar152 + lVar137 + 5 + lVar146) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)((long)puVar152 + lVar137 + 7 + lVar146) =
                         *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar147) * 2);
                    *(undefined2 *)((long)puVar152 + lVar137 + 9 + lVar146) =
                         *(undefined2 *)(digit_table + uVar122 * 2);
                    *(undefined2 *)((long)puVar152 + lVar137 + 0xb + lVar146) =
                         *(undefined2 *)(digit_table + uVar132 * 2);
                    lVar145 = 0xc;
                    iVar138 = uVar156 * -10000 + iVar138;
                    if (iVar138 != 0) {
                      uVar132 = (uint)(iVar138 * 0x147b) >> 0x13;
                      uVar122 = (ulong)uVar132;
                      uVar132 = uVar132 * -100 + iVar138;
                      *(undefined2 *)((long)puVar152 + lVar137 + 0xd + lVar146) =
                           *(undefined2 *)(digit_table + uVar122 * 2);
                      *(undefined2 *)((long)puVar152 + lVar137 + 0xf + lVar146) =
                           *(undefined2 *)(digit_table + uVar132 * 2);
                      lVar145 = 0x10;
                    }
                    uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar122] + 2;
                    if (uVar132 != 0) {
                      uVar122 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                    }
                    uVar122 = lVar145 - uVar122;
                  }
                  pbVar114 = (byte *)((long)puVar152 +
                                     lVar137 + (uVar122 & 0xffffffff) + lVar117 + lVar134 + uVar107
                                     + 1);
                  for (uVar122 = 0; uVar142 != uVar122; uVar122 = uVar122 + 1) {
                    *(byte *)((long)puVar127 + uVar122 + lVar134) =
                         *(byte *)((long)puVar127 + uVar122 + lVar134 + 1);
                  }
                  pbVar112 = (byte *)((long)puVar152 + lVar137 + lVar134 + (ulong)uVar142);
                  pbVar155 = pbVar112 + 2;
                  *pbVar112 = 0x2e;
                  if (pbVar155 < pbVar114) {
                    pbVar155 = pbVar114;
                  }
                }
              }
              else {
                auVar13._8_8_ = 0;
                auVar13._0_8_ = uVar122;
                uVar126 = SUB168(auVar13 / ZEXT816(100000000),0);
                uVar148 = SUB164(auVar13 / ZEXT816(100000000),0);
                lVar117 = 2 - (ulong)(uVar148 < 100000000);
                uVar107 = (uVar126 & 0xffffffff) / 10000;
                iVar138 = (int)uVar107;
                iVar147 = iVar138 * -10000 + uVar148;
                uVar122 = uVar126 * 0xfa0a1f00 + uVar122;
                iVar136 = (int)(uVar107 * 0x28f5d >> 0x18);
                uVar132 = (uint)(iVar136 * 0x29) >> 0xc;
                uVar156 = uVar132 * -100 + iVar136;
                uVar139 = iVar136 * -100 + iVar138;
                *(byte *)((long)puVar152 + lVar137 + 1 + lVar134) = (char)uVar132 + 0x30;
                lVar145 = lVar134 + lVar117;
                uVar107 = (ulong)(uVar156 < 10 && uVar148 < 100000000);
                *(undefined2 *)((long)puVar152 + lVar137 + lVar145) =
                     *(undefined2 *)(digit_table + uVar107 + uVar156 * 2);
                *(undefined2 *)((long)puVar152 + lVar137 + 2 + (lVar145 - uVar107)) =
                     *(undefined2 *)(digit_table + uVar139 * 2);
                lVar146 = -uVar107;
                iVar138 = (int)uVar122;
                if (iVar138 == 0) {
                  if (iVar147 == 0) {
                    uVar132 = (uint)(byte)dec_trailing_zero_table[uVar156];
                    if (uVar139 != 0) {
                      uVar132 = 0;
                    }
                    uVar132 = uVar132 + (byte)dec_trailing_zero_table[uVar139];
                    iVar138 = 4;
                  }
                  else {
                    uVar132 = (uint)(iVar147 * 0x147b) >> 0x13;
                    uVar139 = uVar132 * -100 + iVar147;
                    *(undefined2 *)((long)puVar152 + lVar137 + 4 + lVar146 + lVar145) =
                         *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)((long)puVar152 + lVar137 + 6 + lVar146 + lVar145) =
                         *(undefined2 *)(digit_table + uVar139 * 2);
                    uVar132 = (byte)dec_trailing_zero_table[uVar132] + 2;
                    if (uVar139 != 0) {
                      uVar132 = (uint)(byte)dec_trailing_zero_table[uVar139];
                    }
                    iVar138 = 8;
                  }
                  uVar132 = iVar138 - uVar132;
                }
                else {
                  uVar157 = (uint)(iVar147 * 0x147b) >> 0x13;
                  uVar132 = (uint)((uVar122 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar139 = uVar132 >> 8;
                  uVar156 = uVar139 * 0x147b >> 0x13;
                  uVar148 = uVar156 * -100 + (uVar132 >> 8);
                  lVar118 = lVar146 + lVar145;
                  *(undefined2 *)((long)puVar152 + lVar137 + 4 + lVar118) =
                       *(undefined2 *)(digit_table + (ulong)uVar157 * 2);
                  *(undefined2 *)((long)puVar152 + lVar137 + 6 + lVar118) =
                       *(undefined2 *)(digit_table + (uVar157 * 0x7fffff9c + iVar147) * 2);
                  *(undefined2 *)((long)puVar152 + lVar137 + 8 + lVar118) =
                       *(undefined2 *)(digit_table + (ulong)uVar156 * 2);
                  *(undefined2 *)((long)puVar152 + lVar137 + 10 + lVar118) =
                       *(undefined2 *)(digit_table + uVar148 * 2);
                  iVar138 = uVar139 * -10000 + iVar138;
                  if (iVar138 == 0) {
                    uVar132 = (byte)dec_trailing_zero_table[uVar156] + 2;
                    if (uVar148 != 0) {
                      uVar132 = (uint)(byte)dec_trailing_zero_table[uVar148];
                    }
                    iVar138 = 0xc;
                  }
                  else {
                    uVar132 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar139 = uVar132 * -100 + iVar138;
                    *(undefined2 *)((long)puVar152 + lVar137 + 0xc + lVar118) =
                         *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)((long)puVar152 + lVar137 + 0xe + lVar118) =
                         *(undefined2 *)(digit_table + uVar139 * 2);
                    uVar132 = (byte)dec_trailing_zero_table[uVar132] + 2;
                    if (uVar139 != 0) {
                      uVar132 = (uint)(byte)dec_trailing_zero_table[uVar139];
                    }
                    iVar138 = 0x10;
                  }
                  uVar132 = iVar138 - uVar132;
                }
                uVar126 = (ulong)uVar132;
                uVar122 = (ulong)((lVar117 - uVar107) + uVar126 == 2);
                lVar118 = -uVar122;
                lVar117 = (lVar145 - uVar122) + lVar146 + uVar126;
                uVar142 = uVar142 - 1;
                *pbVar155 = *(byte *)((long)puVar152 + lVar137 + lVar134 + 1);
                *(byte *)((long)puVar152 + lVar137 + lVar134 + 1) = 0x2e;
                pbVar155 = (byte *)((long)puVar152 + lVar137 + lVar117);
                pbVar155[0] = 0x65;
                pbVar155[1] = 0x2d;
                uVar122 = (ulong)(uVar142 >> 0x1f);
                lVar117 = uVar122 + lVar117;
                uVar132 = -uVar142;
                if (0 < (int)uVar142) {
                  uVar132 = uVar142;
                }
                if (99 < uVar132) {
                  *(byte *)((long)puVar152 + lVar137 + lVar117 + 1) =
                       (char)(uVar132 * 0x290 >> 0x10) + 0x30;
                  uVar113 = *(undefined2 *)
                             (digit_table + ((uVar132 * 0x290 >> 0x10) * 0x7fffff9c + uVar132) * 2);
                  pbVar155 = (byte *)((long)puVar152 +
                                     lVar137 + lVar118 + lVar145 + uVar122 + lVar146 + uVar126 + 4);
                  goto LAB_01f4ee91;
                }
                *(undefined2 *)((long)puVar152 + lVar137 + lVar117 + 1) =
                     *(undefined2 *)(digit_table + (ulong)(uVar132 < 10) + (ulong)uVar132 * 2);
                pbVar155 = (byte *)((long)puVar152 +
                                   lVar137 + ((lVar145 + uVar122 + lVar118) - (ulong)(uVar132 < 10))
                                             + lVar146 + uVar126 + 3);
              }
            }
          }
        }
LAB_01f4f032:
        pbVar155[0] = 0x2c;
        pbVar155[1] = 10;
        puVar152 = (uint *)(pbVar155 + 2);
      }
      else if (((uint)uVar122 & 7) == 5) {
        uVar126 = uVar122 >> 8;
        uVar107 = 0x10;
        if ((uVar142 & uVar132) == 0) {
          uVar107 = uVar153;
        }
        pbVar155 = (byte *)(pyVar125->uni).str;
        uVar107 = uVar107 + uVar126 * 6;
        if (local_e8 <= (ulong *)(uVar107 + (long)puVar152)) {
          uVar108 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar107) {
            uVar108 = uVar107;
          }
          sVar129 = (uVar108 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar114 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar129);
          if (pbVar114 == (byte *)0x0) goto LAB_01f52bff;
          sVar124 = (long)local_a8 - (long)local_e8;
          memmove(pbVar114 + (sVar129 - sVar124),pbVar114 + ((long)local_e8 - (long)local_100),
                  sVar124);
          puVar152 = (uint *)(pbVar114 + ((long)puVar152 - (long)local_100));
          local_a8 = (ulong *)(pbVar114 + sVar129);
          local_100 = pbVar114;
          local_e8 = (ulong *)(pbVar114 + (sVar129 - sVar124));
          local_d8 = (uint *)sVar129;
        }
        lVar134 = 0;
        if ((uVar142 & uVar132) == 0) {
          lVar134 = lVar135;
        }
        while (lVar134 != 0) {
          *puVar152 = 0x20202020;
          puVar152 = (uint *)((long)puVar152 + lVar128);
          lVar134 = lVar134 + -1;
        }
        if ((puVar131 != enc_table_cpy) || ((pyVar125->tag & 0x18) == 0)) {
          puVar127 = (uint *)(pbVar155 + uVar126);
          *(byte *)puVar152 = 0x22;
LAB_01f4d72e:
          lVar137 = (long)puVar127 - (long)pbVar155;
          lVar134 = 0;
          while( true ) {
            puVar123 = (uint *)(pbVar155 + lVar134);
            puVar115 = (uint *)((long)puVar152 + lVar134 + 1);
            if (lVar137 < 0x10) break;
            bVar154 = (byte)*puVar123;
            if (puVar131[bVar154] != '\0') {
              puVar123 = (uint *)(pbVar155 + lVar134);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 1);
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 1]] != '\0') {
              puVar123 = (uint *)(pbVar155 + lVar134);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 1);
              goto LAB_01f4de92;
            }
            if (puVar131[pbVar155[lVar134 + 2]] != '\0') {
              puVar123 = (uint *)(pbVar155 + lVar134);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 1);
              goto LAB_01f4d92d;
            }
            if (puVar131[pbVar155[lVar134 + 3]] != '\0') {
              puVar123 = (uint *)(pbVar155 + lVar134);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 1);
              goto LAB_01f4d954;
            }
            if (puVar131[pbVar155[lVar134 + 4]] != '\0') {
              puVar123 = (uint *)(pbVar155 + lVar134 + 4);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 5);
              *(undefined4 *)((long)puVar152 + lVar134 + 1) = *(undefined4 *)(pbVar155 + lVar134);
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 5]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 5);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 6);
              *(byte *)((long)puVar115 + -1) = pbVar155[4];
              *(undefined4 *)((long)puVar115 + -5) = *(undefined4 *)pbVar155;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 6]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 6);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 7);
              *(ushort *)((long)puVar115 + -2) = *(ushort *)(pbVar155 + 4);
              *(undefined4 *)((long)puVar115 + -6) = *(undefined4 *)pbVar155;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 7]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 7);
              uVar4 = *(undefined4 *)pbVar155;
              puVar115 = (uint *)((long)puVar152 + lVar134 + 8);
              *(undefined4 *)((long)puVar152 + lVar134 + 4) = *(undefined4 *)(pbVar155 + 3);
              *(undefined4 *)((long)puVar152 + lVar134 + 1) = uVar4;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 8]] != '\0') {
              puVar123 = (uint *)(pbVar155 + lVar134 + 8);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 9);
              *(undefined8 *)((long)puVar152 + lVar134 + 1) = *(undefined8 *)(pbVar155 + lVar134);
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 9]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 9);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 10);
              *(byte *)((long)puVar115 + -1) = pbVar155[8];
              *(undefined8 *)((long)puVar115 + -9) = *(undefined8 *)pbVar155;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 10]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 10);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 0xb);
              *(ushort *)((long)puVar115 + -2) = *(ushort *)(pbVar155 + 8);
              *(undefined8 *)((long)puVar115 + -10) = *(undefined8 *)pbVar155;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 0xb]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 0xb);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 0xc);
              puVar115[-1] = *(uint *)(pbVar155 + 7);
              *(undefined8 *)((long)puVar115 + -0xb) = *(undefined8 *)pbVar155;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 0xc]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 0xc);
              puVar115 = (uint *)((long)puVar152 + lVar134 + 0xd);
              puVar115[-1] = *(uint *)(pbVar155 + 8);
              *(undefined8 *)(puVar115 + -3) = *(undefined8 *)pbVar155;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 0xd]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 0xd);
              uVar116 = *(undefined8 *)pbVar155;
              puVar115 = (uint *)((long)puVar152 + lVar134 + 0xe);
              *(undefined8 *)((long)puVar152 + lVar134 + 6) = *(undefined8 *)(pbVar155 + 5);
              *(undefined8 *)((long)puVar152 + lVar134 + 1) = uVar116;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 0xe]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 0xe);
              uVar116 = *(undefined8 *)pbVar155;
              puVar115 = (uint *)((long)puVar152 + lVar134 + 0xf);
              *(undefined8 *)((long)puVar152 + lVar134 + 7) = *(undefined8 *)(pbVar155 + 6);
              *(undefined8 *)((long)puVar152 + lVar134 + 1) = uVar116;
              goto LAB_01f4db04;
            }
            if (puVar131[pbVar155[lVar134 + 0xf]] != '\0') {
              pbVar155 = pbVar155 + lVar134;
              puVar123 = (uint *)(pbVar155 + 0xf);
              uVar116 = *(undefined8 *)pbVar155;
              puVar115 = (uint *)((long)puVar152 + lVar134 + 0x10);
              *(undefined8 *)((long)puVar152 + lVar134 + 8) = *(undefined8 *)(pbVar155 + 7);
              *(undefined8 *)((long)puVar152 + lVar134 + 1) = uVar116;
              goto LAB_01f4db04;
            }
            uVar139 = puVar123[1];
            uVar148 = puVar123[2];
            uVar156 = puVar123[3];
            *puVar115 = *puVar123;
            *(uint *)((long)puVar152 + lVar134 + 5) = uVar139;
            *(uint *)((long)puVar152 + lVar134 + 9) = uVar148;
            *(uint *)((long)puVar152 + lVar134 + 0xd) = uVar156;
            lVar134 = lVar134 + 0x10;
            lVar137 = lVar137 + -0x10;
          }
LAB_01f4d874:
          if (3 < lVar137) {
            if (puVar131[(byte)*puVar123] == '\0') {
              if (puVar131[*(byte *)((long)puVar123 + 1)] == '\0') {
                if (puVar131[*(byte *)((long)puVar123 + 2)] == '\0') {
                  if (puVar131[*(byte *)((long)puVar123 + 3)] == '\0') goto code_r0x01f4d8b5;
LAB_01f4d954:
                  *(byte *)((long)puVar115 + 2) = *(byte *)((long)puVar123 + 2);
                  *(ushort *)puVar115 = (ushort)*puVar123;
                  puVar115 = (uint *)((long)puVar115 + 3);
                  puVar123 = (uint *)((long)puVar123 + 3);
                }
                else {
LAB_01f4d92d:
                  *(ushort *)puVar115 = (ushort)*puVar123;
                  puVar115 = (uint *)((long)puVar115 + 2);
                  puVar123 = (uint *)((long)puVar123 + 2);
                }
              }
              else {
                bVar154 = (byte)*puVar123;
LAB_01f4de92:
                *(byte *)puVar115 = bVar154;
                puVar115 = (uint *)((long)puVar115 + 1);
                puVar123 = (uint *)((long)puVar123 + 1);
              }
            }
            goto LAB_01f4db04;
          }
          goto LAB_01f4d8d3;
        }
        *(byte *)puVar152 = 0x22;
        pbVar114 = (byte *)((long)puVar152 + 1);
        for (uVar107 = uVar126; 0xf < uVar107; uVar107 = uVar107 - 0x10) {
          uVar4 = *(undefined4 *)(pbVar155 + 4);
          uVar104 = *(undefined4 *)(pbVar155 + 8);
          uVar105 = *(undefined4 *)(pbVar155 + 0xc);
          *(undefined4 *)pbVar114 = *(undefined4 *)pbVar155;
          *(undefined4 *)(pbVar114 + 4) = uVar4;
          *(undefined4 *)(pbVar114 + 8) = uVar104;
          *(undefined4 *)(pbVar114 + 0xc) = uVar105;
          pbVar114 = pbVar114 + 0x10;
          pbVar155 = pbVar155 + 0x10;
        }
        for (uVar126 = uVar126 - (uVar122 >> 8 & 0xfffffffffffff0); 3 < uVar126;
            uVar126 = uVar126 - 4) {
          *(undefined4 *)pbVar114 = *(undefined4 *)pbVar155;
          pbVar114 = pbVar114 + 4;
          pbVar155 = pbVar155 + 4;
        }
        for (uVar122 = 0; uVar126 != uVar122; uVar122 = uVar122 + 1) {
          pbVar114[uVar122] = pbVar155[uVar122];
        }
        puVar115 = (uint *)(pbVar114 + uVar122);
switchD_01f4db32_default:
        bVar162 = (~uVar142 & uVar132) == 0;
        *(byte *)puVar115 = 0x22;
        bVar154 = 0x3a;
        if (bVar162) {
          bVar154 = 0x2c;
        }
        *(byte *)((long)puVar115 + 1) = bVar154;
        bVar154 = 0x20;
        if (bVar162) {
          bVar154 = 10;
        }
        *(byte *)((long)puVar115 + 2) = bVar154;
        puVar152 = (uint *)((long)puVar115 + 3);
      }
      else if ((~(byte)uVar122 & 6) == 0) {
        if (0xff < uVar122) {
          local_48 = (ulong)(bVar154 == 7);
          if ((uVar142 & uVar132) != 0) {
            uVar110 = 0x20;
          }
          if (local_e8 <= (ulong *)(uVar110 + (long)puVar152)) {
            uVar153 = (ulong)local_d8 >> 1;
            if ((ulong)local_d8 >> 1 <= uVar110) {
              uVar153 = uVar110;
            }
            sVar129 = (uVar153 + 7 & 0xfffffffffffffff8) + (long)local_d8;
            pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar129);
            if (pbVar155 == (byte *)0x0) goto LAB_01f52bff;
            sVar124 = (long)local_a8 - (long)local_e8;
            memmove(pbVar155 + (sVar129 - sVar124),pbVar155 + ((long)local_e8 - (long)local_100),
                    sVar124);
            puVar152 = (uint *)(pbVar155 + ((long)puVar152 - (long)local_100));
            local_a8 = (ulong *)(pbVar155 + sVar129);
            local_d8 = (uint *)sVar129;
            local_e8 = (ulong *)(pbVar155 + (sVar129 - sVar124));
            local_100 = pbVar155;
          }
          local_e8[-1] = uVar109 + lVar143 * 2;
          local_e8 = local_e8 + -1;
          lVar143 = 0;
          if ((uVar142 & uVar132) == 0) {
            lVar143 = lVar135;
          }
          puVar152 = (uint *)((long)puVar152 + 2);
          while (bVar162 = lVar143 != 0, lVar143 = lVar143 + -1, bVar162) {
            ((ushort *)((long)puVar152 + -2))[0] = 0x2020;
            ((ushort *)((long)puVar152 + -2))[1] = 0x2020;
            puVar152 = (uint *)((long)puVar152 + lVar128);
          }
          lVar143 = (uVar122 >> 8) << (bVar154 == 7);
          lVar135 = lVar135 + 1;
          *(byte *)((long)puVar152 + -2) = (bVar154 == 7) << 5 | 0x5b;
          *(byte *)((long)puVar152 + -1) = 10;
          pyVar125 = pyVar125 + 1;
          goto LAB_01f4d195;
        }
        uVar122 = 0x10;
        if ((uVar142 & uVar132) == 0) {
          uVar122 = uVar153;
        }
        if (local_e8 <= (ulong *)(uVar122 + (long)puVar152)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar122) {
            uVar107 = uVar122;
          }
          sVar129 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar129);
          if (pbVar155 == (byte *)0x0) goto LAB_01f52bff;
          sVar124 = (long)local_a8 - (long)local_e8;
          memmove(pbVar155 + (sVar129 - sVar124),pbVar155 + ((long)local_e8 - (long)local_100),
                  sVar124);
          puVar152 = (uint *)(pbVar155 + ((long)puVar152 - (long)local_100));
          local_a8 = (ulong *)(pbVar155 + sVar129);
          local_d8 = (uint *)sVar129;
          local_e8 = (ulong *)(pbVar155 + (sVar129 - sVar124));
          local_100 = pbVar155;
        }
        lVar134 = 0;
        if ((uVar142 & uVar132) == 0) {
          lVar134 = lVar135;
        }
        puVar152 = puVar152 + 1;
        while (bVar162 = lVar134 != 0, lVar134 = lVar134 + -1, bVar162) {
          puVar152[-1] = 0x20202020;
          puVar152 = (uint *)((long)puVar152 + lVar128);
        }
        bVar154 = (bVar154 == 7) * ' ';
        *(byte *)(puVar152 + -1) = bVar154 + 0x5b;
        *(byte *)((long)puVar152 + -3) = bVar154 | 0x5d;
        *(ushort *)((long)puVar152 + -2) = 0xa2c;
      }
      else if (bVar154 == 1) {
        uVar122 = uVar122 >> 8;
        pvVar9 = (pyVar125->uni).ptr;
        if (local_e8 <= (ulong *)((long)puVar152 + uVar122 + 3)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar122 + 3) {
            uVar107 = uVar122 + 3;
          }
          sVar129 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar129);
          if (pbVar155 == (byte *)0x0) goto LAB_01f52bff;
          sVar124 = (long)local_a8 - (long)local_e8;
          memmove(pbVar155 + (sVar129 - sVar124),pbVar155 + ((long)local_e8 - (long)local_100),
                  sVar124);
          puVar152 = (uint *)(pbVar155 + ((long)puVar152 - (long)local_100));
          local_a8 = (ulong *)(pbVar155 + sVar129);
          local_e8 = (ulong *)(pbVar155 + (sVar129 - sVar124));
          local_100 = pbVar155;
          local_d8 = (uint *)sVar129;
        }
        switchD_0193dc74::default(puVar152,pvVar9,uVar122);
        pbVar155 = (byte *)((long)puVar152 + uVar122);
        puVar152 = (uint *)(pbVar155 + 2);
        pbVar155[0] = 0x2c;
        pbVar155[1] = 10;
      }
      else if (bVar154 == 2) {
        uVar122 = 0x10;
        if ((uVar142 & uVar132) == 0) {
          uVar122 = uVar153;
        }
        if (local_e8 <= (ulong *)(uVar122 + (long)puVar152)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar122) {
            uVar107 = uVar122;
          }
          sVar129 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar129);
          if (pbVar155 == (byte *)0x0) goto LAB_01f52bff;
          sVar124 = (long)local_a8 - (long)local_e8;
          memmove(pbVar155 + (sVar129 - sVar124),pbVar155 + ((long)local_e8 - (long)local_100),
                  sVar124);
          puVar152 = (uint *)(pbVar155 + ((long)puVar152 - (long)local_100));
          local_a8 = (ulong *)(pbVar155 + sVar129);
          local_d8 = (uint *)sVar129;
          local_e8 = (ulong *)(pbVar155 + (sVar129 - sVar124));
          local_100 = pbVar155;
        }
        lVar134 = 0;
        if ((uVar142 & uVar132) == 0) {
          lVar134 = lVar135;
        }
        puVar152 = (uint *)((long)puVar152 + 6);
        while (bVar162 = lVar134 != 0, lVar134 = lVar134 + -1, bVar162) {
          ((ushort *)((long)puVar152 + -6))[0] = 0x2020;
          ((ushort *)((long)puVar152 + -6))[1] = 0x2020;
          puVar152 = (uint *)((long)puVar152 + lVar128);
        }
        puVar159 = (ushort *)((long)puVar152 + -6);
        puVar159[0] = 0x756e;
        puVar159[1] = 0x6c6c;
        puVar159[2] = 0xa2c;
        puVar159[3] = 0;
      }
      else {
        if (bVar154 != 3) goto LAB_01f52ca5;
        uVar122 = 0x10;
        if ((uVar142 & uVar132) == 0) {
          uVar122 = uVar153;
        }
        if (local_e8 <= (ulong *)(uVar122 + (long)puVar152)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar122) {
            uVar107 = uVar122;
          }
          sVar129 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar129);
          if (pbVar155 == (byte *)0x0) goto LAB_01f52bff;
          sVar124 = (long)local_a8 - (long)local_e8;
          memmove(pbVar155 + (sVar129 - sVar124),pbVar155 + ((long)local_e8 - (long)local_100),
                  sVar124);
          puVar152 = (uint *)(pbVar155 + ((long)puVar152 - (long)local_100));
          local_a8 = (ulong *)(pbVar155 + sVar129);
          local_d8 = (uint *)sVar129;
          local_e8 = (ulong *)(pbVar155 + (sVar129 - sVar124));
          local_100 = pbVar155;
        }
        lVar134 = 0;
        if ((uVar142 & uVar132) == 0) {
          lVar134 = lVar135;
        }
        pbVar155 = (byte *)((long)puVar152 + 7);
        while (bVar162 = lVar134 != 0, lVar134 = lVar134 + -1, bVar162) {
          pbVar155[-7] = 0x20;
          pbVar155[-6] = 0x20;
          pbVar155[-5] = 0x20;
          pbVar155[-4] = 0x20;
          pbVar155 = pbVar155 + lVar128;
        }
        bVar162 = (pyVar125->tag & 0x18) != 0;
        uVar116 = 0xa2c65736c6166;
        if (bVar162) {
          uVar116 = 0xa2c65757274;
        }
        *(undefined8 *)(pbVar155 + -7) = uVar116;
        puVar152 = (uint *)(pbVar155 + -(ulong)bVar162);
      }
      pyVar125 = pyVar125 + 1;
      lVar143 = lVar143 + -1;
      puVar127 = local_d8;
      lVar134 = lVar135;
      if (lVar143 == 0) goto LAB_01f4ff57;
      goto LAB_01f4d1ca;
    }
    if ((flg & 2) == 0) {
      puVar131 = enc_table_cpy;
      puVar158 = enc_table_cpy_slash;
    }
    else {
      puVar131 = enc_table_esc;
      puVar158 = enc_table_esc_slash;
    }
    if ((flg & 4) == 0) {
      puVar158 = puVar131;
    }
    local_f8 = ((val->uni).u64 >> 4) * 0x12 + 0x47 & 0xfffffffffffffff8;
    local_100 = (byte *)(*p_Var5)(pvVar7,local_f8);
    if (local_100 != (byte *)0x0) {
      puVar152 = (uint *)(local_100 + local_f8);
      bVar162 = (~(uint)val->tag & 7) == 0;
      local_78 = (ulong)bVar162;
      lVar135 = (val->tag >> 8) << bVar162;
      puVar127 = (uint *)(local_100 + 1);
      *local_100 = bVar162 << 5 | 0x5b;
      pyVar125 = val + 1;
      local_d8 = puVar152;
LAB_01f501de:
      do {
        uVar151 = local_78 & 0xff;
        do {
          uVar110 = pyVar125->tag;
          bVar154 = (byte)uVar110 & 7;
          local_108 = puVar152;
          if (bVar154 == 4) {
            if (puVar152 <= puVar127 + 8) {
              uVar110 = local_f8 >> 1;
              if (local_f8 >> 1 < 0x21) {
                uVar110 = 0x20;
              }
              sVar129 = (uVar110 + 7 & 0xfffffffffffffff8) + local_f8;
              pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar129);
              if (pbVar155 == (byte *)0x0) goto LAB_01f52c4c;
              local_108 = (uint *)(pbVar155 + (sVar129 - ((long)local_d8 - (long)puVar152)));
              memmove(local_108,pbVar155 + ((long)puVar152 - (long)local_100),
                      (long)local_d8 - (long)puVar152);
              puVar127 = (uint *)(pbVar155 + ((long)puVar127 - (long)local_100));
              local_d8 = (uint *)(pbVar155 + sVar129);
              uVar110 = pyVar125->tag;
              local_100 = pbVar155;
              local_f8 = sVar129;
            }
            pcVar111 = (char *)(pyVar125->uni).u64;
            uVar142 = (uint)((ulong)pcVar111 >> 0x20);
            if ((uVar110 & 0x10) == 0) {
              uVar142 = uVar142 >> 0x1f & (uint)(uVar110 >> 3);
              *(byte *)puVar127 = 0x2d;
              pcVar119 = (char *)-(long)pcVar111;
              if (uVar142 == 0) {
                pcVar119 = pcVar111;
              }
              pbVar155 = (byte *)((ulong)uVar142 + (long)puVar127);
              if (pcVar119 < (char *)0x5f5e100) {
                if (pcVar119 < (char *)0x64) {
                  *(undefined2 *)pbVar155 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar119 < (char *)0xa) + (long)pcVar119 * 2);
                  puVar127 = (uint *)(pbVar155 + (2 - (ulong)(pcVar119 < (char *)0xa)));
                }
                else {
                  iVar138 = (int)pcVar119;
                  if (pcVar119 < (char *)0x2710) {
                    uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar110 = (ulong)(pcVar119 < (char *)0x3e8);
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)(digit_table + uVar110 + (ulong)uVar142 * 2);
                    *(undefined2 *)(pbVar155 + (2 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                    puVar127 = (uint *)(pbVar155 + (4 - uVar110));
                  }
                  else if (pcVar119 < (char *)0xf4240) {
                    iVar138 = (int)((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * -10000 + iVar138;
                    uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar110 = (ulong)(pcVar119 < (char *)0x186a0);
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)
                          (digit_table + uVar110 + ((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pbVar155 + (2 - uVar110)) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pbVar155 + (4 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                    puVar127 = (uint *)(pbVar155 + (6 - uVar110));
                  }
                  else {
                    uVar142 = (uint)((ulong)((long)pcVar119 * 0x68db8bb) >> 0x20);
                    uVar132 = uVar142 >> 8;
                    iVar138 = uVar132 * -10000 + iVar138;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar110 = (ulong)(pcVar119 <
                                     "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                     );
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)(digit_table + uVar110 + (ulong)uVar132 * 2);
                    *(undefined2 *)(pbVar155 + (2 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)(pbVar155 + (4 - uVar110)) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)(pbVar155 + (6 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                    puVar127 = (uint *)(pbVar155 + (8 - uVar110));
                  }
                }
              }
              else {
                auVar18._8_8_ = 0;
                auVar18._0_8_ = pcVar119;
                lVar128 = SUB168(auVar18 / ZEXT816(100000000),0);
                pcVar111 = pcVar119 + lVar128 * 0xfa0a1f00;
                iVar138 = SUB164(auVar18 / ZEXT816(100000000),0);
                if (pcVar119 < (char *)0x2386f26fc10000) {
                  if (pcVar119 < (char *)0x2540be400) {
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar119 < (char *)0x3b9aca00) + lVar128 * 2);
                    pbVar155 = pbVar155 + (2 - (ulong)(pcVar119 < (char *)0x3b9aca00));
                  }
                  else if (pcVar119 < (char *)0xe8d4a51000) {
                    uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar110 = (ulong)((ulong)pcVar119 >> 0xb < 0x2e90edd);
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)(digit_table + uVar110 + (ulong)uVar142 * 2);
                    *(undefined2 *)(pbVar155 + (2 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                    pbVar155 = pbVar155 + (4 - uVar110);
                  }
                  else if (pcVar119 < (char *)0x5af3107a4000) {
                    iVar138 = (int)((ulong)(lVar128 * 0x68db9) >> 0x20) * -10000 + iVar138;
                    uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar110 = (ulong)((ulong)pcVar119 >> 0xd < 0x48c27395);
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)
                          (digit_table + uVar110 + ((ulong)(lVar128 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pbVar155 + (2 - uVar110)) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pbVar155 + (4 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                    pbVar155 = pbVar155 + (6 - uVar110);
                  }
                  else {
                    uVar142 = (uint)((ulong)(lVar128 * 0x68db8bb) >> 0x20);
                    uVar132 = uVar142 >> 8;
                    iVar138 = uVar132 * -10000 + iVar138;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar110 = (ulong)(pcVar119 < (char *)0x38d7ea4c68000);
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)(digit_table + uVar110 + (ulong)uVar132 * 2);
                    *(undefined2 *)(pbVar155 + (2 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)(pbVar155 + (4 - uVar110)) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)(pbVar155 + (6 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                    pbVar155 = pbVar155 + (8 - uVar110);
                  }
                  uVar142 = (uint)(((ulong)pcVar111 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar132 = uVar142 >> 8;
                  iVar138 = uVar132 * -10000 + (int)pcVar111;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar155 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                  *(undefined2 *)(pbVar155 + 2) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                  *(undefined2 *)(pbVar155 + 4) = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                  *(undefined2 *)(pbVar155 + 6) =
                       *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar138) * 2);
                  puVar127 = (uint *)(pbVar155 + 8);
                }
                else {
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = pcVar119;
                  lVar128 = SUB168(auVar19 / ZEXT816(1000000000000),0);
                  iVar136 = SUB164(auVar19 / ZEXT816(1000000000000),0);
                  if (pcVar119 < (char *)0xde0b6b3a7640000) {
                    uVar110 = lVar128 * 0x68db9;
                    iVar147 = (int)(uVar110 >> 0x20) * -10000 + iVar136;
                    uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                    uVar153 = (ulong)(pcVar119 < (char *)0x16345785d8a0000);
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)(digit_table + uVar153 + (uVar110 >> 0x20) * 2);
                    *(undefined2 *)(pbVar155 + (2 - uVar153)) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pbVar155 + (4 - uVar153)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
                    lVar128 = 6 - uVar153;
                  }
                  else {
                    uVar142 = (uint)((ulong)(lVar128 * 0x68db8bb) >> 0x20);
                    uVar132 = uVar142 >> 8;
                    iVar147 = uVar132 * -10000 + iVar136;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar147 * 0x147b) >> 0x13;
                    uVar110 = (ulong)(pcVar119 < (char *)0x8ac7230489e80000);
                    *(undefined2 *)pbVar155 =
                         *(undefined2 *)(digit_table + uVar110 + (ulong)uVar132 * 2);
                    *(undefined2 *)(pbVar155 + (2 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)(pbVar155 + (4 - uVar110)) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)(pbVar155 + (6 - uVar110)) =
                         *(undefined2 *)(digit_table + (uVar139 * -100 + iVar147) * 2);
                    lVar128 = 8 - uVar110;
                  }
                  pbVar155 = pbVar155 + lVar128;
                  iVar138 = iVar138 + iVar136 * -10000;
                  uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar155 = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  *(undefined2 *)(pbVar155 + 2) =
                       *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar138) * 2);
                  uVar142 = (uint)(((ulong)pcVar111 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar132 = uVar142 >> 8;
                  iVar138 = uVar132 * -10000 + (int)pcVar111;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                  *(undefined2 *)(pbVar155 + 4) = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                  *(undefined2 *)(pbVar155 + 6) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                  *(undefined2 *)(pbVar155 + 8) = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                  *(undefined2 *)(pbVar155 + 10) =
                       *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar138) * 2);
                  puVar127 = (uint *)(pbVar155 + 0xc);
                }
              }
            }
            else {
              uVar110 = (ulong)pcVar111 & 0xfffffffffffff;
              uVar142 = uVar142 >> 0x14 & 0x7ff;
              if (uVar142 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) goto LAB_01f52ce1;
                  if (uVar110 == 0) {
                    *(byte *)puVar127 = 0x2d;
                    puVar160 = (undefined8 *)((long)puVar127 - ((long)pcVar111 >> 0x3f));
                    *puVar160 = 0x7974696e69666e49;
                    puVar127 = (uint *)(puVar160 + 1);
                  }
                  else {
                    *puVar127 = 0x4e614e;
                    puVar127 = (uint *)((long)puVar127 + 3);
                  }
                }
                else {
                  *puVar127 = 0x6c6c756e;
                  puVar127 = puVar127 + 1;
                }
              }
              else {
                *(byte *)puVar127 = 0x2d;
                lVar128 = -((long)pcVar111 >> 0x3f);
                puVar1 = (undefined4 *)((long)puVar127 + lVar128);
                if (((ulong)pcVar111 & 0x7fffffffffffffff) == 0) {
                  *puVar1 = 0x302e30;
                  puVar127 = (uint *)((long)puVar1 + 3);
                }
                else if (uVar142 == 0) {
                  uVar153 = (ulong)((uint)pcVar111 & 1);
                  uVar110 = uVar110 * 0x20;
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = uVar110 - 0x10;
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = SUB168(auVar50 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = uVar110 - 0x10;
                  auVar95 = auVar51 * ZEXT816(0x9e19db92b4e31ba9) + auVar95;
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar110;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = SUB168(auVar52 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = uVar110;
                  auVar96 = auVar53 * ZEXT816(0x9e19db92b4e31ba9) + auVar96;
                  uVar109 = auVar96._8_8_;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = uVar110 + 0x10;
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ = SUB168(auVar54 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = uVar110 + 0x10;
                  auVar97 = auVar55 * ZEXT816(0x9e19db92b4e31ba9) + auVar97;
                  uVar110 = ((ulong)((auVar95 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar95._8_8_) + uVar153;
                  uVar153 = ((ulong)((auVar97 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar97._8_8_) - uVar153;
                  if (uVar109 < 0x28) {
LAB_01f522d8:
                    uVar122 = (auVar96 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0 | uVar109;
                    uVar107 = uVar109 & 0x7ffffffffffffffc;
                    bVar162 = true;
                    if (uVar122 <= (uVar107 | 2)) {
                      bVar162 = (bool)((byte)((uVar109 & 0xffffffff) >> 2) & 0x3f &
                                      uVar122 == (uVar107 | 2));
                    }
                    uVar122 = uVar109 >> 2;
                    bVar161 = uVar107 + 4 <= uVar153;
                    if (uVar107 < uVar110 == bVar161) {
                      bVar162 = bVar161;
                    }
                    iVar138 = -0x144;
                  }
                  else {
                    uVar122 = uVar109 / 0x28;
                    bVar162 = uVar122 * 0x28 + 0x28 <= uVar153;
                    if (uVar122 * 0x28 < uVar110 != bVar162) goto LAB_01f522d8;
                    iVar138 = -0x143;
                  }
                  pcVar119 = (char *)(bVar162 + uVar122);
                  pcVar111 = (char *)((long)puVar1 + 1);
                  if (pcVar119 < (char *)0x38d7ea4c68000) {
                    iVar136 = (int)pcVar119;
                    if (pcVar119 < (char *)0x5f5e100) {
                      if (pcVar119 < (char *)0x64) {
                        *(undefined2 *)pcVar111 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar119 < (char *)0xa) + (long)pcVar119 * 2);
                        pcVar111 = pcVar111 + (2 - (ulong)(pcVar119 < (char *)0xa));
                      }
                      else if (pcVar119 < (char *)0x2710) {
                        uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                        uVar110 = (ulong)(pcVar119 < (char *)0x3e8);
                        *(undefined2 *)pcVar111 =
                             *(undefined2 *)(digit_table + uVar110 + (ulong)uVar142 * 2);
                        *(undefined2 *)(pcVar111 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                        pcVar111 = pcVar111 + (4 - uVar110);
                      }
                      else {
                        if ((char *)0xf423f < pcVar119) {
                          uVar142 = (uint)((ulong)((long)pcVar119 * 0x68db8bb) >> 0x20);
                          uVar132 = uVar142 >> 8;
                          iVar136 = uVar132 * -10000 + iVar136;
                          uVar132 = uVar132 * 0x147b >> 0x13;
                          uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
                          *(undefined2 *)pcVar111 =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(pcVar119 <
                                       "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                       ) + (ulong)uVar132 * 2);
                          pcVar111 = pcVar111 +
                                     -(ulong)(pcVar119 <
                                             "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                             );
                          *(undefined2 *)(pcVar111 + 2) =
                               *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                          *(undefined2 *)(pcVar111 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                          uVar113 = *(undefined2 *)(digit_table + (uVar139 * -100 + iVar136) * 2);
                          goto LAB_01f529af;
                        }
                        iVar136 = (int)((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * -10000 +
                                  iVar136;
                        uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                        uVar110 = (ulong)(pcVar119 < (char *)0x186a0);
                        *(undefined2 *)pcVar111 =
                             *(undefined2 *)
                              (digit_table +
                              uVar110 + ((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)(pcVar111 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                        *(undefined2 *)(pcVar111 + (4 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                        pcVar111 = pcVar111 + (6 - uVar110);
                      }
                    }
                    else {
                      auVar25._8_8_ = 0;
                      auVar25._0_8_ = pcVar119;
                      lVar128 = SUB168(auVar25 / ZEXT816(100000000),0);
                      iVar147 = SUB164(auVar25 / ZEXT816(100000000),0);
                      if (pcVar119 < (char *)0x2540be400) {
                        *(undefined2 *)pcVar111 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar119 < (char *)0x3b9aca00) + lVar128 * 2);
                        pcVar111 = pcVar111 + (2 - (ulong)(pcVar119 < (char *)0x3b9aca00));
                      }
                      else if (pcVar119 < (char *)0xe8d4a51000) {
                        uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                        uVar110 = (ulong)((ulong)pcVar119 >> 0xb < 0x2e90edd);
                        *(undefined2 *)pcVar111 =
                             *(undefined2 *)(digit_table + uVar110 + (ulong)uVar142 * 2);
                        *(undefined2 *)(pcVar111 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
                        pcVar111 = pcVar111 + (4 - uVar110);
                      }
                      else if (pcVar119 < (char *)0x5af3107a4000) {
                        iVar149 = (int)((ulong)(lVar128 * 0x68db9) >> 0x20) * -10000 + iVar147;
                        uVar142 = (uint)(iVar149 * 0x147b) >> 0x13;
                        uVar110 = (ulong)((ulong)pcVar119 >> 0xd < 0x48c27395);
                        *(undefined2 *)pcVar111 =
                             *(undefined2 *)
                              (digit_table + uVar110 + ((ulong)(lVar128 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)(pcVar111 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                        *(undefined2 *)(pcVar111 + (4 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar149) * 2);
                        pcVar111 = pcVar111 + (6 - uVar110);
                      }
                      else {
                        uVar142 = (uint)((ulong)(lVar128 * 0x68db8bb) >> 0x20);
                        uVar132 = uVar142 >> 8;
                        iVar149 = uVar132 * -10000 + iVar147;
                        uVar132 = uVar132 * 0x147b >> 0x13;
                        uVar139 = (uint)(iVar149 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar1 + 1) =
                             *(undefined2 *)(digit_table + (ulong)uVar132 * 2 + 1);
                        *(undefined2 *)((long)puVar1 + 2) =
                             *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                        *(undefined2 *)(puVar1 + 1) =
                             *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                        *(undefined2 *)((long)puVar1 + 6) =
                             *(undefined2 *)(digit_table + (uVar139 * -100 + iVar149) * 2);
                        pcVar111 = (char *)(puVar1 + 2);
                      }
                      uVar132 = iVar147 * -100000000 + iVar136;
                      uVar142 = (uint)((ulong)uVar132 * 0x68db8bb >> 0x20);
                      uVar139 = uVar142 >> 8;
                      iVar136 = uVar139 * -10000 + uVar132;
                      uVar132 = uVar139 * 0x147b >> 0x13;
                      uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
                      *(undefined2 *)pcVar111 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)(pcVar111 + 2) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                      *(undefined2 *)(pcVar111 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                      uVar113 = *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar136) * 2);
LAB_01f529af:
                      *(undefined2 *)(pcVar111 + 6) = uVar113;
                      pcVar111 = pcVar111 + 8;
                    }
                  }
                  else {
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = pcVar119;
                    uVar110 = SUB168(auVar24 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                              (ulong)pcVar119 / 100000000;
                    *pcVar111 = SUB161(auVar24 / ZEXT816(10000000000000000),0) + '0';
                    pcVar111 = pcVar111 + ((char *)0x2386f26fc0ffff < pcVar119);
                    uVar142 = (uint)((uVar110 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar132 = uVar142 >> 8;
                    iVar136 = uVar132 * -10000 + (int)uVar110;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
                    *(undefined2 *)pcVar111 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)(pcVar111 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)(pcVar111 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)(pcVar111 + 6) =
                         *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar136) * 2);
                    uVar142 = (uint)(((ulong)(pcVar119 + ((ulong)pcVar119 / 100000000) * 0xfa0a1f00)
                                     & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar132 = uVar142 >> 8;
                    iVar136 = uVar132 * -10000 +
                              (int)(pcVar119 + ((ulong)pcVar119 / 100000000) * 0xfa0a1f00);
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
                    *(undefined2 *)(pcVar111 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)(pcVar111 + 10) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)(pcVar111 + 0xc) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)(pcVar111 + 0xe) =
                         *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar136) * 2);
                    pcVar111 = pcVar111 + 0x10;
                  }
                  *(undefined1 *)puVar1 = *(undefined1 *)((long)puVar1 + 1);
                  *(undefined1 *)((long)puVar1 + 1) = 0x2e;
                  lVar128 = 0;
                  do {
                    lVar143 = lVar128 + -1;
                    lVar128 = lVar128 + -1;
                  } while (pcVar111[lVar143] == '0');
                  iVar138 = ((int)pcVar111 - (int)puVar1) + iVar138 + -2;
                  pcVar111 = pcVar111 + lVar128 + (ulong)(pcVar111[lVar143] != '.');
                  pcVar111[0] = 'e';
                  pcVar111[1] = '-';
                  uVar142 = iVar138 * -0x290;
                  pcVar111[2] = (char)(uVar142 >> 0x10) + '0';
                  *(undefined2 *)(pcVar111 + 3) =
                       *(undefined2 *)(digit_table + ((uVar142 >> 0x10) * 0x7fffff9c - iVar138) * 2)
                  ;
                  puVar127 = (uint *)(pcVar111 + 5);
                }
                else {
                  uVar153 = uVar110 + 0x10000000000000;
                  if (uVar142 - 0x3ff < 0x35) {
                    lVar143 = 0;
                    if (uVar153 != 0) {
                      for (; (uVar153 >> lVar143 & 1) == 0; lVar143 = lVar143 + 1) {
                      }
                    }
                    if ((uint)lVar143 < 0x433 - uVar142) goto LAB_01f504be;
                    pcVar111 = (char *)(uVar153 >> ((byte)(0x433 - uVar142) & 0x3f));
                    iVar138 = (int)pcVar111;
                    if (pcVar111 < (char *)0x5f5e100) {
                      if (pcVar111 < (char *)0x64) {
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar111 < (char *)0xa) + (long)pcVar111 * 2);
                        pcVar111 = (char *)((long)puVar1 + (2 - (ulong)(pcVar111 < (char *)0xa)));
                      }
                      else if (pcVar111 < (char *)0x2710) {
                        uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                        uVar110 = (ulong)(pcVar111 < (char *)0x3e8);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)(digit_table + uVar110 + (ulong)uVar142 * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                        pcVar111 = (char *)((long)puVar1 + (4 - uVar110));
                      }
                      else {
                        if ((char *)0xf423f < pcVar111) {
                          uVar142 = (uint)((ulong)((long)pcVar111 * 0x68db8bb) >> 0x20);
                          uVar132 = uVar142 >> 8;
                          iVar138 = uVar132 * -10000 + iVar138;
                          uVar132 = uVar132 * 0x147b >> 0x13;
                          uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(pcVar111 <
                                       "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                       ) + (ulong)uVar132 * 2);
                          puVar140 = (undefined2 *)
                                     ((long)puVar1 -
                                     (ulong)(pcVar111 <
                                            "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                            ));
                          puVar140[1] = *(undefined2 *)
                                         (digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                          puVar140[2] = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                          uVar113 = *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                          goto LAB_01f51f96;
                        }
                        iVar138 = (int)((ulong)((long)pcVar111 * 0x68db9) >> 0x20) * -10000 +
                                  iVar138;
                        uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                        uVar110 = (ulong)(pcVar111 < (char *)0x186a0);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table +
                              uVar110 + ((ulong)((long)pcVar111 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                        *(undefined2 *)((long)puVar1 + (4 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                        pcVar111 = (char *)((long)puVar1 + (6 - uVar110));
                      }
                    }
                    else {
                      auVar23._8_8_ = 0;
                      auVar23._0_8_ = pcVar111;
                      lVar128 = SUB168(auVar23 / ZEXT816(100000000),0);
                      iVar136 = SUB164(auVar23 / ZEXT816(100000000),0);
                      if (pcVar111 < (char *)0x2540be400) {
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar111 < (char *)0x3b9aca00) + lVar128 * 2);
                        puVar140 = (undefined2 *)
                                   ((long)puVar1 + (2 - (ulong)(pcVar111 < (char *)0x3b9aca00)));
                      }
                      else if (pcVar111 < (char *)0xe8d4a51000) {
                        uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                        uVar110 = (ulong)((ulong)pcVar111 >> 0xb < 0x2e90edd);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)(digit_table + uVar110 + (ulong)uVar142 * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                        puVar140 = (undefined2 *)((long)puVar1 + (4 - uVar110));
                      }
                      else if (pcVar111 < (char *)0x5af3107a4000) {
                        iVar147 = (int)((ulong)(lVar128 * 0x68db9) >> 0x20) * -10000 + iVar136;
                        uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                        uVar110 = (ulong)((ulong)pcVar111 >> 0xd < 0x48c27395);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + uVar110 + ((ulong)(lVar128 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                        *(undefined2 *)((long)puVar1 + (4 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
                        puVar140 = (undefined2 *)((long)puVar1 + (6 - uVar110));
                      }
                      else {
                        uVar142 = (uint)((ulong)(lVar128 * 0x68db8bb) >> 0x20);
                        uVar132 = uVar142 >> 8;
                        iVar147 = uVar132 * -10000 + iVar136;
                        uVar132 = uVar132 * 0x147b >> 0x13;
                        uVar139 = (uint)(iVar147 * 0x147b) >> 0x13;
                        uVar110 = (ulong)(pcVar111 < (char *)0x38d7ea4c68000);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)(digit_table + uVar110 + (ulong)uVar132 * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                        *(undefined2 *)((long)puVar1 + (4 - uVar110)) =
                             *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                        *(undefined2 *)((long)puVar1 + (6 - uVar110)) =
                             *(undefined2 *)(digit_table + (uVar139 * -100 + iVar147) * 2);
                        puVar140 = (undefined2 *)((long)puVar1 + (8 - uVar110));
                      }
                      uVar132 = iVar136 * -100000000 + iVar138;
                      uVar142 = (uint)((ulong)uVar132 * 0x68db8bb >> 0x20);
                      uVar139 = uVar142 >> 8;
                      iVar138 = uVar139 * -10000 + uVar132;
                      uVar132 = uVar139 * 0x147b >> 0x13;
                      uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                      *puVar140 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      puVar140[1] = *(undefined2 *)
                                     (digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                      puVar140[2] = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                      uVar113 = *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar138) * 2);
LAB_01f51f96:
                      puVar140[3] = uVar113;
                      pcVar111 = (char *)(puVar140 + 4);
                    }
                    pcVar111[0] = '.';
                    pcVar111[1] = '0';
LAB_01f51fa5:
                    puVar127 = (uint *)(pcVar111 + 2);
                  }
                  else {
LAB_01f504be:
                    uVar109 = (ulong)((uint)pcVar111 & 1);
                    iVar138 = uVar142 * 0x4d105 + -0x200a5;
                    if (uVar142 == 1 || uVar110 != 0) {
                      iVar138 = uVar142 * 0x4d105;
                    }
                    iVar138 = iVar138 + -0x1439b7ff >> 0x14;
                    uVar122 = *(ulong *)(pow10_sig_table + (ulong)(iVar138 * -2 + 0x2ae) * 8);
                    uVar126 = *(long *)(pow10_sig_table + (ulong)(iVar138 * -2 + 0x2af) * 8) +
                              (ulong)(iVar138 - 1U < 0xffffffc8);
                    bVar154 = ((char)((uint)(iVar138 * -0x3526b) >> 0x10) + (char)uVar142) - 0x32;
                    uVar110 = (ulong)(uVar142 != 1 && uVar110 == 0) + uVar153 * 4 + -2 <<
                              (bVar154 & 0x3f);
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = uVar126;
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = uVar110;
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = SUB168(auVar44 * auVar74,8);
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = uVar122;
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar110;
                    auVar92 = auVar45 * auVar75 + auVar92;
                    uVar110 = uVar153 * 4 << (bVar154 & 0x3f);
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar126;
                    auVar76._8_8_ = 0;
                    auVar76._0_8_ = uVar110;
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = SUB168(auVar46 * auVar76,8);
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = uVar122;
                    auVar77._8_8_ = 0;
                    auVar77._0_8_ = uVar110;
                    auVar93 = auVar47 * auVar77 + auVar93;
                    uVar107 = auVar93._8_8_;
                    uVar110 = uVar153 * 4 + 2 << (bVar154 & 0x3f);
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = uVar126;
                    auVar78._8_8_ = 0;
                    auVar78._0_8_ = uVar110;
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = SUB168(auVar48 * auVar78,8);
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar122;
                    auVar79._8_8_ = 0;
                    auVar79._0_8_ = uVar110;
                    auVar94 = auVar49 * auVar79 + auVar94;
                    uVar110 = ((ulong)((auVar92 & (undefined1  [16])0xfffffffffffffffe) !=
                                      (undefined1  [16])0x0) | auVar92._8_8_) + uVar109;
                    uVar109 = ((ulong)((auVar94 & (undefined1  [16])0xfffffffffffffffe) !=
                                      (undefined1  [16])0x0) | auVar94._8_8_) - uVar109;
                    if (uVar107 < 0x28) {
LAB_01f50602:
                      uVar122 = (auVar93 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0 | uVar107;
                      uVar153 = uVar107 & 0xfffffffffffffffc;
                      bVar162 = true;
                      if (uVar122 <= uVar153 + 2) {
                        bVar162 = (bool)((byte)((uVar107 & 0xffffffff) >> 2) & 0x3f &
                                        uVar122 == uVar153 + 2);
                      }
                      bVar161 = uVar153 + 4 <= uVar109;
                      if (uVar153 < uVar110 == bVar161) {
                        bVar162 = bVar161;
                      }
                      uVar110 = (ulong)bVar162 + (uVar107 >> 2);
                    }
                    else {
                      uVar122 = (uVar107 / 0x28) * 0x28;
                      uVar153 = uVar122 + 0x28;
                      if (uVar122 < uVar110 != uVar153 <= uVar109) goto LAB_01f50602;
                      uVar110 = (uVar107 / 0x28 + 1) - (ulong)(uVar109 < uVar153);
                      iVar138 = iVar138 + 1;
                    }
                    iVar136 = (0x11 - (uint)(uVar110 < 10000000000000000)) -
                              (uint)(uVar110 < 1000000000000000);
                    uVar142 = iVar136 + iVar138;
                    if (iVar136 + iVar138 + 5U < 0x1b) {
                      if ((int)uVar142 < 1) {
                        auVar22._8_8_ = 0;
                        auVar22._0_8_ = uVar110;
                        uVar109 = SUB168(auVar22 / ZEXT816(100000000),0);
                        uVar139 = SUB164(auVar22 / ZEXT816(100000000),0);
                        puVar140 = (undefined2 *)
                                   ((long)puVar1 +
                                   (((ulong)(2 - uVar142) + 1) - (ulong)(uVar139 < 100000000)));
                        uVar153 = (uVar109 & 0xffffffff) / 10000;
                        iVar147 = (int)(uVar153 * 0x28f5d >> 0x18);
                        uVar132 = (uint)(iVar147 * 0x29) >> 0xc;
                        *(char *)((long)puVar1 + (ulong)(2 - uVar142)) = (char)uVar132 + '0';
                        iVar138 = (int)uVar153;
                        iVar136 = iVar138 * -10000 + uVar139;
                        uVar110 = uVar109 * 0xfa0a1f00 + uVar110;
                        uVar148 = uVar132 * -100 + iVar147;
                        uVar132 = iVar147 * -100 + iVar138;
                        uVar153 = (ulong)(uVar148 < 10 && uVar139 < 100000000);
                        *puVar140 = *(undefined2 *)(digit_table + uVar153 + uVar148 * 2);
                        *(undefined2 *)((long)puVar140 + (2 - uVar153)) =
                             *(undefined2 *)(digit_table + uVar132 * 2);
                        iVar138 = (int)uVar110;
                        if (iVar138 == 0) {
                          if (iVar136 == 0) {
                            uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar148];
                            if (uVar132 != 0) {
                              uVar110 = 0;
                            }
                            uVar110 = uVar110 + (byte)dec_trailing_zero_table[uVar132];
                            lStack_120 = 4;
                          }
                          else {
                            uVar132 = (uint)(iVar136 * 0x147b) >> 0x13;
                            uVar139 = uVar132 * -100 + iVar136;
                            *(undefined2 *)((long)puVar140 + (4 - uVar153)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                            *(undefined2 *)((long)puVar140 + (6 - uVar153)) =
                                 *(undefined2 *)(digit_table + uVar139 * 2);
                            uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar132] + 2;
                            if (uVar139 != 0) {
                              uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar139];
                            }
                            lStack_120 = 8;
                          }
                          uVar110 = lStack_120 - uVar110;
                        }
                        else {
                          uVar148 = (uint)(iVar136 * 0x147b) >> 0x13;
                          uVar132 = (uint)((uVar110 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar156 = uVar132 >> 8;
                          uVar139 = uVar156 * 0x147b >> 0x13;
                          uVar110 = (ulong)uVar139;
                          uVar132 = uVar139 * -100 + (uVar132 >> 8);
                          *(undefined2 *)((long)puVar140 + (4 - uVar153)) =
                               *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
                          *(undefined2 *)((long)puVar140 + (6 - uVar153)) =
                               *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar136) * 2);
                          *(undefined2 *)((long)puVar140 + (8 - uVar153)) =
                               *(undefined2 *)(digit_table + uVar110 * 2);
                          *(undefined2 *)((long)puVar140 + (10 - uVar153)) =
                               *(undefined2 *)(digit_table + uVar132 * 2);
                          lVar128 = 0xc;
                          iVar138 = uVar156 * -10000 + iVar138;
                          if (iVar138 != 0) {
                            uVar132 = (uint)(iVar138 * 0x147b) >> 0x13;
                            uVar110 = (ulong)uVar132;
                            uVar132 = uVar132 * -100 + iVar138;
                            *(undefined2 *)((long)puVar140 + (0xc - uVar153)) =
                                 *(undefined2 *)(digit_table + uVar110 * 2);
                            *(undefined2 *)((long)puVar140 + (0xe - uVar153)) =
                                 *(undefined2 *)(digit_table + uVar132 * 2);
                            lVar128 = 0x10;
                          }
                          uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar110] + 2;
                          if (uVar132 != 0) {
                            uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                          }
                          uVar110 = lVar128 - uVar110;
                        }
                        *(undefined2 *)puVar1 = 0x2e30;
                        for (uVar109 = 0;
                            puVar127 = (uint *)((long)puVar140 + ((uVar110 & 0xffffffff) - uVar153))
                            , -uVar142 != uVar109; uVar109 = uVar109 + 1) {
                          *(undefined1 *)((long)puVar1 + uVar109 + 2) = 0x30;
                        }
                      }
                      else {
                        auVar20._8_8_ = 0;
                        auVar20._0_8_ = uVar110;
                        uVar109 = SUB168(auVar20 / ZEXT816(100000000),0);
                        uVar139 = SUB164(auVar20 / ZEXT816(100000000),0);
                        puVar140 = (undefined2 *)((long)puVar1 + (2 - (ulong)(uVar139 < 100000000)))
                        ;
                        uVar153 = (uVar109 & 0xffffffff) / 10000;
                        iVar138 = (int)uVar153;
                        iVar147 = iVar138 * -10000 + uVar139;
                        uVar110 = uVar109 * 0xfa0a1f00 + uVar110;
                        iVar136 = (int)(uVar153 * 0x28f5d >> 0x18);
                        uVar156 = (uint)(iVar136 * 0x29) >> 0xc;
                        uVar148 = uVar156 * -100 + iVar136;
                        uVar132 = iVar136 * -100 + iVar138;
                        *puVar1 = 0x30303030;
                        puVar1[1] = 0x30303030;
                        puVar1[2] = 0x30303030;
                        puVar1[3] = 0x30303030;
                        *(undefined8 *)(puVar1 + 4) = 0x3030303030303030;
                        *(char *)((long)puVar1 + 1) = (char)uVar156 + '0';
                        uVar153 = (ulong)(uVar148 < 10 && uVar139 < 100000000);
                        *puVar140 = *(undefined2 *)(digit_table + uVar153 + uVar148 * 2);
                        *(undefined2 *)((long)puVar140 + (2 - uVar153)) =
                             *(undefined2 *)(digit_table + uVar132 * 2);
                        iVar138 = (int)uVar110;
                        if (iVar138 == 0) {
                          if (iVar147 == 0) {
                            uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar148];
                            if (uVar132 != 0) {
                              uVar110 = 0;
                            }
                            uVar110 = 4 - (uVar110 + (byte)dec_trailing_zero_table[uVar132]);
                          }
                          else {
                            uVar132 = (uint)(iVar147 * 0x147b) >> 0x13;
                            uVar139 = uVar132 * -100 + iVar147;
                            *(undefined2 *)((long)puVar140 + (4 - uVar153)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                            *(undefined2 *)((long)puVar140 + (6 - uVar153)) =
                                 *(undefined2 *)(digit_table + uVar139 * 2);
                            uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar132] + 2;
                            if (uVar139 != 0) {
                              uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar139];
                            }
                            uVar110 = 8 - uVar110;
                          }
                        }
                        else {
                          uVar148 = (uint)(iVar147 * 0x147b) >> 0x13;
                          uVar132 = (uint)((uVar110 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar156 = uVar132 >> 8;
                          uVar139 = uVar156 * 0x147b >> 0x13;
                          uVar110 = (ulong)uVar139;
                          uVar132 = uVar139 * -100 + (uVar132 >> 8);
                          *(undefined2 *)((long)puVar140 + (4 - uVar153)) =
                               *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
                          *(undefined2 *)((long)puVar140 + (6 - uVar153)) =
                               *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar147) * 2);
                          *(undefined2 *)((long)puVar140 + (8 - uVar153)) =
                               *(undefined2 *)(digit_table + uVar110 * 2);
                          *(undefined2 *)((long)puVar140 + (10 - uVar153)) =
                               *(undefined2 *)(digit_table + uVar132 * 2);
                          lVar143 = 0xc;
                          iVar138 = uVar156 * -10000 + iVar138;
                          if (iVar138 != 0) {
                            uVar132 = (uint)(iVar138 * 0x147b) >> 0x13;
                            uVar110 = (ulong)uVar132;
                            uVar132 = uVar132 * -100 + iVar138;
                            *(undefined2 *)((long)puVar140 + (0xc - uVar153)) =
                                 *(undefined2 *)(digit_table + uVar110 * 2);
                            *(undefined2 *)((long)puVar140 + (0xe - uVar153)) =
                                 *(undefined2 *)(digit_table + uVar132 * 2);
                            lVar143 = 0x10;
                          }
                          uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar110] + 2;
                          if (uVar132 != 0) {
                            uVar110 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                          }
                          uVar110 = lVar143 - uVar110;
                        }
                        puVar152 = (uint *)((long)puVar140 + ((uVar110 & 0xffffffff) - uVar153));
                        for (uVar110 = 0; uVar142 != uVar110; uVar110 = uVar110 + 1) {
                          *(byte *)((long)puVar127 + uVar110 + lVar128) =
                               *(byte *)((long)puVar127 + uVar110 + lVar128 + 1);
                        }
                        puVar131 = (undefined1 *)((ulong)uVar142 + (long)puVar1);
                        puVar127 = (uint *)(puVar131 + 2);
                        *puVar131 = 0x2e;
                        if (puVar127 < puVar152) {
                          puVar127 = puVar152;
                        }
                      }
                    }
                    else {
                      auVar21._8_8_ = 0;
                      auVar21._0_8_ = uVar110;
                      uVar109 = SUB168(auVar21 / ZEXT816(100000000),0);
                      uVar139 = SUB164(auVar21 / ZEXT816(100000000),0);
                      lVar128 = 2 - (ulong)(uVar139 < 100000000);
                      uVar153 = (uVar109 & 0xffffffff) / 10000;
                      iVar138 = (int)uVar153;
                      iVar147 = iVar138 * -10000 + uVar139;
                      uVar110 = uVar109 * 0xfa0a1f00 + uVar110;
                      iVar136 = (int)(uVar153 * 0x28f5d >> 0x18);
                      uVar156 = (uint)(iVar136 * 0x29) >> 0xc;
                      uVar148 = uVar156 * -100 + iVar136;
                      uVar132 = iVar136 * -100 + iVar138;
                      *(char *)((long)puVar1 + 1) = (char)uVar156 + '0';
                      uVar153 = (ulong)(uVar148 < 10 && uVar139 < 100000000);
                      *(undefined2 *)((long)puVar1 + lVar128) =
                           *(undefined2 *)(digit_table + uVar153 + uVar148 * 2);
                      lVar128 = lVar128 - uVar153;
                      *(undefined2 *)((long)puVar1 + lVar128 + 2) =
                           *(undefined2 *)(digit_table + uVar132 * 2);
                      iVar138 = (int)uVar110;
                      if (iVar138 == 0) {
                        if (iVar147 == 0) {
                          uVar139 = (uint)(byte)dec_trailing_zero_table[uVar148];
                          if (uVar132 != 0) {
                            uVar139 = 0;
                          }
                          uVar132 = 4 - (uVar139 + (byte)dec_trailing_zero_table[uVar132]);
                        }
                        else {
                          uVar132 = (uint)(iVar147 * 0x147b) >> 0x13;
                          uVar139 = uVar132 * -100 + iVar147;
                          *(undefined2 *)((long)puVar1 + lVar128 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                          *(undefined2 *)((long)puVar1 + lVar128 + 6) =
                               *(undefined2 *)(digit_table + uVar139 * 2);
                          uVar132 = (byte)dec_trailing_zero_table[uVar132] + 2;
                          if (uVar139 != 0) {
                            uVar132 = (uint)(byte)dec_trailing_zero_table[uVar139];
                          }
                          uVar132 = 8 - uVar132;
                        }
                      }
                      else {
                        uVar156 = (uint)(iVar147 * 0x147b) >> 0x13;
                        uVar132 = (uint)((uVar110 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar157 = uVar132 >> 8;
                        uVar148 = uVar157 * 0x147b >> 0x13;
                        uVar139 = uVar148 * -100 + (uVar132 >> 8);
                        *(undefined2 *)((long)puVar1 + lVar128 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar156 * 2);
                        *(undefined2 *)((long)puVar1 + lVar128 + 6) =
                             *(undefined2 *)(digit_table + (uVar156 * 0x7fffff9c + iVar147) * 2);
                        *(undefined2 *)((long)puVar1 + lVar128 + 8) =
                             *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
                        *(undefined2 *)((long)puVar1 + lVar128 + 10) =
                             *(undefined2 *)(digit_table + uVar139 * 2);
                        iVar138 = uVar157 * -10000 + iVar138;
                        if (iVar138 == 0) {
                          uVar132 = (byte)dec_trailing_zero_table[uVar148] + 2;
                          if (uVar139 != 0) {
                            uVar132 = (uint)(byte)dec_trailing_zero_table[uVar139];
                          }
                          uVar132 = 0xc - uVar132;
                        }
                        else {
                          uVar132 = (uint)(iVar138 * 0x147b) >> 0x13;
                          uVar139 = uVar132 * -100 + iVar138;
                          *(undefined2 *)((long)puVar1 + lVar128 + 0xc) =
                               *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                          *(undefined2 *)((long)puVar1 + lVar128 + 0xe) =
                               *(undefined2 *)(digit_table + uVar139 * 2);
                          uVar132 = (byte)dec_trailing_zero_table[uVar132] + 2;
                          if (uVar139 != 0) {
                            uVar132 = (uint)(byte)dec_trailing_zero_table[uVar139];
                          }
                          uVar132 = 0x10 - uVar132;
                        }
                      }
                      puVar140 = (undefined2 *)
                                 ((long)puVar1 +
                                 (((ulong)uVar132 + lVar128) -
                                 (ulong)((ulong)uVar132 + lVar128 == 2)));
                      uVar142 = uVar142 - 1;
                      *(undefined1 *)puVar1 = *(undefined1 *)((long)puVar1 + 1);
                      *(undefined1 *)((long)puVar1 + 1) = 0x2e;
                      *puVar140 = 0x2d65;
                      uVar139 = uVar142 >> 0x1f;
                      pcVar111 = (char *)((long)puVar140 + (ulong)uVar139 + 1);
                      uVar132 = -uVar142;
                      if (0 < (int)uVar142) {
                        uVar132 = uVar142;
                      }
                      if (uVar132 < 100) {
                        *(undefined2 *)pcVar111 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar132 < 10) + (ulong)uVar132 * 2);
                        pcVar111 = pcVar111 + -(ulong)(uVar132 < 10);
                        goto LAB_01f51fa5;
                      }
                      *pcVar111 = (char)(uVar132 * 0x290 >> 0x10) + '0';
                      *(undefined2 *)((long)puVar140 + (ulong)uVar139 + 2) =
                           *(undefined2 *)
                            (digit_table + ((uVar132 * 0x290 >> 0x10) * 0x7fffff9c + uVar132) * 2);
                      puVar127 = (uint *)((long)puVar140 + (ulong)uVar139 + 4);
                    }
                  }
                }
              }
            }
            *(byte *)puVar127 = 0x2c;
            puVar127 = (uint *)((long)puVar127 + 1);
          }
          else if (((uint)uVar110 & 7) == 5) {
            uVar153 = uVar110 >> 8;
            pbVar155 = (byte *)(pyVar125->uni).str;
            if (puVar152 <= (uint *)((long)puVar127 + uVar153 * 6 + 0x10)) {
              uVar122 = uVar153 * 6 + 0x10;
              uVar109 = local_f8 >> 1;
              if (local_f8 >> 1 <= uVar122) {
                uVar109 = uVar122;
              }
              sVar129 = (uVar109 + 7 & 0xfffffffffffffff8) + local_f8;
              pbVar114 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar129);
              if (pbVar114 == (byte *)0x0) goto LAB_01f52c4c;
              local_108 = (uint *)(pbVar114 + (sVar129 - ((long)local_d8 - (long)puVar152)));
              memmove(local_108,pbVar114 + ((long)puVar152 - (long)local_100),
                      (long)local_d8 - (long)puVar152);
              puVar127 = (uint *)(pbVar114 + ((long)puVar127 - (long)local_100));
              local_d8 = (uint *)(pbVar114 + sVar129);
              local_100 = pbVar114;
              local_f8 = sVar129;
            }
            if ((puVar158 != enc_table_cpy) || ((pyVar125->tag & 0x18) == 0)) {
              puVar152 = (uint *)(pbVar155 + uVar153);
              *(byte *)puVar127 = 0x22;
LAB_01f50667:
              lVar143 = (long)puVar152 - (long)pbVar155;
              lVar128 = 0;
              while( true ) {
                puVar123 = (uint *)(pbVar155 + lVar128);
                puVar115 = (uint *)((long)puVar127 + lVar128 + 1);
                if (lVar143 < 0x10) break;
                bVar154 = (byte)*puVar123;
                if (puVar158[bVar154] != '\0') {
                  puVar123 = (uint *)(pbVar155 + lVar128);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 1);
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 1]] != '\0') {
                  puVar123 = (uint *)(pbVar155 + lVar128);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 1);
                  goto LAB_01f50e3b;
                }
                if (puVar158[pbVar155[lVar128 + 2]] != '\0') {
                  puVar123 = (uint *)(pbVar155 + lVar128);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 1);
                  goto LAB_01f50862;
                }
                if (puVar158[pbVar155[lVar128 + 3]] != '\0') {
                  puVar123 = (uint *)(pbVar155 + lVar128);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 1);
                  goto LAB_01f5088d;
                }
                if (puVar158[pbVar155[lVar128 + 4]] != '\0') {
                  puVar123 = (uint *)(pbVar155 + lVar128 + 4);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 5);
                  *(undefined4 *)((long)puVar127 + lVar128 + 1) =
                       *(undefined4 *)(pbVar155 + lVar128);
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 5]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 5);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 6);
                  *(byte *)((long)puVar115 + -1) = pbVar155[4];
                  *(undefined4 *)((long)puVar115 + -5) = *(undefined4 *)pbVar155;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 6]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 6);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 7);
                  *(ushort *)((long)puVar115 + -2) = *(ushort *)(pbVar155 + 4);
                  *(undefined4 *)((long)puVar115 + -6) = *(undefined4 *)pbVar155;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 7]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 7);
                  uVar4 = *(undefined4 *)pbVar155;
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 8);
                  *(undefined4 *)((long)puVar127 + lVar128 + 4) = *(undefined4 *)(pbVar155 + 3);
                  *(undefined4 *)((long)puVar127 + lVar128 + 1) = uVar4;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 8]] != '\0') {
                  puVar123 = (uint *)(pbVar155 + lVar128 + 8);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 9);
                  *(undefined8 *)((long)puVar127 + lVar128 + 1) =
                       *(undefined8 *)(pbVar155 + lVar128);
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 9]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 9);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 10);
                  *(byte *)((long)puVar115 + -1) = pbVar155[8];
                  *(undefined8 *)((long)puVar115 + -9) = *(undefined8 *)pbVar155;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 10]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 10);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 0xb);
                  *(ushort *)((long)puVar115 + -2) = *(ushort *)(pbVar155 + 8);
                  *(undefined8 *)((long)puVar115 + -10) = *(undefined8 *)pbVar155;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 0xb]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 0xb);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 0xc);
                  puVar115[-1] = *(uint *)(pbVar155 + 7);
                  *(undefined8 *)((long)puVar115 + -0xb) = *(undefined8 *)pbVar155;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 0xc]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 0xc);
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 0xd);
                  puVar115[-1] = *(uint *)(pbVar155 + 8);
                  *(undefined8 *)(puVar115 + -3) = *(undefined8 *)pbVar155;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 0xd]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 0xd);
                  uVar116 = *(undefined8 *)pbVar155;
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 0xe);
                  *(undefined8 *)((long)puVar127 + lVar128 + 6) = *(undefined8 *)(pbVar155 + 5);
                  *(undefined8 *)((long)puVar127 + lVar128 + 1) = uVar116;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 0xe]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 0xe);
                  uVar116 = *(undefined8 *)pbVar155;
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 0xf);
                  *(undefined8 *)((long)puVar127 + lVar128 + 7) = *(undefined8 *)(pbVar155 + 6);
                  *(undefined8 *)((long)puVar127 + lVar128 + 1) = uVar116;
                  goto LAB_01f50a37;
                }
                if (puVar158[pbVar155[lVar128 + 0xf]] != '\0') {
                  pbVar155 = pbVar155 + lVar128;
                  puVar123 = (uint *)(pbVar155 + 0xf);
                  uVar116 = *(undefined8 *)pbVar155;
                  puVar115 = (uint *)((long)puVar127 + lVar128 + 0x10);
                  *(undefined8 *)((long)puVar127 + lVar128 + 8) = *(undefined8 *)(pbVar155 + 7);
                  *(undefined8 *)((long)puVar127 + lVar128 + 1) = uVar116;
                  goto LAB_01f50a37;
                }
                uVar142 = puVar123[1];
                uVar132 = puVar123[2];
                uVar139 = puVar123[3];
                *puVar115 = *puVar123;
                *(uint *)((long)puVar127 + lVar128 + 5) = uVar142;
                *(uint *)((long)puVar127 + lVar128 + 9) = uVar132;
                *(uint *)((long)puVar127 + lVar128 + 0xd) = uVar139;
                lVar128 = lVar128 + 0x10;
                lVar143 = lVar143 + -0x10;
              }
LAB_01f507a1:
              if (3 < lVar143) {
                if (puVar158[(byte)*puVar123] == '\0') {
                  if (puVar158[*(byte *)((long)puVar123 + 1)] == '\0') {
                    if (puVar158[*(byte *)((long)puVar123 + 2)] == '\0') {
                      if (puVar158[*(byte *)((long)puVar123 + 3)] == '\0') goto code_r0x01f507e2;
LAB_01f5088d:
                      *(byte *)((long)puVar115 + 2) = *(byte *)((long)puVar123 + 2);
                      *(ushort *)puVar115 = (ushort)*puVar123;
                      puVar115 = (uint *)((long)puVar115 + 3);
                      puVar123 = (uint *)((long)puVar123 + 3);
                    }
                    else {
LAB_01f50862:
                      *(ushort *)puVar115 = (ushort)*puVar123;
                      puVar115 = (uint *)((long)puVar115 + 2);
                      puVar123 = (uint *)((long)puVar123 + 2);
                    }
                  }
                  else {
                    bVar154 = (byte)*puVar123;
LAB_01f50e3b:
                    *(byte *)puVar115 = bVar154;
                    puVar115 = (uint *)((long)puVar115 + 1);
                    puVar123 = (uint *)((long)puVar123 + 1);
                  }
                }
                goto LAB_01f50a37;
              }
              goto LAB_01f507fc;
            }
            *(byte *)puVar127 = 0x22;
            pbVar114 = (byte *)((long)puVar127 + 1);
            for (uVar109 = uVar153; 0xf < uVar109; uVar109 = uVar109 - 0x10) {
              uVar4 = *(undefined4 *)(pbVar155 + 4);
              uVar104 = *(undefined4 *)(pbVar155 + 8);
              uVar105 = *(undefined4 *)(pbVar155 + 0xc);
              *(undefined4 *)pbVar114 = *(undefined4 *)pbVar155;
              *(undefined4 *)(pbVar114 + 4) = uVar4;
              *(undefined4 *)(pbVar114 + 8) = uVar104;
              *(undefined4 *)(pbVar114 + 0xc) = uVar105;
              pbVar114 = pbVar114 + 0x10;
              pbVar155 = pbVar155 + 0x10;
            }
            for (uVar153 = uVar153 - (uVar110 >> 8 & 0xfffffffffffff0); 3 < uVar153;
                uVar153 = uVar153 - 4) {
              *(undefined4 *)pbVar114 = *(undefined4 *)pbVar155;
              pbVar114 = pbVar114 + 4;
              pbVar155 = pbVar155 + 4;
            }
            for (uVar110 = 0; uVar153 != uVar110; uVar110 = uVar110 + 1) {
              pbVar114[uVar110] = pbVar155[uVar110];
            }
            puVar115 = (uint *)(pbVar114 + uVar110);
switchD_01f50a62_default:
            local_e8._0_4_ = (uint)uVar151;
            bVar154 = 0x3a;
            if ((~(uint)lVar135 & (uint)local_e8) == 0) {
              bVar154 = 0x2c;
            }
            *(byte *)puVar115 = 0x22;
            *(byte *)((long)puVar115 + 1) = bVar154;
            puVar127 = (uint *)((long)puVar115 + 2);
          }
          else if ((~(byte)uVar110 & 6) == 0) {
            if (puVar152 <= puVar127 + 4) {
              uVar153 = local_f8 >> 1;
              if (local_f8 >> 1 < 0x11) {
                uVar153 = 0x10;
              }
              sVar129 = (uVar153 + 7 & 0xfffffffffffffff8) + local_f8;
              pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar129);
              if (pbVar155 == (byte *)0x0) goto LAB_01f52c4c;
              sVar124 = (long)local_d8 - (long)puVar152;
              memmove(pbVar155 + (sVar129 - sVar124),pbVar155 + ((long)puVar152 - (long)local_100),
                      sVar124);
              puVar127 = (uint *)(pbVar155 + ((long)puVar127 - (long)local_100));
              local_d8 = (uint *)(pbVar155 + sVar129);
              puVar152 = (uint *)(pbVar155 + (sVar129 - sVar124));
              local_f8 = sVar129;
              local_100 = pbVar155;
            }
            if (0xff < uVar110) {
              bVar162 = bVar154 == 7;
              local_78 = (ulong)bVar162;
              *(ulong *)(puVar152 + -2) = uVar151 + lVar135 * 2;
              lVar135 = (uVar110 >> 8) << bVar162;
              puVar152 = puVar152 + -2;
              *(byte *)puVar127 = bVar162 << 5 | 0x5b;
              puVar127 = (uint *)((long)puVar127 + 1);
              pyVar125 = pyVar125 + 1;
              goto LAB_01f501de;
            }
            bVar154 = (bVar154 == 7) * ' ';
            *(byte *)puVar127 = bVar154 + 0x5b;
            *(byte *)((long)puVar127 + 1) = bVar154 | 0x5d;
            *(byte *)((long)puVar127 + 2) = 0x2c;
            puVar127 = (uint *)((long)puVar127 + 3);
            local_108 = puVar152;
          }
          else if (bVar154 == 1) {
            uVar110 = uVar110 >> 8;
            pvVar9 = (pyVar125->uni).ptr;
            if (puVar152 <= (uint *)((long)puVar127 + uVar110 + 2)) {
              uVar153 = local_f8 >> 1;
              if (local_f8 >> 1 <= uVar110 + 2) {
                uVar153 = uVar110 + 2;
              }
              sVar129 = (uVar153 + 7 & 0xfffffffffffffff8) + local_f8;
              pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar129);
              if (pbVar155 == (byte *)0x0) goto LAB_01f52c4c;
              sVar124 = (long)local_d8 - (long)puVar152;
              memmove(pbVar155 + (sVar129 - sVar124),pbVar155 + ((long)puVar152 - (long)local_100),
                      sVar124);
              puVar127 = (uint *)(pbVar155 + ((long)puVar127 - (long)local_100));
              local_d8 = (uint *)(pbVar155 + sVar129);
              local_108 = (uint *)(pbVar155 + (sVar129 - sVar124));
              local_100 = pbVar155;
              local_f8 = sVar129;
            }
            switchD_0193dc74::default(puVar127,pvVar9,uVar110);
            pbVar155 = (byte *)((long)puVar127 + uVar110);
            puVar127 = (uint *)(pbVar155 + 1);
            *pbVar155 = 0x2c;
          }
          else {
            uVar142 = (uint)uVar110 & 7;
            if (uVar142 == 2) {
              if (puVar152 <= puVar127 + 4) {
                uVar110 = local_f8 >> 1;
                if (local_f8 >> 1 < 0x11) {
                  uVar110 = 0x10;
                }
                sVar129 = (uVar110 + 7 & 0xfffffffffffffff8) + local_f8;
                pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar129);
                if (pbVar155 == (byte *)0x0) goto LAB_01f52c4c;
                local_108 = (uint *)(pbVar155 + (sVar129 - ((long)local_d8 - (long)puVar152)));
                memmove(local_108,pbVar155 + ((long)puVar152 - (long)local_100),
                        (long)local_d8 - (long)puVar152);
                puVar127 = (uint *)(pbVar155 + ((long)puVar127 - (long)local_100));
                local_d8 = (uint *)(pbVar155 + sVar129);
                local_100 = pbVar155;
                local_f8 = sVar129;
              }
              puVar127[0] = 0x6c6c756e;
              puVar127[1] = 0xa2c;
              puVar127 = (uint *)((long)puVar127 + 5);
            }
            else {
              if (uVar142 != 3) goto LAB_01f52ca5;
              if (puVar152 <= puVar127 + 4) {
                uVar110 = local_f8 >> 1;
                if (local_f8 >> 1 < 0x11) {
                  uVar110 = 0x10;
                }
                sVar129 = (uVar110 + 7 & 0xfffffffffffffff8) + local_f8;
                pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar129);
                if (pbVar155 == (byte *)0x0) goto LAB_01f52c4c;
                local_108 = (uint *)(pbVar155 + (sVar129 - ((long)local_d8 - (long)puVar152)));
                memmove(local_108,pbVar155 + ((long)puVar152 - (long)local_100),
                        (long)local_d8 - (long)puVar152);
                puVar127 = (uint *)(pbVar155 + ((long)puVar127 - (long)local_100));
                local_d8 = (uint *)(pbVar155 + sVar129);
                uVar110 = pyVar125->tag;
                local_100 = pbVar155;
                local_f8 = sVar129;
              }
              bVar162 = (uVar110 & 0x18) != 0;
              uVar116 = 0xa2c65736c6166;
              if (bVar162) {
                uVar116 = 0xa2c65757274;
              }
              *(undefined8 *)puVar127 = uVar116;
              puVar127 = (uint *)((long)puVar127 + (6 - (ulong)bVar162));
            }
          }
          pyVar125 = pyVar125 + 1;
          lVar135 = lVar135 + -1;
          puVar152 = local_108;
        } while (lVar135 != 0);
        lVar128 = 0;
        lVar143 = 0;
        do {
          *(byte *)((long)puVar127 + lVar143 + -1) = (char)local_78 * ' ' + 0x5d;
          *(byte *)((long)puVar127 + lVar143) = 0x2c;
          if (local_d8 <= (uint *)((long)local_108 + lVar128)) {
            if (local_10c < '\0') {
              if ((uint *)((long)local_108 + lVar128) <= (uint *)((long)puVar127 + lVar143 + 3)) {
                uVar151 = 2;
                if (2 < local_f8 >> 1) {
                  uVar151 = local_f8 >> 1;
                }
                uVar151 = uVar151 + 7 & 0xfffffffffffffff8;
                pbVar155 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,uVar151 + local_f8);
                if (pbVar155 == (byte *)0x0) goto LAB_01f52c4c;
                memmove(pbVar155 +
                        (long)((long)local_108 +
                              lVar143 * 8 + ((uVar151 + local_f8) - (long)local_d8)),
                        pbVar155 + (long)((long)local_108 + (lVar143 * 8 - (long)local_100)),
                        (size_t)((long)local_d8 + (-lVar128 - (long)local_108)));
                puVar127 = (uint *)(pbVar155 + ((long)puVar127 - (long)local_100));
                local_100 = pbVar155;
              }
              pbVar155 = (byte *)((long)puVar127 + lVar143) + 1;
              *(byte *)((long)puVar127 + lVar143) = 10;
            }
            else {
              pbVar155 = (byte *)((long)puVar127 + lVar143);
            }
            *pbVar155 = 0;
            if (dat_len != (usize *)0x0) {
              *dat_len = (long)pbVar155 - (long)local_100;
            }
LAB_01f54ef4:
            *(undefined8 *)pyVar106 = 0;
            pyVar106->msg = (char *)0x0;
            return (char *)local_100;
          }
          lVar135 = lVar143 * 2;
          local_78 = *(ulong *)(local_108 + lVar135) & 0xffffffffffffff01;
          lVar143 = lVar143 + 1;
          lVar128 = lVar128 + 8;
          lVar135 = (*(ulong *)(local_108 + lVar135) >> 1) - 1;
        } while (lVar135 == 0);
        puVar152 = (uint *)((long)local_108 + lVar128);
        puVar127 = (uint *)((long)puVar127 + lVar143);
      } while( true );
    }
    local_100 = (byte *)0x0;
LAB_01f52c4c:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar120 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar120 = err;
    }
    pyVar106->code = 2;
    pyVar120->msg = "memory allocation failed";
    goto LAB_01f52c94;
  }
  if ((flg & 2) == 0) {
    puVar158 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar158 = enc_table_cpy;
    }
    switch(bVar154 & 7) {
    case 0:
      goto switchD_01f4d08b_caseD_0;
    case 1:
switchD_01f4d08b_caseD_1:
      uVar151 = uVar151 >> 8;
      pvVar9 = (val->uni).ptr;
      puVar152 = (uint *)(*p_Var5)(pvVar7,uVar151 + 2);
      if (puVar152 != (uint *)0x0) {
        switchD_0193dc74::default(puVar152,pvVar9,uVar151);
        puVar127 = (uint *)((long)puVar152 + uVar151);
        goto LAB_01f52f80;
      }
      break;
    case 2:
switchD_01f4d08b_caseD_2:
      puVar152 = (uint *)(*p_Var5)(pvVar7,8);
      if (puVar152 != (uint *)0x0) {
        puVar152[0] = 0x6c6c756e;
        puVar152[1] = 0xa2c;
        puVar127 = puVar152 + 1;
        goto LAB_01f52f80;
      }
      break;
    case 3:
switchD_01f4d08b_caseD_3:
      puVar152 = (uint *)(*p_Var5)(pvVar7,8);
      if (puVar152 != (uint *)0x0) {
        bVar162 = (val->tag & 0x18) != 0;
        uVar116 = 0xa2c65736c6166;
        if (bVar162) {
          uVar116 = 0xa2c65757274;
        }
        *(undefined8 *)puVar152 = uVar116;
        puVar127 = (uint *)((long)puVar152 + (5 - (ulong)bVar162));
        goto LAB_01f52f80;
      }
      break;
    case 4:
switchD_01f4d08b_caseD_4:
      puVar152 = (uint *)(*p_Var5)(pvVar7,0x22);
      if (puVar152 != (uint *)0x0) {
        pcVar111 = (char *)(val->uni).u64;
        uVar142 = (uint)((ulong)pcVar111 >> 0x20);
        if ((val->tag & 0x10) == 0) {
          uVar142 = uVar142 >> 0x1f & (uint)(val->tag >> 3);
          pcVar119 = (char *)-(long)pcVar111;
          if (uVar142 == 0) {
            pcVar119 = pcVar111;
          }
          *(byte *)puVar152 = 0x2d;
          pbVar155 = (byte *)((long)puVar152 + (ulong)uVar142);
          if (pcVar119 < (char *)0x5f5e100) {
            if (pcVar119 < (char *)0x64) {
              *(undefined2 *)pbVar155 =
                   *(undefined2 *)
                    (digit_table + (ulong)(pcVar119 < (char *)0xa) + (long)pcVar119 * 2);
              pbVar155 = pbVar155 + -(ulong)(pcVar119 < (char *)0xa);
              goto LAB_01f54a2e;
            }
            iVar138 = (int)pcVar119;
            if (pcVar119 < (char *)0x2710) {
              uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
              uVar151 = (ulong)(pcVar119 < (char *)0x3e8);
              *(undefined2 *)pbVar155 = *(undefined2 *)(digit_table + uVar151 + (ulong)uVar142 * 2);
              *(undefined2 *)(pbVar155 + (2 - uVar151)) =
                   *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
              puVar127 = (uint *)(pbVar155 + (4 - uVar151));
              goto LAB_01f52f80;
            }
            if (pcVar119 < (char *)0xf4240) {
              iVar138 = (int)((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * -10000 + iVar138;
              uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
              uVar151 = (ulong)(pcVar119 < (char *)0x186a0);
              *(undefined2 *)pbVar155 =
                   *(undefined2 *)
                    (digit_table + uVar151 + ((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * 2);
              *(undefined2 *)(pbVar155 + (2 - uVar151)) =
                   *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
              *(undefined2 *)(pbVar155 + (4 - uVar151)) =
                   *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
              puVar127 = (uint *)(pbVar155 + (6 - uVar151));
              goto LAB_01f52f80;
            }
            uVar142 = (uint)((ulong)((long)pcVar119 * 0x68db8bb) >> 0x20);
            uVar132 = uVar142 >> 8;
            iVar138 = uVar132 * -10000 + iVar138;
            uVar132 = uVar132 * 0x147b >> 0x13;
            uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
            iVar138 = uVar139 * -100 + iVar138;
            *(undefined2 *)pbVar155 =
                 *(undefined2 *)
                  (digit_table +
                  (ulong)(pcVar119 <
                         "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                         ) + (ulong)uVar132 * 2);
            pbVar155 = pbVar155 +
                       -(ulong)(pcVar119 <
                               "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                               );
            *(undefined2 *)(pbVar155 + 2) =
                 *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
            uVar113 = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
          }
          else {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = pcVar119;
            lVar135 = SUB168(auVar26 / ZEXT816(100000000),0);
            pcVar111 = pcVar119 + lVar135 * 0xfa0a1f00;
            iVar138 = SUB164(auVar26 / ZEXT816(100000000),0);
            if ((char *)0x2386f26fc0ffff < pcVar119) {
              auVar27._8_8_ = 0;
              auVar27._0_8_ = pcVar119;
              lVar135 = SUB168(auVar27 / ZEXT816(1000000000000),0);
              iVar136 = SUB164(auVar27 / ZEXT816(1000000000000),0);
              iVar138 = iVar138 + iVar136 * -10000;
              if (pcVar119 < (char *)0xde0b6b3a7640000) {
                uVar151 = lVar135 * 0x68db9;
                iVar136 = (int)(uVar151 >> 0x20) * -10000 + iVar136;
                uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                uVar110 = (ulong)(pcVar119 < (char *)0x16345785d8a0000);
                *(undefined2 *)pbVar155 =
                     *(undefined2 *)(digit_table + uVar110 + (uVar151 >> 0x20) * 2);
                *(undefined2 *)(pbVar155 + (2 - uVar110)) =
                     *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                *(undefined2 *)(pbVar155 + (4 - uVar110)) =
                     *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                lVar135 = 6 - uVar110;
              }
              else {
                uVar142 = (uint)((ulong)(lVar135 * 0x68db8bb) >> 0x20);
                uVar132 = uVar142 >> 8;
                iVar136 = uVar132 * -10000 + iVar136;
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
                uVar151 = (ulong)(pcVar119 < (char *)0x8ac7230489e80000);
                *(undefined2 *)pbVar155 =
                     *(undefined2 *)(digit_table + uVar151 + (ulong)uVar132 * 2);
                *(undefined2 *)(pbVar155 + (2 - uVar151)) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                *(undefined2 *)(pbVar155 + (4 - uVar151)) =
                     *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                *(undefined2 *)(pbVar155 + (6 - uVar151)) =
                     *(undefined2 *)(digit_table + (uVar139 * -100 + iVar136) * 2);
                lVar135 = 8 - uVar151;
              }
              pbVar155 = pbVar155 + lVar135;
              uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar155 = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
              *(undefined2 *)(pbVar155 + 2) =
                   *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar138) * 2);
              uVar142 = (uint)(((ulong)pcVar111 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar132 = uVar142 >> 8;
              iVar138 = uVar132 * -10000 + (int)pcVar111;
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar155 + 4) = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
              *(undefined2 *)(pbVar155 + 6) =
                   *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
              *(undefined2 *)(pbVar155 + 8) = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
              *(undefined2 *)(pbVar155 + 10) =
                   *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar138) * 2);
              puVar127 = (uint *)(pbVar155 + 0xc);
              goto LAB_01f52f80;
            }
            if ("ueIfIT_Lb1EE25templated_unique_single_tEDpOT0_" < (char *)((ulong)pcVar119 >> 10))
            {
              if ((ulong)pcVar119 >> 0xc < 0xe8d4a51) {
                uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                uVar151 = (ulong)((ulong)pcVar119 >> 0xb < 0x2e90edd);
                *(undefined2 *)pbVar155 =
                     *(undefined2 *)(digit_table + uVar151 + (ulong)uVar142 * 2);
                *(undefined2 *)(pbVar155 + (2 - uVar151)) =
                     *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                pbVar155 = pbVar155 + (4 - uVar151);
              }
              else if (pcVar119 < (char *)0x5af3107a4000) {
                iVar138 = (int)((ulong)(lVar135 * 0x68db9) >> 0x20) * -10000 + iVar138;
                uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                uVar151 = (ulong)((ulong)pcVar119 >> 0xd < 0x48c27395);
                *(undefined2 *)pbVar155 =
                     *(undefined2 *)
                      (digit_table + uVar151 + ((ulong)(lVar135 * 0x68db9) >> 0x20) * 2);
                *(undefined2 *)(pbVar155 + (2 - uVar151)) =
                     *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                *(undefined2 *)(pbVar155 + (4 - uVar151)) =
                     *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                pbVar155 = pbVar155 + (6 - uVar151);
              }
              else {
                uVar142 = (uint)((ulong)(lVar135 * 0x68db8bb) >> 0x20);
                uVar132 = uVar142 >> 8;
                iVar138 = uVar132 * -10000 + iVar138;
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                uVar151 = (ulong)(pcVar119 < (char *)0x38d7ea4c68000);
                *(undefined2 *)pbVar155 =
                     *(undefined2 *)(digit_table + uVar151 + (ulong)uVar132 * 2);
                *(undefined2 *)(pbVar155 + (2 - uVar151)) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                *(undefined2 *)(pbVar155 + (4 - uVar151)) =
                     *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                *(undefined2 *)(pbVar155 + (6 - uVar151)) =
                     *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                pbVar155 = pbVar155 + (8 - uVar151);
              }
            }
            else {
              *(undefined2 *)pbVar155 =
                   *(undefined2 *)
                    (digit_table + (ulong)(pcVar119 < (char *)0x3b9aca00) + lVar135 * 2);
              pbVar155 = pbVar155 + (2 - (ulong)(pcVar119 < (char *)0x3b9aca00));
            }
            uVar142 = (uint)(((ulong)pcVar111 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar132 = uVar142 >> 8;
            iVar138 = uVar132 * -10000 + (int)pcVar111;
            uVar132 = uVar132 * 0x147b >> 0x13;
            uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
            iVar138 = uVar139 * 0x7fffff9c + iVar138;
            *(undefined2 *)pbVar155 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
            *(undefined2 *)(pbVar155 + 2) =
                 *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
            uVar113 = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
          }
          *(undefined2 *)(pbVar155 + 4) = uVar113;
          *(undefined2 *)(pbVar155 + 6) = *(undefined2 *)(digit_table + (uint)(iVar138 * 2));
          puVar127 = (uint *)(pbVar155 + 8);
        }
        else {
          uVar151 = (ulong)pcVar111 & 0xfffffffffffff;
          uVar142 = uVar142 >> 0x14 & 0x7ff;
          if (uVar142 == 0x7ff) {
            if ((flg & 0x10) != 0) {
              *puVar152 = 0x6c6c756e;
              puVar127 = puVar152 + 1;
              goto LAB_01f52f80;
            }
            if ((flg & 8) != 0) {
              if (uVar151 == 0) {
                *(byte *)puVar152 = 0x2d;
                lVar135 = -((long)pcVar111 >> 0x3f);
                *(undefined8 *)((long)puVar152 + lVar135) = 0x7974696e69666e49;
                puVar127 = (uint *)((long)puVar152 + lVar135 + 8);
              }
              else {
                *puVar152 = 0x4e614e;
                puVar127 = (uint *)((long)puVar152 + 3);
              }
              goto LAB_01f52f80;
            }
            (*p_Var6)(pvVar7,puVar152);
            if (dat_len != (usize *)0x0) {
              *dat_len = 0;
            }
            pyVar120 = &dummy_err;
            if (err != (yyjson_write_err *)0x0) {
              pyVar120 = err;
            }
            pyVar106->code = 4;
            pcVar111 = "nan or inf number is not allowed";
            goto LAB_01f52fe5;
          }
          *(byte *)puVar152 = 0x2d;
          lVar135 = -((long)pcVar111 >> 0x3f);
          puVar160 = (undefined8 *)((long)puVar152 + lVar135);
          if (((ulong)pcVar111 & 0x7fffffffffffffff) == 0) {
            *(undefined4 *)puVar160 = 0x302e30;
            puVar127 = (uint *)((long)puVar160 + 3);
            goto LAB_01f52f80;
          }
          if (uVar142 == 0) {
            uVar110 = (ulong)((uint)pcVar111 & 1);
            uVar151 = uVar151 * 0x20;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = uVar151 - 0x10;
            auVar101._8_8_ = 0;
            auVar101._0_8_ = SUB168(auVar62 * ZEXT816(0x6c07a2c26a8346d2),8);
            auVar63._8_8_ = 0;
            auVar63._0_8_ = uVar151 - 0x10;
            auVar101 = auVar63 * ZEXT816(0x9e19db92b4e31ba9) + auVar101;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = uVar151;
            auVar102._8_8_ = 0;
            auVar102._0_8_ = SUB168(auVar64 * ZEXT816(0x6c07a2c26a8346d2),8);
            auVar65._8_8_ = 0;
            auVar65._0_8_ = uVar151;
            auVar102 = auVar65 * ZEXT816(0x9e19db92b4e31ba9) + auVar102;
            uVar153 = auVar102._8_8_;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = uVar151 + 0x10;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = SUB168(auVar66 * ZEXT816(0x6c07a2c26a8346d2),8);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar151 + 0x10;
            auVar103 = auVar67 * ZEXT816(0x9e19db92b4e31ba9) + auVar103;
            uVar151 = ((ulong)((auVar101 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0) | auVar101._8_8_) + uVar110;
            uVar110 = ((ulong)((auVar103 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0) | auVar103._8_8_) - uVar110;
            if (uVar153 < 0x28) {
LAB_01f54b82:
              uVar109 = (auVar102 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                        uVar153;
              uVar122 = uVar153 & 0x7ffffffffffffffc;
              bVar162 = true;
              if (uVar109 <= (uVar122 | 2)) {
                bVar162 = (bool)((byte)((uVar153 & 0xffffffff) >> 2) & 0x3f &
                                uVar109 == (uVar122 | 2));
              }
              uVar109 = uVar153 >> 2;
              bVar161 = uVar122 + 4 <= uVar110;
              if (uVar122 < uVar151 == bVar161) {
                bVar162 = bVar161;
              }
              iVar138 = -0x144;
            }
            else {
              uVar109 = uVar153 / 0x28;
              bVar162 = uVar109 * 0x28 + 0x28 <= uVar110;
              if (uVar109 * 0x28 < uVar151 != bVar162) goto LAB_01f54b82;
              iVar138 = -0x143;
            }
            pcVar119 = (char *)(bVar162 + uVar109);
            pcVar111 = (char *)((long)puVar160 + 1);
            if (pcVar119 < (char *)0x38d7ea4c68000) {
              if (pcVar119 < (char *)0x5f5e100) {
                if (pcVar119 < (char *)0x64) {
                  *(undefined2 *)pcVar111 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar119 < (char *)0xa) + (long)pcVar119 * 2);
                  pcVar111 = pcVar111 + (2 - (ulong)(pcVar119 < (char *)0xa));
                }
                else {
                  iVar136 = (int)pcVar119;
                  if (pcVar119 < (char *)0x2710) {
                    uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                    uVar151 = (ulong)(pcVar119 < (char *)0x3e8);
                    *(undefined2 *)pcVar111 =
                         *(undefined2 *)(digit_table + uVar151 + (ulong)uVar142 * 2);
                    *(undefined2 *)(pcVar111 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                    pcVar111 = pcVar111 + (4 - uVar151);
                  }
                  else {
                    if ((char *)0xf423f < pcVar119) {
                      uVar142 = (uint)((ulong)((long)pcVar119 * 0x68db8bb) >> 0x20);
                      uVar132 = uVar142 >> 8;
                      iVar136 = uVar132 * -10000 + iVar136;
                      uVar132 = uVar132 * 0x147b >> 0x13;
                      uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
                      iVar136 = uVar139 * -100 + iVar136;
                      *(undefined2 *)pcVar111 =
                           *(undefined2 *)
                            (digit_table +
                            (ulong)(pcVar119 <
                                   "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                   ) + (ulong)uVar132 * 2);
                      pcVar111 = pcVar111 +
                                 -(ulong)(pcVar119 <
                                         "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                         );
                      *(undefined2 *)(pcVar111 + 2) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                      uVar113 = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                      goto LAB_01f550bf;
                    }
                    iVar136 = (int)((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * -10000 + iVar136;
                    uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                    uVar151 = (ulong)(pcVar119 < (char *)0x186a0);
                    *(undefined2 *)pcVar111 =
                         *(undefined2 *)
                          (digit_table + uVar151 + ((ulong)((long)pcVar119 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pcVar111 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pcVar111 + (4 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                    pcVar111 = pcVar111 + (6 - uVar151);
                  }
                }
              }
              else {
                auVar31._8_8_ = 0;
                auVar31._0_8_ = pcVar119;
                lVar135 = SUB168(auVar31 / ZEXT816(100000000),0);
                if ("ueIfIT_Lb1EE25templated_unique_single_tEDpOT0_" <
                    (char *)((ulong)pcVar119 >> 10)) {
                  iVar136 = SUB164(auVar31 / ZEXT816(100000000),0);
                  if ((ulong)pcVar119 >> 0xc < 0xe8d4a51) {
                    uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                    uVar151 = (ulong)((ulong)pcVar119 >> 0xb < 0x2e90edd);
                    *(undefined2 *)pcVar111 =
                         *(undefined2 *)(digit_table + uVar151 + (ulong)uVar142 * 2);
                    *(undefined2 *)(pcVar111 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                    pcVar111 = pcVar111 + (4 - uVar151);
                  }
                  else if (pcVar119 < (char *)0x5af3107a4000) {
                    iVar136 = (int)((ulong)(lVar135 * 0x68db9) >> 0x20) * -10000 + iVar136;
                    uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                    uVar151 = (ulong)((ulong)pcVar119 >> 0xd < 0x48c27395);
                    *(undefined2 *)pcVar111 =
                         *(undefined2 *)
                          (digit_table + uVar151 + ((ulong)(lVar135 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pcVar111 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pcVar111 + (4 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar136) * 2);
                    pcVar111 = pcVar111 + (6 - uVar151);
                  }
                  else {
                    uVar142 = (uint)((ulong)(lVar135 * 0x68db8bb) >> 0x20);
                    uVar132 = uVar142 >> 8;
                    iVar136 = uVar132 * -10000 + iVar136;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar160 + 1) =
                         *(undefined2 *)(digit_table + (ulong)uVar132 * 2 + 1);
                    *(undefined2 *)((long)puVar160 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)((long)puVar160 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)((long)puVar160 + 6) =
                         *(undefined2 *)(digit_table + (uVar139 * -100 + iVar136) * 2);
                    pcVar111 = (char *)(puVar160 + 1);
                  }
                }
                else {
                  *(undefined2 *)pcVar111 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar119 < (char *)0x3b9aca00) + lVar135 * 2);
                  pcVar111 = pcVar111 + (2 - (ulong)(pcVar119 < (char *)0x3b9aca00));
                }
                uVar142 = (uint)(((ulong)(pcVar119 + lVar135 * 0xfa0a1f00) & 0xffffffff) * 0x68db8bb
                                >> 0x20);
                uVar132 = uVar142 >> 8;
                iVar136 = uVar132 * -10000 + (int)(pcVar119 + lVar135 * 0xfa0a1f00);
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
                iVar136 = uVar139 * 0x7fffff9c + iVar136;
                *(undefined2 *)pcVar111 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                *(undefined2 *)(pcVar111 + 2) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                uVar113 = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
LAB_01f550bf:
                *(undefined2 *)(pcVar111 + 4) = uVar113;
                *(undefined2 *)(pcVar111 + 6) = *(undefined2 *)(digit_table + (uint)(iVar136 * 2));
                pcVar111 = pcVar111 + 8;
              }
            }
            else {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = pcVar119;
              uVar151 = SUB168(auVar30 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                        (ulong)pcVar119 / 100000000;
              *pcVar111 = SUB161(auVar30 / ZEXT816(10000000000000000),0) + '0';
              pcVar111 = pcVar111 + ((char *)0x2386f26fc0ffff < pcVar119);
              uVar142 = (uint)((uVar151 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar132 = uVar142 >> 8;
              iVar136 = uVar132 * -10000 + (int)uVar151;
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
              *(undefined2 *)pcVar111 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
              *(undefined2 *)(pcVar111 + 2) =
                   *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
              *(undefined2 *)(pcVar111 + 4) = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
              *(undefined2 *)(pcVar111 + 6) =
                   *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar136) * 2);
              uVar142 = (uint)(((ulong)(pcVar119 + ((ulong)pcVar119 / 100000000) * 0xfa0a1f00) &
                               0xffffffff) * 0x68db8bb >> 0x20);
              uVar132 = uVar142 >> 8;
              iVar136 = uVar132 * -10000 +
                        (int)(pcVar119 + ((ulong)pcVar119 / 100000000) * 0xfa0a1f00);
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar139 = (uint)(iVar136 * 0x147b) >> 0x13;
              *(undefined2 *)(pcVar111 + 8) = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
              *(undefined2 *)(pcVar111 + 10) =
                   *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
              *(undefined2 *)(pcVar111 + 0xc) = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
              *(undefined2 *)(pcVar111 + 0xe) =
                   *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar136) * 2);
              pcVar111 = pcVar111 + 0x10;
            }
            *(undefined1 *)puVar160 = *(undefined1 *)((long)puVar160 + 1);
            *(undefined1 *)((long)puVar160 + 1) = 0x2e;
            lVar135 = 0;
            do {
              lVar128 = lVar135 + -1;
              lVar135 = lVar135 + -1;
            } while (pcVar111[lVar128] == '0');
            iVar138 = ((int)pcVar111 - (int)puVar160) + iVar138 + -2;
            pcVar111 = pcVar111 + lVar135 + (ulong)(pcVar111[lVar128] != '.');
            puVar127 = (uint *)(pcVar111 + 5);
            pcVar111[0] = 'e';
            pcVar111[1] = '-';
            uVar142 = iVar138 * -0x290;
            pcVar111[2] = (char)(uVar142 >> 0x10) + '0';
            *(undefined2 *)(pcVar111 + 3) =
                 *(undefined2 *)(digit_table + ((uVar142 >> 0x10) * 0x7fffff9c - iVar138) * 2);
            goto LAB_01f52f80;
          }
          uVar110 = uVar151 + 0x10000000000000;
          if (uVar142 - 0x3ff < 0x35) {
            lVar128 = 0;
            if (uVar110 != 0) {
              for (; (uVar110 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
              }
            }
            if (0x433 - uVar142 <= (uint)lVar128) {
              pcVar111 = (char *)(uVar110 >> ((byte)(0x433 - uVar142) & 0x3f));
              if (pcVar111 < (char *)0x5f5e100) {
                if (pcVar111 < (char *)0x64) {
                  *(undefined2 *)puVar160 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar111 < (char *)0xa) + (long)pcVar111 * 2);
                  pbVar155 = (byte *)((long)puVar160 + (2 - (ulong)(pcVar111 < (char *)0xa)));
                }
                else {
                  iVar138 = (int)pcVar111;
                  if (pcVar111 < (char *)0x2710) {
                    uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar151 = (ulong)(pcVar111 < (char *)0x3e8);
                    *(undefined2 *)puVar160 =
                         *(undefined2 *)(digit_table + uVar151 + (ulong)uVar142 * 2);
                    *(undefined2 *)((long)puVar160 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                    pbVar155 = (byte *)((long)puVar160 + (4 - uVar151));
                  }
                  else if (pcVar111 < (char *)0xf4240) {
                    iVar138 = (int)((ulong)((long)pcVar111 * 0x68db9) >> 0x20) * -10000 + iVar138;
                    uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar151 = (ulong)(pcVar111 < (char *)0x186a0);
                    *(undefined2 *)puVar160 =
                         *(undefined2 *)
                          (digit_table + uVar151 + ((ulong)((long)pcVar111 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)((long)puVar160 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)((long)puVar160 + (4 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                    pbVar155 = (byte *)((long)puVar160 + (6 - uVar151));
                  }
                  else {
                    uVar142 = (uint)((ulong)((long)pcVar111 * 0x68db8bb) >> 0x20);
                    uVar132 = uVar142 >> 8;
                    iVar138 = uVar132 * -10000 + iVar138;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar151 = (ulong)(pcVar111 <
                                     "shENSE_20_Prime_rehash_policyENSE_17_Hashtable_traitsILb1ELb0ELb1EEEE19_M_find_before_nodeEmRS7_m"
                                     );
                    *(undefined2 *)puVar160 =
                         *(undefined2 *)(digit_table + uVar151 + (ulong)uVar132 * 2);
                    *(undefined2 *)((long)puVar160 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)((long)puVar160 + (4 - uVar151)) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)((long)puVar160 + (6 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                    pbVar155 = (byte *)((long)puVar160 + (8 - uVar151));
                  }
                }
              }
              else {
                auVar29._8_8_ = 0;
                auVar29._0_8_ = pcVar111;
                lVar135 = SUB168(auVar29 / ZEXT816(100000000),0);
                if ("ueIfIT_Lb1EE25templated_unique_single_tEDpOT0_" <
                    (char *)((ulong)pcVar111 >> 10)) {
                  iVar138 = SUB164(auVar29 / ZEXT816(100000000),0);
                  if ((ulong)pcVar111 >> 0xc < 0xe8d4a51) {
                    uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar151 = (ulong)((ulong)pcVar111 >> 0xb < 0x2e90edd);
                    *(undefined2 *)puVar160 =
                         *(undefined2 *)(digit_table + uVar151 + (ulong)uVar142 * 2);
                    *(undefined2 *)((long)puVar160 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                    puVar140 = (undefined2 *)((long)puVar160 + (4 - uVar151));
                  }
                  else if (pcVar111 < (char *)0x5af3107a4000) {
                    iVar138 = (int)((ulong)(lVar135 * 0x68db9) >> 0x20) * -10000 + iVar138;
                    uVar142 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar151 = (ulong)((ulong)pcVar111 >> 0xd < 0x48c27395);
                    *(undefined2 *)puVar160 =
                         *(undefined2 *)
                          (digit_table + uVar151 + ((ulong)(lVar135 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)((long)puVar160 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)((long)puVar160 + (4 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar142 * -100 + iVar138) * 2);
                    puVar140 = (undefined2 *)((long)puVar160 + (6 - uVar151));
                  }
                  else {
                    uVar142 = (uint)((ulong)(lVar135 * 0x68db8bb) >> 0x20);
                    uVar132 = uVar142 >> 8;
                    iVar138 = uVar132 * -10000 + iVar138;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                    uVar151 = (ulong)(pcVar111 < (char *)0x38d7ea4c68000);
                    *(undefined2 *)puVar160 =
                         *(undefined2 *)(digit_table + uVar151 + (ulong)uVar132 * 2);
                    *(undefined2 *)((long)puVar160 + (2 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                    *(undefined2 *)((long)puVar160 + (4 - uVar151)) =
                         *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                    *(undefined2 *)((long)puVar160 + (6 - uVar151)) =
                         *(undefined2 *)(digit_table + (uVar139 * -100 + iVar138) * 2);
                    puVar140 = (undefined2 *)((long)puVar160 + (8 - uVar151));
                  }
                }
                else {
                  *(undefined2 *)puVar160 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar111 < (char *)0x3b9aca00) + lVar135 * 2);
                  puVar140 = (undefined2 *)
                             ((long)puVar160 + (2 - (ulong)(pcVar111 < (char *)0x3b9aca00)));
                }
                uVar142 = (uint)(((ulong)(pcVar111 + lVar135 * 0xfa0a1f00) & 0xffffffff) * 0x68db8bb
                                >> 0x20);
                uVar132 = uVar142 >> 8;
                iVar138 = uVar132 * -10000 + (int)(pcVar111 + lVar135 * 0xfa0a1f00);
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar139 = (uint)(iVar138 * 0x147b) >> 0x13;
                *puVar140 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                puVar140[1] = *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar142 >> 8)) * 2);
                puVar140[2] = *(undefined2 *)(digit_table + (ulong)uVar139 * 2);
                puVar140[3] = *(undefined2 *)(digit_table + (uVar139 * 0x7fffff9c + iVar138) * 2);
                pbVar155 = (byte *)(puVar140 + 4);
              }
              pbVar155[0] = 0x2e;
              pbVar155[1] = 0x30;
              goto LAB_01f54a2e;
            }
          }
          uVar153 = (ulong)((uint)pcVar111 & 1);
          iVar138 = uVar142 * 0x4d105 + -0x200a5;
          if (uVar142 == 1 || uVar151 != 0) {
            iVar138 = uVar142 * 0x4d105;
          }
          iVar138 = iVar138 + -0x1439b7ff >> 0x14;
          uVar109 = *(ulong *)(pow10_sig_table + (ulong)(iVar138 * -2 + 0x2ae) * 8);
          uVar122 = *(long *)(pow10_sig_table + (ulong)(iVar138 * -2 + 0x2af) * 8) +
                    (ulong)(iVar138 - 1U < 0xffffffc8);
          bVar154 = ((char)((uint)(iVar138 * -0x3526b) >> 0x10) + (char)uVar142) - 0x32;
          uVar151 = (ulong)(uVar142 != 1 && uVar151 == 0) + uVar110 * 4 + -2 << (bVar154 & 0x3f);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uVar122;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar151;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = SUB168(auVar56 * auVar80,8);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = uVar109;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar151;
          auVar98 = auVar57 * auVar81 + auVar98;
          uVar151 = uVar110 * 4 << (bVar154 & 0x3f);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar122;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar151;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = SUB168(auVar58 * auVar82,8);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar109;
          auVar83._8_8_ = 0;
          auVar83._0_8_ = uVar151;
          auVar99 = auVar59 * auVar83 + auVar99;
          uVar151 = auVar99._8_8_;
          uVar110 = uVar110 * 4 + 2 << (bVar154 & 0x3f);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uVar122;
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar110;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = SUB168(auVar60 * auVar84,8);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar109;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar110;
          auVar100 = auVar61 * auVar85 + auVar100;
          uVar110 = ((ulong)((auVar98 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar98._8_8_) + uVar153;
          uVar153 = ((ulong)((auVar100 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar100._8_8_) - uVar153;
          if (uVar151 < 0x28) {
LAB_01f5320c:
            uVar122 = (auVar99 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                      uVar151;
            uVar109 = uVar151 & 0xfffffffffffffffc;
            bVar162 = true;
            if (uVar122 <= uVar109 + 2) {
              bVar162 = (bool)((byte)(uVar151 >> 2) & 0x3f & uVar122 == uVar109 + 2);
            }
            bVar161 = uVar109 + 4 <= uVar153;
            if (uVar109 < uVar110 == bVar161) {
              bVar162 = bVar161;
            }
            uVar151 = (uVar151 >> 2) + (ulong)bVar162;
          }
          else {
            uVar122 = (uVar151 / 0x28) * 0x28;
            uVar109 = uVar122 + 0x28;
            if (uVar122 < uVar110 != uVar109 <= uVar153) goto LAB_01f5320c;
            uVar151 = (uVar151 / 0x28 + 1) - (ulong)(uVar153 < uVar109);
            iVar138 = iVar138 + 1;
          }
          iVar149 = (0x11 - (uint)(uVar151 < 10000000000000000)) -
                    (uint)(uVar151 < 1000000000000000);
          uVar139 = iVar149 + iVar138;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar151;
          uVar110 = SUB168(auVar28 / ZEXT816(100000000),0);
          uVar151 = uVar110 * 0xfa0a1f00 + uVar151;
          uVar110 = (uVar110 & 0xffffffff) / 10000;
          iVar136 = (int)uVar110;
          uVar132 = SUB164(auVar28 / ZEXT816(100000000),0);
          iVar121 = iVar136 * -10000 + uVar132;
          iVar147 = (int)(uVar110 * 0x28f5d >> 0x18);
          uVar142 = (uint)(iVar147 * 0x29) >> 0xc;
          uVar156 = uVar142 * -100 + iVar147;
          uVar148 = iVar147 * -100 + iVar136;
          cVar130 = (char)uVar142 + '0';
          iVar136 = (int)uVar151;
          if (iVar149 + iVar138 + 5U < 0x1b) {
            if ((int)uVar139 < 1) {
              puVar140 = (undefined2 *)
                         ((long)puVar160 +
                         (((ulong)(2 - uVar139) + 1) - (ulong)(uVar132 < 100000000)));
              *(char *)((long)puVar160 + (ulong)(2 - uVar139)) = cVar130;
              uVar110 = (ulong)(uVar156 < 10 && uVar132 < 100000000);
              *puVar140 = *(undefined2 *)(digit_table + uVar110 + uVar156 * 2);
              *(undefined2 *)((long)puVar140 + (2 - uVar110)) =
                   *(undefined2 *)(digit_table + uVar148 * 2);
              if (iVar136 == 0) {
                if (iVar121 == 0) {
                  uVar151 = 0;
                  if (uVar148 == 0) {
                    uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar156];
                  }
                  uVar151 = 4 - (uVar151 + (byte)dec_trailing_zero_table[uVar148]);
                }
                else {
                  uVar142 = (uint)(iVar121 * 0x147b) >> 0x13;
                  uVar132 = uVar142 * -100 + iVar121;
                  *(undefined2 *)((long)puVar140 + (4 - uVar110)) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  *(undefined2 *)((long)puVar140 + (6 - uVar110)) =
                       *(undefined2 *)(digit_table + uVar132 * 2);
                  uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar142] + 2;
                  if (uVar132 != 0) {
                    uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                  }
                  uVar151 = 8 - uVar151;
                }
              }
              else {
                uVar148 = (uint)(iVar121 * 0x147b) >> 0x13;
                uVar142 = (uint)((uVar151 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar156 = uVar142 >> 8;
                uVar132 = uVar156 * 0x147b >> 0x13;
                uVar151 = (ulong)uVar132;
                uVar142 = uVar132 * -100 + (uVar142 >> 8);
                *(undefined2 *)((long)puVar140 + (4 - uVar110)) =
                     *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
                *(undefined2 *)((long)puVar140 + (6 - uVar110)) =
                     *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar121) * 2);
                *(undefined2 *)((long)puVar140 + (8 - uVar110)) =
                     *(undefined2 *)(digit_table + uVar151 * 2);
                *(undefined2 *)((long)puVar140 + (10 - uVar110)) =
                     *(undefined2 *)(digit_table + uVar142 * 2);
                iVar136 = uVar156 * -10000 + iVar136;
                if (iVar136 == 0) {
                  lStack_120 = 0xc;
                }
                else {
                  uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                  uVar151 = (ulong)uVar142;
                  uVar142 = uVar142 * -100 + iVar136;
                  *(undefined2 *)((long)puVar140 + (0xc - uVar110)) =
                       *(undefined2 *)(digit_table + uVar151 * 2);
                  *(undefined2 *)((long)puVar140 + (0xe - uVar110)) =
                       *(undefined2 *)(digit_table + uVar142 * 2);
                  lStack_120 = 0x10;
                }
                uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar151] + 2;
                if (uVar142 != 0) {
                  uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar142];
                }
                uVar151 = lStack_120 - uVar151;
              }
              *(undefined2 *)puVar160 = 0x2e30;
              for (uVar153 = 0;
                  puVar127 = (uint *)((long)puVar140 + ((uVar151 & 0xffffffff) - uVar110)),
                  -uVar139 != uVar153; uVar153 = uVar153 + 1) {
                *(undefined1 *)((long)puVar160 + uVar153 + 2) = 0x30;
              }
            }
            else {
              puVar140 = (undefined2 *)((long)puVar160 + (2 - (ulong)(uVar132 < 100000000)));
              *puVar160 = 0x3030303030303030;
              puVar160[1] = 0x3030303030303030;
              puVar160[2] = 0x3030303030303030;
              *(char *)((long)puVar160 + 1) = cVar130;
              uVar110 = (ulong)(uVar156 < 10 && uVar132 < 100000000);
              *puVar140 = *(undefined2 *)(digit_table + uVar110 + uVar156 * 2);
              *(undefined2 *)((long)puVar140 + (2 - uVar110)) =
                   *(undefined2 *)(digit_table + uVar148 * 2);
              if (iVar136 == 0) {
                if (iVar121 == 0) {
                  uVar151 = 0;
                  if (uVar148 == 0) {
                    uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar156];
                  }
                  uVar151 = 4 - (uVar151 + (byte)dec_trailing_zero_table[uVar148]);
                }
                else {
                  uVar142 = (uint)(iVar121 * 0x147b) >> 0x13;
                  uVar132 = uVar142 * -100 + iVar121;
                  *(undefined2 *)((long)puVar140 + (4 - uVar110)) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  *(undefined2 *)((long)puVar140 + (6 - uVar110)) =
                       *(undefined2 *)(digit_table + uVar132 * 2);
                  uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar142] + 2;
                  if (uVar132 != 0) {
                    uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                  }
                  uVar151 = 8 - uVar151;
                }
              }
              else {
                uVar148 = (uint)(iVar121 * 0x147b) >> 0x13;
                uVar142 = (uint)((uVar151 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar156 = uVar142 >> 8;
                uVar132 = uVar156 * 0x147b >> 0x13;
                uVar151 = (ulong)uVar132;
                uVar142 = uVar132 * -100 + (uVar142 >> 8);
                *(undefined2 *)((long)puVar140 + (4 - uVar110)) =
                     *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
                *(undefined2 *)((long)puVar140 + (6 - uVar110)) =
                     *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar121) * 2);
                *(undefined2 *)((long)puVar140 + (8 - uVar110)) =
                     *(undefined2 *)(digit_table + uVar151 * 2);
                *(undefined2 *)((long)puVar140 + (10 - uVar110)) =
                     *(undefined2 *)(digit_table + uVar142 * 2);
                iVar136 = uVar156 * -10000 + iVar136;
                if (iVar136 == 0) {
                  lStack_120 = 0xc;
                }
                else {
                  uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
                  uVar151 = (ulong)uVar142;
                  uVar142 = uVar142 * -100 + iVar136;
                  *(undefined2 *)((long)puVar140 + (0xc - uVar110)) =
                       *(undefined2 *)(digit_table + uVar151 * 2);
                  *(undefined2 *)((long)puVar140 + (0xe - uVar110)) =
                       *(undefined2 *)(digit_table + uVar142 * 2);
                  lStack_120 = 0x10;
                }
                uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar151] + 2;
                if (uVar142 != 0) {
                  uVar151 = (ulong)(byte)dec_trailing_zero_table[uVar142];
                }
                uVar151 = lStack_120 - uVar151;
              }
              puVar123 = (uint *)((long)puVar140 + ((uVar151 & 0xffffffff) - uVar110));
              for (uVar151 = 0; uVar139 != uVar151; uVar151 = uVar151 + 1) {
                *(byte *)((long)puVar152 + uVar151 + lVar135) =
                     *(byte *)((long)puVar152 + uVar151 + lVar135 + 1);
              }
              puVar158 = (undefined1 *)((long)puVar160 + (ulong)uVar139);
              puVar127 = (uint *)(puVar158 + 2);
              *puVar158 = 0x2e;
              if (puVar127 < puVar123) {
                puVar127 = puVar123;
              }
            }
            goto LAB_01f52f80;
          }
          lVar135 = 2 - (ulong)(uVar132 < 100000000);
          *(char *)((long)puVar160 + 1) = cVar130;
          uVar110 = (ulong)(uVar156 < 10 && uVar132 < 100000000);
          *(undefined2 *)((long)puVar160 + lVar135) =
               *(undefined2 *)(digit_table + uVar110 + uVar156 * 2);
          lVar135 = lVar135 - uVar110;
          *(undefined2 *)((long)puVar160 + lVar135 + 2) = *(undefined2 *)(digit_table + uVar148 * 2)
          ;
          if (iVar136 == 0) {
            if (iVar121 != 0) {
              uVar142 = (uint)(iVar121 * 0x147b) >> 0x13;
              uVar132 = uVar142 * -100 + iVar121;
              *(undefined2 *)((long)puVar160 + lVar135 + 4) =
                   *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
              *(undefined2 *)((long)puVar160 + lVar135 + 6) =
                   *(undefined2 *)(digit_table + uVar132 * 2);
              uVar142 = (byte)dec_trailing_zero_table[uVar142] + 2;
              if (uVar132 != 0) {
                uVar142 = (uint)(byte)dec_trailing_zero_table[uVar132];
              }
              iVar138 = 8;
              goto LAB_01f5424c;
            }
            uVar142 = 0;
            if (uVar148 == 0) {
              uVar142 = (uint)(byte)dec_trailing_zero_table[uVar156];
            }
            uVar142 = uVar142 + (byte)dec_trailing_zero_table[uVar148];
            iVar138 = 4;
LAB_01f54562:
            uVar142 = iVar138 - uVar142;
          }
          else {
            uVar156 = (uint)(iVar121 * 0x147b) >> 0x13;
            uVar142 = (uint)((uVar151 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar157 = uVar142 >> 8;
            uVar148 = uVar157 * 0x147b >> 0x13;
            uVar132 = uVar148 * -100 + (uVar142 >> 8);
            *(undefined2 *)((long)puVar160 + lVar135 + 4) =
                 *(undefined2 *)(digit_table + (ulong)uVar156 * 2);
            *(undefined2 *)((long)puVar160 + lVar135 + 6) =
                 *(undefined2 *)(digit_table + (uVar156 * 0x7fffff9c + iVar121) * 2);
            *(undefined2 *)((long)puVar160 + lVar135 + 8) =
                 *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
            *(undefined2 *)((long)puVar160 + lVar135 + 10) =
                 *(undefined2 *)(digit_table + uVar132 * 2);
            iVar136 = uVar157 * -10000 + iVar136;
            if (iVar136 == 0) {
              uVar142 = (byte)dec_trailing_zero_table[uVar148] + 2;
              if (uVar132 != 0) {
                uVar142 = (uint)(byte)dec_trailing_zero_table[uVar132];
              }
              iVar138 = 0xc;
              goto LAB_01f54562;
            }
            uVar142 = (uint)(iVar136 * 0x147b) >> 0x13;
            uVar132 = uVar142 * -100 + iVar136;
            *(undefined2 *)((long)puVar160 + lVar135 + 0xc) =
                 *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
            *(undefined2 *)((long)puVar160 + lVar135 + 0xe) =
                 *(undefined2 *)(digit_table + uVar132 * 2);
            uVar142 = (byte)dec_trailing_zero_table[uVar142] + 2;
            if (uVar132 != 0) {
              uVar142 = (uint)(byte)dec_trailing_zero_table[uVar132];
            }
            iVar138 = 0x10;
LAB_01f5424c:
            uVar142 = iVar138 - uVar142;
          }
          puVar140 = (undefined2 *)
                     ((long)puVar160 +
                     (((ulong)uVar142 + lVar135) - (ulong)((ulong)uVar142 + lVar135 == 2)));
          uVar139 = uVar139 - 1;
          *(undefined1 *)puVar160 = *(undefined1 *)((long)puVar160 + 1);
          *(undefined1 *)((long)puVar160 + 1) = 0x2e;
          *puVar140 = 0x2d65;
          uVar132 = uVar139 >> 0x1f;
          pcVar111 = (char *)((long)puVar140 + (ulong)uVar132 + 1);
          uVar142 = -uVar139;
          if (0 < (int)uVar139) {
            uVar142 = uVar139;
          }
          if (99 < uVar142) {
            *pcVar111 = (char)(uVar142 * 0x290 >> 0x10) + '0';
            *(undefined2 *)((long)puVar140 + (ulong)uVar132 + 2) =
                 *(undefined2 *)
                  (digit_table + ((uVar142 * 0x290 >> 0x10) * 0x7fffff9c + uVar142) * 2);
            puVar127 = (uint *)((long)puVar140 + (ulong)uVar132 + 4);
            goto LAB_01f52f80;
          }
          *(undefined2 *)pcVar111 =
               *(undefined2 *)(digit_table + (ulong)(uVar142 < 10) + (ulong)uVar142 * 2);
          pbVar155 = (byte *)(pcVar111 + -(ulong)(uVar142 < 10));
LAB_01f54a2e:
          puVar127 = (uint *)(pbVar155 + 2);
        }
LAB_01f52f80:
        if (local_10c < '\0') {
          *(byte *)puVar127 = 10;
          puVar127 = (uint *)((long)puVar127 + 1);
        }
        *(byte *)puVar127 = 0;
        if (dat_len != (usize *)0x0) {
          *dat_len = (long)puVar127 - (long)puVar152;
        }
        *(undefined8 *)pyVar106 = 0;
        pyVar106->msg = (char *)0x0;
        return (char *)puVar152;
      }
      break;
    case 5:
switchD_01f4d08b_caseD_5:
      uVar110 = uVar151 >> 8;
      pbVar155 = (byte *)(val->uni).str;
      puVar152 = (uint *)(*p_Var5)(pvVar7,uVar110 * 6 + 4);
      if (puVar152 != (uint *)0x0) {
        if ((puVar158 != enc_table_cpy) || ((val->tag & 0x18) == 0)) {
          puVar115 = (uint *)(pbVar155 + uVar110);
          *(byte *)puVar152 = 0x22;
          puVar123 = puVar152;
LAB_01f5327d:
          lVar128 = (long)puVar115 - (long)pbVar155;
          lVar135 = 0;
          while( true ) {
            puVar141 = (uint *)(pbVar155 + lVar135);
            puVar127 = (uint *)((long)puVar123 + lVar135 + 1);
            if (lVar128 < 0x10) break;
            bVar154 = (byte)*puVar141;
            if (puVar158[bVar154] != '\0') {
              puVar141 = (uint *)(pbVar155 + lVar135);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 1);
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 1]] != '\0') {
              puVar141 = (uint *)(pbVar155 + lVar135);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 1);
              goto LAB_01f5363f;
            }
            if (puVar158[pbVar155[lVar135 + 2]] != '\0') {
              puVar141 = (uint *)(pbVar155 + lVar135);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 1);
              goto LAB_01f5346b;
            }
            if (puVar158[pbVar155[lVar135 + 3]] != '\0') {
              puVar141 = (uint *)(pbVar155 + lVar135);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 1);
              goto LAB_01f5348d;
            }
            if (puVar158[pbVar155[lVar135 + 4]] != '\0') {
              puVar141 = (uint *)(pbVar155 + lVar135 + 4);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 5);
              *(undefined4 *)((long)puVar123 + lVar135 + 1) = *(undefined4 *)(pbVar155 + lVar135);
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 5]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 5);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 6);
              *(byte *)((long)puVar127 + -1) = pbVar155[4];
              *(undefined4 *)((long)puVar127 + -5) = *(undefined4 *)pbVar155;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 6]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 6);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 7);
              *(ushort *)((long)puVar127 + -2) = *(ushort *)(pbVar155 + 4);
              *(undefined4 *)((long)puVar127 + -6) = *(undefined4 *)pbVar155;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 7]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 7);
              uVar4 = *(undefined4 *)pbVar155;
              puVar127 = (uint *)((long)puVar123 + lVar135 + 8);
              *(undefined4 *)((long)puVar123 + lVar135 + 4) = *(undefined4 *)(pbVar155 + 3);
              *(undefined4 *)((long)puVar123 + lVar135 + 1) = uVar4;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 8]] != '\0') {
              puVar141 = (uint *)(pbVar155 + lVar135 + 8);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 9);
              *(undefined8 *)((long)puVar123 + lVar135 + 1) = *(undefined8 *)(pbVar155 + lVar135);
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 9]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 9);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 10);
              *(byte *)((long)puVar127 + -1) = pbVar155[8];
              *(undefined8 *)((long)puVar127 + -9) = *(undefined8 *)pbVar155;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 10]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 10);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 0xb);
              *(ushort *)((long)puVar127 + -2) = *(ushort *)(pbVar155 + 8);
              *(undefined8 *)((long)puVar127 + -10) = *(undefined8 *)pbVar155;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 0xb]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 0xb);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 0xc);
              puVar127[-1] = *(uint *)(pbVar155 + 7);
              *(undefined8 *)((long)puVar127 + -0xb) = *(undefined8 *)pbVar155;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 0xc]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 0xc);
              puVar127 = (uint *)((long)puVar123 + lVar135 + 0xd);
              puVar127[-1] = *(uint *)(pbVar155 + 8);
              *(undefined8 *)(puVar127 + -3) = *(undefined8 *)pbVar155;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 0xd]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 0xd);
              uVar116 = *(undefined8 *)pbVar155;
              puVar127 = (uint *)((long)puVar123 + lVar135 + 0xe);
              *(undefined8 *)((long)puVar123 + lVar135 + 6) = *(undefined8 *)(pbVar155 + 5);
              *(undefined8 *)((long)puVar123 + lVar135 + 1) = uVar116;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 0xe]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 0xe);
              uVar116 = *(undefined8 *)pbVar155;
              puVar127 = (uint *)((long)puVar123 + lVar135 + 0xf);
              *(undefined8 *)((long)puVar123 + lVar135 + 7) = *(undefined8 *)(pbVar155 + 6);
              *(undefined8 *)((long)puVar123 + lVar135 + 1) = uVar116;
              goto LAB_01f5364b;
            }
            if (puVar158[pbVar155[lVar135 + 0xf]] != '\0') {
              pbVar155 = pbVar155 + lVar135;
              puVar141 = (uint *)(pbVar155 + 0xf);
              uVar116 = *(undefined8 *)pbVar155;
              puVar127 = (uint *)((long)puVar123 + lVar135 + 0x10);
              *(undefined8 *)((long)puVar123 + lVar135 + 8) = *(undefined8 *)(pbVar155 + 7);
              *(undefined8 *)((long)puVar123 + lVar135 + 1) = uVar116;
              goto LAB_01f5364b;
            }
            uVar142 = puVar141[1];
            uVar132 = puVar141[2];
            uVar139 = puVar141[3];
            *puVar127 = *puVar141;
            *(uint *)((long)puVar123 + lVar135 + 5) = uVar142;
            *(uint *)((long)puVar123 + lVar135 + 9) = uVar132;
            *(uint *)((long)puVar123 + lVar135 + 0xd) = uVar139;
            lVar135 = lVar135 + 0x10;
            lVar128 = lVar128 + -0x10;
          }
LAB_01f533d0:
          if (3 < lVar128) {
            if (puVar158[(byte)*puVar141] == '\0') {
              if (puVar158[*(byte *)((long)puVar141 + 1)] == '\0') {
                if (puVar158[*(byte *)((long)puVar141 + 2)] == '\0') {
                  if (puVar158[*(byte *)((long)puVar141 + 3)] == '\0') goto LAB_01f533be;
LAB_01f5348d:
                  *(byte *)((long)puVar127 + 2) = *(byte *)((long)puVar141 + 2);
                  *(ushort *)puVar127 = (ushort)*puVar141;
                  puVar127 = (uint *)((long)puVar127 + 3);
                  puVar141 = (uint *)((long)puVar141 + 3);
                }
                else {
LAB_01f5346b:
                  *(ushort *)puVar127 = (ushort)*puVar141;
                  puVar127 = (uint *)((long)puVar127 + 2);
                  puVar141 = (uint *)((long)puVar141 + 2);
                }
              }
              else {
                bVar154 = (byte)*puVar141;
LAB_01f5363f:
                *(byte *)puVar127 = bVar154;
                puVar127 = (uint *)((long)puVar127 + 1);
                puVar141 = (uint *)((long)puVar141 + 1);
              }
            }
            goto LAB_01f5364b;
          }
          goto LAB_01f53417;
        }
        *(byte *)puVar152 = 0x22;
        puVar127 = (uint *)((long)puVar152 + 2);
        for (uVar153 = uVar110; 0xf < uVar153; uVar153 = uVar153 - 0x10) {
          uVar116 = *(undefined8 *)(pbVar155 + 8);
          *(undefined8 *)((long)puVar127 + -1) = *(undefined8 *)pbVar155;
          *(undefined8 *)((long)puVar127 + 7) = uVar116;
          pbVar155 = pbVar155 + 0x10;
          puVar127 = puVar127 + 4;
        }
        for (uVar110 = uVar110 - (uVar151 >> 8 & 0xfffffffffffffff0); 3 < uVar110;
            uVar110 = uVar110 - 4) {
          *(undefined4 *)((long)puVar127 + -1) = *(undefined4 *)pbVar155;
          pbVar155 = pbVar155 + 4;
          puVar127 = puVar127 + 1;
        }
        for (uVar151 = 0; uVar110 != uVar151; uVar151 = uVar151 + 1) {
          *(byte *)((long)puVar127 + -1) = pbVar155[uVar151];
          puVar127 = (uint *)((long)puVar127 + 1);
        }
        *(byte *)((long)puVar127 + -1) = 0x22;
        goto LAB_01f52f80;
      }
      break;
    case 6:
switchD_01f4d08b_caseD_6:
      puVar152 = (uint *)(*p_Var5)(pvVar7,4);
      if (puVar152 != (uint *)0x0) {
        *(ushort *)puVar152 = 0x5d5b;
LAB_01f52f71:
        puVar127 = (uint *)((long)puVar152 + 2);
        goto LAB_01f52f80;
      }
      break;
    case 7:
switchD_01f4d08b_caseD_7:
      puVar152 = (uint *)(*p_Var5)(pvVar7,4);
      if (puVar152 != (uint *)0x0) {
        *(ushort *)puVar152 = 0x7d7b;
        goto LAB_01f52f71;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar120 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar120 = err;
    }
    pyVar106->code = 2;
    pcVar111 = "memory allocation failed";
  }
  else {
    puVar158 = enc_table_esc_slash;
    if ((flg & 4) == 0) {
      puVar158 = enc_table_esc;
    }
    switch(bVar154 & 7) {
    case 1:
      goto switchD_01f4d08b_caseD_1;
    case 2:
      goto switchD_01f4d08b_caseD_2;
    case 3:
      goto switchD_01f4d08b_caseD_3;
    case 4:
      goto switchD_01f4d08b_caseD_4;
    case 5:
      goto switchD_01f4d08b_caseD_5;
    case 6:
      goto switchD_01f4d08b_caseD_6;
    case 7:
      goto switchD_01f4d08b_caseD_7;
    }
switchD_01f4d08b_caseD_0:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar120 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar120 = err;
    }
    pyVar106->code = 3;
    pcVar111 = "invalid JSON value type";
  }
LAB_01f52fe5:
  pyVar120->msg = pcVar111;
  return (char *)0x0;
code_r0x01f4d8b5:
  *puVar115 = *puVar123;
  puVar115 = puVar115 + 1;
  puVar123 = puVar123 + 1;
  lVar137 = lVar137 + -4;
  goto LAB_01f4d874;
LAB_01f4d8d3:
  if (puVar127 <= puVar123) goto switchD_01f4db32_default;
  uVar139 = *puVar123;
  if (puVar131[(byte)uVar139] != '\0') goto LAB_01f4db04;
  puVar123 = (uint *)((long)puVar123 + 1);
  *(byte *)puVar115 = (byte)uVar139;
  puVar115 = (uint *)((long)puVar115 + 1);
  goto LAB_01f4d8d3;
LAB_01f4db04:
  puVar152 = puVar123 + 1;
  if (puVar127 < puVar152) {
    if (puVar127 != puVar123) {
      uVar139 = (uint)(byte)*puVar123;
      uVar122 = (ulong)(byte)*puVar123;
      bVar154 = puVar131[uVar122];
      if ((long)(ulong)(bVar154 >> 1) <= (long)puVar127 - (long)puVar123) goto LAB_01f4db1d;
switchD_01f4db32_caseD_1:
      if ((flg & 2) != 0) goto LAB_01f4dc30;
      goto LAB_01f4ddbf;
    }
    goto switchD_01f4db32_default;
  }
  uVar139 = (uint)(byte)*puVar123;
  uVar122 = (ulong)(byte)*puVar123;
  bVar154 = puVar131[uVar122];
LAB_01f4db1d:
  switch(bVar154) {
  case 0:
    goto switchD_01f4db32_caseD_0;
  case 1:
    goto switchD_01f4db32_caseD_1;
  case 2:
    *(ushort *)puVar115 = *(ushort *)(esc_single_char_table + uVar122 * 2);
    puVar115 = (uint *)((long)puVar115 + 2);
    puVar123 = (uint *)((long)puVar123 + 1);
    goto LAB_01f4db04;
  case 3:
    *puVar115 = 0x3030755c;
    *(ushort *)(puVar115 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar123 * 2);
    goto LAB_01f4dc46;
  case 4:
    uVar3 = (ushort)*puVar123;
    uVar139 = (uint)uVar3;
    if (((uVar139 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar115 = uVar3;
      puVar115 = (uint *)((long)puVar115 + 2);
      puVar123 = (uint *)((long)puVar123 + 2);
      goto LAB_01f4db04;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar123;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_01f4dc30;
    *(ushort *)puVar115 = 0x755c;
    *(ushort *)((long)puVar115 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar115 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar115 = (uint *)((long)puVar115 + 6);
    puVar123 = (uint *)((long)puVar123 + 2);
    goto LAB_01f4db04;
  case 6:
    if (puVar127 < puVar152) {
      uVar3 = (ushort)*puVar123;
      uVar139 = (uint)uVar3;
      uVar148 = (uint)(uint3)*puVar123;
      if (((uVar148 & 0xc0c0f0) == 0x8080e0) && (uVar156 = uVar3 & 0x200f, (uVar3 & 0x200f) != 0))
      goto LAB_01f4dbe8;
    }
    else {
      uVar148 = *puVar123;
      uVar139 = uVar148;
      if (((uVar148 & 0xc0c0f0) == 0x8080e0) && (uVar156 = uVar148 & 0x200f, uVar156 != 0)) {
LAB_01f4dbe8:
        if (uVar156 != 0x200d) {
          *puVar115 = uVar148;
          puVar115 = (uint *)((long)puVar115 + 3);
          puVar123 = (uint *)((long)puVar123 + 3);
          goto LAB_01f4db04;
        }
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar123;
    bVar154 = *(byte *)((long)puVar123 + 2);
    if ((((*puVar123 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar139 = *puVar123;
      *(ushort *)puVar115 = 0x755c;
      *(ushort *)((long)puVar115 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar139 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar115 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar154 & 0x3f) * 2);
      puVar115 = (uint *)((long)puVar115 + 6);
      puVar123 = (uint *)((long)puVar123 + 3);
    }
    else {
LAB_01f4dc30:
      if ((flg & 0x20) == 0) goto LAB_01f52ba0;
      *(ushort *)puVar115 = 0x755c;
      ((ushort *)((long)puVar115 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar115 + 2))[1] = 0x4446;
LAB_01f4dc46:
      puVar115 = (uint *)((long)puVar115 + 6);
      puVar123 = (uint *)((long)puVar123 + 1);
    }
    goto LAB_01f4db04;
  case 8:
    uVar139 = *puVar123;
    if ((((uVar139 & 0xc0c0c0f8) == 0x808080f0) && ((uVar139 & 0x3007) != 0)) &&
       (((byte)(uVar139 >> 2) & 0x3f & (uVar139 & 0x3003) != 0) == 0)) {
      *puVar115 = uVar139;
      puVar115 = puVar115 + 1;
      puVar123 = puVar152;
      goto LAB_01f4db04;
    }
    break;
  case 9:
    uVar139 = *puVar123;
    if ((((uVar139 & 0xc0c0c0f8) != 0x808080f0) || ((uVar139 & 0x3007) == 0)) ||
       (((byte)uVar139 >> 2 & (uVar139 & 0x3003) != 0) != 0)) goto LAB_01f4dc30;
    iVar138 = (uVar139 & 7) * 0x40000;
    iVar136 = (uVar139 & 0x3f00) * 0x10;
    *(ushort *)puVar115 = 0x755c;
    *(ushort *)((long)puVar115 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar138 + iVar136) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar115 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar139 >> 10 & 0xc00) + iVar138 + iVar136) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar115 + 6) = 0x755c;
    *(ushort *)(puVar115 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar139 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar115 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar139 >> 10 & 0xc0 | uVar139 >> 0x18 & 0x3f) * 2);
    puVar115 = puVar115 + 3;
    puVar123 = puVar152;
    goto LAB_01f4db04;
  default:
    goto switchD_01f4db32_default;
  }
LAB_01f4ddbf:
  if ((flg & 0x20) == 0) goto LAB_01f52ba0;
  *(byte *)puVar115 = (byte)uVar139;
  puVar115 = (uint *)((long)puVar115 + 1);
  puVar123 = (uint *)((long)puVar123 + 1);
  goto LAB_01f4db04;
switchD_01f4db32_caseD_0:
  pbVar155 = (byte *)((long)puVar123 + 1);
  *(byte *)puVar115 = (byte)uVar139;
  puVar152 = puVar115;
  goto LAB_01f4d72e;
  while( true ) {
    uVar110 = *__dest;
    local_e8 = __dest + 1;
    local_48 = uVar110 & 0xffffffffffffff01;
    puVar152 = (uint *)(pbVar114 + 2);
    pbVar114[0] = 0x2c;
    pbVar114[1] = 10;
    lVar143 = (uVar110 >> 1) - 1;
    puVar127 = local_d8;
    lVar134 = lVar135;
    if (lVar143 != 0) break;
LAB_01f4ff57:
    pbVar155 = (byte *)((long)puVar152 + -1);
    *(byte *)((long)puVar152 + -2) = 10;
    local_d8 = puVar127;
    __dest = local_e8;
    if (local_e8 <= (ulong *)(lVar134 * 4 + -1 + (long)puVar152)) {
      uVar110 = (ulong)puVar127 >> 1;
      if ((ulong)puVar127 >> 1 <= (ulong)(lVar134 * 4)) {
        uVar110 = lVar134 * 4;
      }
      local_d8 = (uint *)((uVar110 + 7 & 0xfffffffffffffff8) + (long)puVar127);
      pbVar114 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)puVar127,(size_t)local_d8);
      if (pbVar114 == (byte *)0x0) goto LAB_01f52bff;
      __dest = (ulong *)(pbVar114 + ((long)local_d8 - ((long)local_a8 - (long)local_e8)));
      memmove(__dest,pbVar114 + ((long)local_e8 - (long)local_100),(long)local_a8 - (long)local_e8);
      pbVar155 = pbVar114 + ((long)pbVar155 - (long)local_100);
      local_a8 = (ulong *)(pbVar114 + (long)local_d8);
      local_100 = pbVar114;
    }
    lVar135 = lVar134 + -1;
    pbVar114 = pbVar155 + 1;
    pbVar155 = local_100 + ~(ulong)pbVar155;
    for (lVar143 = 1; lVar134 != lVar143; lVar143 = lVar143 + 1) {
      pbVar114[-1] = 0x20;
      pbVar114[0] = 0x20;
      pbVar114[1] = 0x20;
      pbVar114[2] = 0x20;
      pbVar114 = pbVar114 + lVar128;
      pbVar155 = pbVar155 + -lVar128;
    }
    pbVar114[-1] = (char)local_48 * ' ' + 0x5d;
    if (local_a8 <= __dest) {
      if (local_10c < '\0') {
        if (__dest <= pbVar114 + 2) {
          uVar151 = 2;
          if (2 < (ulong)local_d8 >> 1) {
            uVar151 = (ulong)local_d8 >> 1;
          }
          sVar129 = (uVar151 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar112 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar129);
          if (pbVar112 == (byte *)0x0) goto LAB_01f52bff;
          memmove(pbVar112 + (sVar129 - ((long)local_a8 - (long)__dest)),
                  pbVar112 + ((long)__dest - (long)local_100),(long)local_a8 - (long)__dest);
          pbVar114 = pbVar112 + -(long)pbVar155;
          local_100 = pbVar112;
        }
        *pbVar114 = 10;
        pbVar114 = pbVar114 + 1;
      }
      *pbVar114 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar114 - (long)local_100;
      }
      goto LAB_01f54ef4;
    }
  }
  puVar152 = (uint *)(pbVar114 + 2);
  goto LAB_01f4d195;
code_r0x01f507e2:
  *puVar115 = *puVar123;
  puVar115 = puVar115 + 1;
  puVar123 = puVar123 + 1;
  lVar143 = lVar143 + -4;
  goto LAB_01f507a1;
LAB_01f507fc:
  if (puVar152 <= puVar123) goto switchD_01f50a62_default;
  uVar142 = *puVar123;
  if (puVar158[(byte)uVar142] != '\0') goto LAB_01f50a37;
  puVar123 = (uint *)((long)puVar123 + 1);
  *(byte *)puVar115 = (byte)uVar142;
  puVar115 = (uint *)((long)puVar115 + 1);
  goto LAB_01f507fc;
LAB_01f50a37:
  puVar127 = puVar123 + 1;
  if (puVar152 < puVar127) {
    if (puVar152 != puVar123) {
      bVar154 = (byte)*puVar123;
      uVar110 = (ulong)bVar154;
      bVar2 = puVar158[uVar110];
      if ((long)(ulong)(bVar2 >> 1) <= (long)puVar152 - (long)puVar123) goto LAB_01f50a4d;
switchD_01f50a62_caseD_1:
      if ((flg & 2) != 0) goto LAB_01f50b75;
      goto LAB_01f50d38;
    }
    goto switchD_01f50a62_default;
  }
  bVar154 = (byte)*puVar123;
  uVar110 = (ulong)bVar154;
  bVar2 = puVar158[uVar110];
LAB_01f50a4d:
  switch(bVar2) {
  case 0:
    goto switchD_01f50a62_caseD_0;
  case 1:
    goto switchD_01f50a62_caseD_1;
  case 2:
    *(ushort *)puVar115 = *(ushort *)(esc_single_char_table + uVar110 * 2);
    puVar115 = (uint *)((long)puVar115 + 2);
    puVar123 = (uint *)((long)puVar123 + 1);
    goto LAB_01f50a37;
  case 3:
    *puVar115 = 0x3030755c;
    *(ushort *)(puVar115 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar123 * 2);
    goto LAB_01f50b8d;
  case 4:
    uVar3 = (ushort)*puVar123;
    bVar154 = (byte)uVar3;
    if (((uVar3 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar115 = uVar3;
      puVar115 = (uint *)((long)puVar115 + 2);
      puVar123 = (uint *)((long)puVar123 + 2);
      goto LAB_01f50a37;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar123;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_01f50b75;
    *(ushort *)puVar115 = 0x755c;
    *(ushort *)((long)puVar115 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar115 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar115 = (uint *)((long)puVar115 + 6);
    puVar123 = (uint *)((long)puVar123 + 2);
    goto LAB_01f50a37;
  case 6:
    if (puVar152 < puVar127) {
      uVar3 = (ushort)*puVar123;
      bVar154 = (byte)uVar3;
      uVar142 = (uint)(uint3)*puVar123;
      if (((uVar142 & 0xc0c0f0) == 0x8080e0) &&
         (uVar139 = uVar3 & 0x200f, uVar132 = (uint)uVar3, (uVar3 & 0x200f) != 0))
      goto LAB_01f50b27;
    }
    else {
      uVar142 = *puVar123;
      if (((uVar142 & 0xc0c0f0) == 0x8080e0) &&
         (uVar139 = uVar142 & 0x200f, uVar132 = uVar142, uVar139 != 0)) {
LAB_01f50b27:
        bVar154 = (byte)uVar132;
        if (uVar139 != 0x200d) {
          *puVar115 = uVar142;
          puVar115 = (uint *)((long)puVar115 + 3);
          puVar123 = (uint *)((long)puVar123 + 3);
          goto LAB_01f50a37;
        }
      }
      else {
        bVar154 = (byte)uVar142;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar123;
    bVar154 = *(byte *)((long)puVar123 + 2);
    if ((((*puVar123 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar142 = *puVar123;
      *(ushort *)puVar115 = 0x755c;
      *(ushort *)((long)puVar115 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar142 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar115 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar154 & 0x3f) * 2);
      puVar115 = (uint *)((long)puVar115 + 6);
      puVar123 = (uint *)((long)puVar123 + 3);
    }
    else {
LAB_01f50b75:
      if ((flg & 0x20) == 0) goto LAB_01f52ba0;
      *(ushort *)puVar115 = 0x755c;
      ((ushort *)((long)puVar115 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar115 + 2))[1] = 0x4446;
LAB_01f50b8d:
      puVar115 = (uint *)((long)puVar115 + 6);
      puVar123 = (uint *)((long)puVar123 + 1);
    }
    goto LAB_01f50a37;
  case 8:
    uVar142 = *puVar123;
    bVar154 = (byte)uVar142;
    if ((((uVar142 & 0xc0c0c0f8) == 0x808080f0) && ((uVar142 & 0x3007) != 0)) &&
       ((bVar154 >> 2 & (uVar142 & 0x3003) != 0) == 0)) {
      *puVar115 = uVar142;
      puVar115 = puVar115 + 1;
      puVar123 = puVar127;
      goto LAB_01f50a37;
    }
    break;
  case 9:
    uVar142 = *puVar123;
    if ((((uVar142 & 0xc0c0c0f8) != 0x808080f0) || ((uVar142 & 0x3007) == 0)) ||
       (((byte)uVar142 >> 2 & (uVar142 & 0x3003) != 0) != 0)) goto LAB_01f50b75;
    iVar138 = (uVar142 & 7) * 0x40000;
    iVar136 = (uVar142 & 0x3f00) * 0x10;
    *(ushort *)puVar115 = 0x755c;
    *(ushort *)((long)puVar115 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar138 + iVar136) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar115 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar142 >> 10 & 0xc00) + iVar138 + iVar136) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar115 + 6) = 0x755c;
    *(ushort *)(puVar115 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar142 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar115 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar142 >> 10 & 0xc0 | uVar142 >> 0x18 & 0x3f) * 2);
    puVar115 = puVar115 + 3;
    puVar123 = puVar127;
    goto LAB_01f50a37;
  default:
    goto switchD_01f50a62_default;
  }
LAB_01f50d38:
  if ((flg & 0x20) == 0) goto LAB_01f52ba0;
  *(byte *)puVar115 = bVar154;
  puVar115 = (uint *)((long)puVar115 + 1);
  puVar123 = (uint *)((long)puVar123 + 1);
  goto LAB_01f50a37;
LAB_01f52ba0:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar120 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar120 = err;
  }
  pyVar106->code = 7;
  pcVar111 = "invalid utf-8 encoding in string";
  goto LAB_01f52bd7;
switchD_01f50a62_caseD_0:
  pbVar155 = (byte *)((long)puVar123 + 1);
  *(byte *)puVar115 = bVar154;
  puVar127 = puVar115;
  goto LAB_01f50667;
LAB_01f533be:
  *puVar127 = *puVar141;
  puVar127 = puVar127 + 1;
  puVar141 = puVar141 + 1;
  lVar128 = lVar128 + -4;
  goto LAB_01f533d0;
LAB_01f53417:
  if (puVar115 <= puVar141) {
    *(byte *)puVar127 = 0x22;
    puVar127 = (uint *)((long)puVar127 + 1);
    goto LAB_01f52f80;
  }
  uVar142 = *puVar141;
  if (puVar158[(byte)uVar142] != '\0') goto LAB_01f5364b;
  puVar141 = (uint *)((long)puVar141 + 1);
  *(byte *)puVar127 = (byte)uVar142;
  puVar127 = (uint *)((long)puVar127 + 1);
  goto LAB_01f53417;
LAB_01f5364b:
  puVar123 = puVar141 + 1;
  if (puVar115 < puVar123) {
    if (puVar115 == puVar141) goto switchD_01f53676_default;
    bVar154 = (byte)*puVar141;
    uVar151 = (ulong)bVar154;
    bVar2 = puVar158[uVar151];
    if ((long)(ulong)(bVar2 >> 1) <= (long)puVar115 - (long)puVar141) goto LAB_01f53663;
switchD_01f53676_caseD_1:
    if ((flg & 2) == 0) goto LAB_01f539c4;
    goto LAB_01f537b2;
  }
  bVar154 = (byte)*puVar141;
  uVar151 = (ulong)bVar154;
  bVar2 = puVar158[uVar151];
LAB_01f53663:
  switch(bVar2) {
  case 0:
    goto switchD_01f53676_caseD_0;
  case 1:
    goto switchD_01f53676_caseD_1;
  case 2:
    *(ushort *)puVar127 = *(ushort *)(esc_single_char_table + uVar151 * 2);
    puVar127 = (uint *)((long)puVar127 + 2);
    puVar141 = (uint *)((long)puVar141 + 1);
    goto LAB_01f5364b;
  case 3:
    *puVar127 = 0x3030755c;
    *(ushort *)(puVar127 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar141 * 2);
    goto LAB_01f537c9;
  case 4:
    uVar3 = (ushort)*puVar141;
    bVar154 = (byte)uVar3;
    uVar142 = (uint)uVar3;
    if ((uVar3 & 0xc0e0) == 0x80c0) {
      if ((uVar3 & 0x1e) != 0) {
        *(ushort *)puVar127 = uVar3;
        puVar127 = (uint *)((long)puVar127 + 2);
        puVar141 = (uint *)((long)puVar141 + 2);
        goto LAB_01f5364b;
      }
    }
    else {
LAB_01f53a52:
      bVar154 = (byte)uVar142;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar141;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_01f537b2;
    *(ushort *)puVar127 = 0x755c;
    *(ushort *)((long)puVar127 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar127 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar127 = (uint *)((long)puVar127 + 6);
    puVar141 = (uint *)((long)puVar141 + 2);
    goto LAB_01f5364b;
  case 6:
    if (puVar115 < puVar123) {
      uVar3 = (ushort)*puVar141;
      bVar154 = (byte)uVar3;
      uVar132 = (uint)(uint3)*puVar141;
      uVar142 = (uint)uVar3;
      if (((uVar132 & 0xc0c0f0) != 0x8080e0) || ((uVar3 & 0x200f) == 0)) goto LAB_01f53a52;
      if ((uVar3 & 0x200f) != 0x200d) goto LAB_01f53761;
    }
    else {
      uVar132 = *puVar141;
      uVar142 = uVar132;
      if ((uVar132 & 0xc0c0f0) != 0x8080e0) goto LAB_01f53a52;
      bVar154 = (byte)uVar132;
      if (((uVar132 & 0x200f) != 0) && ((uVar132 & 0x200f) != 0x200d)) {
LAB_01f53761:
        *puVar127 = uVar132;
        puVar127 = (uint *)((long)puVar127 + 3);
        puVar141 = (uint *)((long)puVar141 + 3);
        goto LAB_01f5364b;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar141;
    bVar154 = *(byte *)((long)puVar141 + 2);
    if ((((*puVar141 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar142 = *puVar141;
      *(ushort *)puVar127 = 0x755c;
      *(ushort *)((long)puVar127 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar142 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar127 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar154 & 0x3f) * 2);
      puVar127 = (uint *)((long)puVar127 + 6);
      puVar141 = (uint *)((long)puVar141 + 3);
    }
    else {
LAB_01f537b2:
      if ((flg & 0x20) == 0) goto LAB_01f540ce;
      *(ushort *)puVar127 = 0x755c;
      ((ushort *)((long)puVar127 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar127 + 2))[1] = 0x4446;
LAB_01f537c9:
      puVar127 = (uint *)((long)puVar127 + 6);
      puVar141 = (uint *)((long)puVar141 + 1);
    }
    goto LAB_01f5364b;
  case 8:
    uVar142 = *puVar141;
    bVar154 = (byte)uVar142;
    if ((uVar142 & 0xc0c0c0f8) != 0x808080f0) goto LAB_01f53a52;
    if (((uVar142 & 0x3007) != 0) && ((bVar154 >> 2 & (uVar142 & 0x3003) != 0) == 0)) {
      *puVar127 = uVar142;
      puVar127 = puVar127 + 1;
      puVar141 = puVar123;
      goto LAB_01f5364b;
    }
    break;
  case 9:
    uVar142 = *puVar141;
    if ((((uVar142 & 0xc0c0c0f8) != 0x808080f0) || ((uVar142 & 0x3007) == 0)) ||
       (((byte)uVar142 >> 2 & (uVar142 & 0x3003) != 0) != 0)) goto LAB_01f537b2;
    iVar138 = (uVar142 & 7) * 0x40000;
    iVar136 = (uVar142 & 0x3f00) * 0x10;
    *(ushort *)puVar127 = 0x755c;
    *(ushort *)((long)puVar127 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar138 + iVar136) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar127 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          ((iVar138 + iVar136 + (uVar142 >> 10 & 0xc00)) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar127 + 6) = 0x755c;
    *(ushort *)(puVar127 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar142 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar127 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar142 >> 10 & 0xc0 | uVar142 >> 0x18 & 0x3f) * 2);
    puVar127 = puVar127 + 3;
    puVar141 = puVar123;
    goto LAB_01f5364b;
  default:
switchD_01f53676_default:
    *(byte *)puVar127 = 0x22;
    puVar127 = (uint *)((long)puVar127 + 1);
    goto LAB_01f52f80;
  }
LAB_01f539c4:
  if ((flg & 0x20) == 0) {
LAB_01f540ce:
    (*p_Var6)(pvVar7,puVar152);
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar120 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar120 = err;
    }
    pyVar106->code = 7;
    pcVar111 = "invalid utf-8 encoding in string";
    goto LAB_01f52fe5;
  }
  *(byte *)puVar127 = bVar154;
  puVar127 = (uint *)((long)puVar127 + 1);
  puVar141 = (uint *)((long)puVar141 + 1);
  goto LAB_01f5364b;
switchD_01f53676_caseD_0:
  pbVar155 = (byte *)((long)puVar141 + 1);
  *(byte *)puVar127 = bVar154;
  puVar123 = puVar127;
  goto LAB_01f5327d;
LAB_01f52ce1:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar120 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar120 = err;
  }
  pyVar106->code = 4;
  pyVar120->msg = "nan or inf number is not allowed";
LAB_01f52c94:
  if (local_100 == (byte *)0x0) {
    return (char *)0x0;
  }
  (*p_Var6)(pvVar7,local_100);
  return (char *)0x0;
LAB_01f52ca5:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar120 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar120 = err;
  }
  pyVar106->code = 3;
  pcVar111 = "invalid JSON value type";
LAB_01f52bd7:
  pyVar120->msg = pcVar111;
  if (local_100 != (byte *)0x0) {
    (*p_Var6)(pvVar7,local_100);
  }
  return (char *)0x0;
}

Assistant:

char *yyjson_val_write_opts(const yyjson_val *val,
                            yyjson_write_flag flg,
                            const yyjson_alc *alc_ptr,
                            usize *dat_len,
                            yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_val *root = constcast(yyjson_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_READ_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_write_pretty(root, flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_write_minify(root, flg, alc, dat_len, err);
    }
}